

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int *piVar6;
  void *pvVar7;
  undefined4 *puVar8;
  void *pvVar9;
  size_t sVar10;
  uint *puVar11;
  float *pfVar12;
  bool bVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float afVar118 [16];
  float afVar119 [16];
  float afVar120 [16];
  float afVar121 [16];
  float afVar122 [16];
  float afVar123 [16];
  float afVar124 [16];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  int iVar129;
  uint uVar130;
  uint uVar131;
  uint uVar132;
  int iVar133;
  ulong uVar134;
  long lVar135;
  long lVar136;
  long lVar137;
  undefined1 (*pauVar138) [16];
  undefined1 (*pauVar139) [32];
  long lVar140;
  ulong uVar141;
  long lVar142;
  undefined1 (*pauVar143) [32];
  int iVar144;
  long lVar145;
  long lVar146;
  uint uVar147;
  long lVar148;
  long lVar149;
  long lVar150;
  long lVar151;
  long lVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  undefined1 (*pauVar156) [16];
  undefined1 (*pauVar157) [16];
  undefined1 (*pauVar158) [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [28];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar220;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar221 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar224 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  v4sf one_4;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar253;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar254;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  v4sf one;
  undefined1 auVar283 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar284 [16];
  undefined1 auVar287 [64];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar288 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [64];
  undefined1 auVar294 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar295 [16];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [64];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [64];
  undefined1 auVar321 [16];
  undefined1 auVar320 [16];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar322 [16];
  undefined1 auVar325 [64];
  undefined1 auVar326 [16];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar333 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar334 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM29 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffbfc;
  undefined1 (*local_3a8) [32];
  int *piStack_3a0;
  size_t local_398;
  int local_390;
  Allocator *local_388;
  int local_380;
  int local_37c;
  undefined8 local_378;
  int local_370;
  size_t local_368;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  long local_300;
  long local_2f8;
  ulong local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  ulong local_228;
  ulong local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  auVar159 = in_ZMM29._0_16_;
  local_380 = bottom_blob->dims;
  if (local_380 == 2) {
    iVar144 = (this->super_InnerProduct).num_output;
    local_37c = bottom_blob->w;
    if (local_37c == (this->super_InnerProduct).weight_data_size / iVar144) {
      Mat::create(top_blob,iVar144,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_InnerProduct).bias_data.data,
                 (this->super_InnerProduct).activation_type,
                 &(this->super_InnerProduct).activation_params,
                 (Option *)CONCAT44(in_stack_fffffffffffffbfc,(uint)opt->use_packing_layout));
      return 0;
    }
  }
  else {
    local_37c = bottom_blob->w;
  }
  piVar6 = bottom_blob->refcount;
  local_3a8 = (undefined1 (*) [32])bottom_blob->data;
  piStack_3a0 = bottom_blob->refcount;
  local_398 = bottom_blob->elemsize;
  local_390 = bottom_blob->elempack;
  local_388 = bottom_blob->allocator;
  local_378._0_4_ = bottom_blob->h;
  local_378._4_4_ = bottom_blob->d;
  local_370 = bottom_blob->c;
  local_368 = bottom_blob->cstep;
  iVar144 = local_380;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
    iVar144 = bottom_blob->dims;
  }
  if (iVar144 != 1) {
    auStack_68 = SUB6448(*opt,0x10);
    local_78 = SUB648(*opt,0);
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_3a8);
    if ((local_3a8 == (undefined1 (*) [32])0x0) || ((long)local_370 * local_368 == 0)) {
      iVar144 = -100;
      goto LAB_002be29b;
    }
  }
  uVar131 = (this->super_InnerProduct).num_output;
  uVar132 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar131 & 0xf) == 0) {
      uVar132 = 0x10;
    }
    else if ((uVar131 & 7) == 0) {
      uVar132 = 8;
    }
    else {
      uVar132 = (uint)((uVar131 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar131 / (int)uVar132,
              (ulong)uVar132 * (local_398 / (ulong)(long)local_390),uVar132,opt->blob_allocator);
  afVar128 = _ps512_cephes_log_q1;
  afVar127 = ::_ps512_cephes_exp_p5;
  afVar126 = ::_ps512_cephes_exp_p4;
  afVar125 = ::_ps512_cephes_exp_p3;
  afVar124 = ::_ps512_cephes_exp_p2;
  afVar123 = ::_ps512_cephes_exp_p1;
  afVar122 = ::_ps512_cephes_exp_p0;
  afVar121 = ::_ps512_cephes_LOG2EF;
  afVar120 = ::_ps512_exp_lo;
  afVar119 = ::_ps512_exp_hi;
  afVar118 = ::_ps512_1;
  iVar144 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002be29b;
  iVar5 = (this->super_InnerProduct).activation_type;
  pvVar7 = (this->super_InnerProduct).bias_data.data;
  uVar132 = local_390 * local_37c;
  iVar133 = top_blob->elempack;
  uVar131 = top_blob->w;
  uVar141 = (ulong)uVar131;
  iVar129 = 0;
  iVar144 = iVar129;
  if (iVar133 < 8) {
    if (iVar133 == 1) {
      if (0 < (int)uVar131 >> 3) {
        uVar141 = (ulong)(uint)((int)uVar131 >> 3);
        lVar145 = 7;
        lVar140 = 6;
        lVar142 = 5;
        lVar146 = 4;
        lVar148 = 3;
        lVar136 = 2;
        local_2f8 = 1;
        local_300 = 0;
        uVar134 = 0;
        local_228 = uVar141;
        do {
          local_220 = uVar134 * 8;
          auVar298 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar7 != (void *)0x0) {
            auVar298 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar7 + uVar134 * 0x20));
          }
          auVar191 = auVar298._0_32_;
          lVar135 = (long)(this->weight_data_tm).w;
          pvVar9 = (this->weight_data_tm).data;
          sVar10 = (this->weight_data_tm).elemsize;
          pauVar139 = local_3a8;
          if ((int)uVar132 < 8) {
            lVar135 = sVar10 * lVar135;
            lVar137 = lVar135 * local_220;
            lVar150 = (local_220 | 1) * lVar135;
            lVar149 = (local_220 | 2) * lVar135;
            lVar155 = (local_220 | 3) * lVar135;
            lVar154 = (local_220 | 4) * lVar135;
            lVar153 = (local_220 | 5) * lVar135;
            lVar152 = (local_220 | 6) * lVar135;
            lVar151 = lVar135 * (local_220 | 7);
            uVar147 = 0;
            local_b8 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            local_118 = SUB6432(ZEXT864(0),0);
            local_138 = SUB6432(ZEXT864(0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            local_178 = SUB6432(ZEXT864(0),0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar151 = sVar10 * lVar145 * lVar135;
            local_2b8._0_8_ = lVar151;
            lVar152 = sVar10 * lVar140 * lVar135;
            lVar153 = sVar10 * lVar142 * lVar135;
            lVar154 = sVar10 * lVar146 * lVar135;
            lVar155 = sVar10 * lVar148 * lVar135;
            lVar149 = sVar10 * lVar136 * lVar135;
            lVar150 = sVar10 * local_2f8 * lVar135;
            lVar135 = sVar10 * local_300 * lVar135;
            auVar287 = ZEXT864(0);
            auVar325 = ZEXT864(0);
            auVar319 = ZEXT864(0);
            auVar314 = ZEXT864(0);
            auVar309 = ZEXT864(0);
            auVar304 = ZEXT864(0);
            auVar299 = ZEXT864(0);
            auVar293 = ZEXT864(0);
            iVar144 = 7;
            lVar137 = 0;
            do {
              auVar192 = *(undefined1 (*) [32])(*local_3a8 + lVar137 * 2);
              auVar159 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar137 + lVar135));
              auVar186 = vcvtph2ps_f16c(auVar159);
              auVar159 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar137 + lVar150));
              auVar187 = vcvtph2ps_f16c(auVar159);
              auVar159 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar137 + lVar149));
              auVar188 = vcvtph2ps_f16c(auVar159);
              auVar159 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar137 + lVar155));
              auVar189 = vcvtph2ps_f16c(auVar159);
              auVar159 = vfmadd231ps_fma(auVar287._0_32_,auVar192,auVar186);
              auVar287 = ZEXT1664(auVar159);
              local_98 = ZEXT1632(auVar159);
              auVar159 = vfmadd231ps_fma(auVar325._0_32_,auVar192,auVar187);
              auVar325 = ZEXT1664(auVar159);
              local_178 = ZEXT1632(auVar159);
              auVar159 = vfmadd231ps_fma(auVar319._0_32_,auVar192,auVar188);
              auVar319 = ZEXT1664(auVar159);
              local_158 = ZEXT1632(auVar159);
              auVar159 = vfmadd231ps_fma(auVar314._0_32_,auVar192,auVar189);
              auVar314 = ZEXT1664(auVar159);
              local_138 = ZEXT1632(auVar159);
              auVar159 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar137 + lVar154));
              auVar186 = vcvtph2ps_f16c(auVar159);
              auVar159 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar137 + lVar153));
              auVar187 = vcvtph2ps_f16c(auVar159);
              auVar159 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar137 + lVar152));
              auVar188 = vcvtph2ps_f16c(auVar159);
              auVar159 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar137 + lVar151));
              auVar189 = vcvtph2ps_f16c(auVar159);
              auVar159 = vfmadd231ps_fma(auVar309._0_32_,auVar192,auVar186);
              auVar309 = ZEXT1664(auVar159);
              local_118 = ZEXT1632(auVar159);
              auVar159 = vfmadd231ps_fma(auVar304._0_32_,auVar192,auVar187);
              auVar304 = ZEXT1664(auVar159);
              local_f8 = ZEXT1632(auVar159);
              auVar159 = vfmadd231ps_fma(auVar299._0_32_,auVar192,auVar188);
              auVar299 = ZEXT1664(auVar159);
              local_d8 = ZEXT1632(auVar159);
              auVar159 = vfmadd231ps_fma(auVar293._0_32_,auVar192,auVar189);
              auVar293 = ZEXT1664(auVar159);
              local_b8 = ZEXT1632(auVar159);
              pauVar139 = pauVar139 + 1;
              iVar144 = iVar144 + 8;
              lVar137 = lVar137 + 0x10;
            } while (iVar144 < (int)uVar132);
            lVar151 = lVar151 + lVar137;
            lVar152 = lVar152 + lVar137;
            lVar153 = lVar153 + lVar137;
            lVar154 = lVar154 + lVar137;
            lVar155 = lVar155 + lVar137;
            lVar149 = lVar149 + lVar137;
            lVar150 = lVar150 + lVar137;
            lVar137 = lVar135 + lVar137;
            uVar141 = local_228;
            uVar147 = uVar132 & 0xfffffff8;
          }
          local_348._0_8_ = (long)pvVar9 + lVar150;
          local_358._0_8_ = (long)pvVar9 + lVar149;
          local_2f0 = uVar134;
          local_2e8 = lVar136;
          local_2e0 = lVar148;
          local_2d8 = lVar146;
          local_2d0 = lVar142;
          local_2c8 = lVar140;
          local_2c0 = lVar145;
          if ((int)uVar147 < (int)uVar132) {
            lVar145 = 0;
            do {
              local_2b8 = auVar298._0_32_;
              local_318 = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
              fVar253 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar145 * 2 + lVar137)
                                          );
              auVar191 = _local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar253;
              fStack_210 = (float)extraout_XMM0_Dc;
              _fStack_208 = auVar191._16_16_;
              fStack_20c = (float)extraout_XMM0_Dd;
              _local_328 = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
              fVar253 = float16_to_float32(*(unsigned_short *)(local_348._0_8_ + lVar145 * 2));
              local_238 = CONCAT44(extraout_XMM0_Db_00,fVar253);
              local_338 = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
              local_248._0_4_ =
                   float16_to_float32(*(unsigned_short *)(local_358._0_8_ + lVar145 * 2));
              local_248._4_4_ = extraout_XMM0_Db_01;
              local_248._8_4_ = extraout_XMM0_Dc_00;
              local_248._12_4_ = extraout_XMM0_Dd_00;
              local_258 = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
              local_268._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar145 * 2 + lVar155));
              local_268._4_4_ = extraout_XMM0_Db_02;
              local_268._8_4_ = extraout_XMM0_Dc_01;
              local_268._12_4_ = extraout_XMM0_Dd_01;
              local_278 = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
              fVar253 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar145 * 2 + lVar154)
                                          );
              auVar191 = local_198;
              local_198._4_4_ = extraout_XMM0_Db_03;
              local_198._0_4_ = fVar253;
              local_198._8_4_ = extraout_XMM0_Dc_02;
              local_198._16_16_ = auVar191._16_16_;
              local_198._12_4_ = extraout_XMM0_Dd_02;
              local_1b8._0_16_ = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
              fVar253 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar145 * 2 + lVar153)
                                          );
              auVar191 = local_1d8;
              local_1d8._4_4_ = extraout_XMM0_Db_04;
              local_1d8._0_4_ = fVar253;
              local_1d8._8_4_ = extraout_XMM0_Dc_03;
              local_1d8._16_16_ = auVar191._16_16_;
              local_1d8._12_4_ = extraout_XMM0_Dd_03;
              local_1f8._0_16_ = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
              local_288._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar145 * 2 + lVar152));
              local_288._4_4_ = extraout_XMM0_Db_05;
              local_288._8_4_ = extraout_XMM0_Dc_04;
              local_288._12_4_ = extraout_XMM0_Dd_04;
              local_298 = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
              auVar298._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar145 * 2 + lVar151));
              auVar298._4_60_ = extraout_var;
              auVar159 = vinsertps_avx(local_198._0_16_,ZEXT416((uint)local_1d8._0_4_),0x10);
              auVar159 = vinsertps_avx(auVar159,ZEXT416((uint)local_288._0_4_),0x20);
              auVar159 = vinsertps_avx(auVar159,auVar298._0_16_,0x30);
              auVar160 = vinsertps_avx(_local_218,ZEXT416((uint)local_238),0x10);
              auVar160 = vinsertps_avx(auVar160,ZEXT416((uint)local_248._0_4_),0x20);
              auVar160 = vinsertps_avx(auVar160,ZEXT416((uint)local_268._0_4_),0x30);
              auVar191._16_16_ = auVar159;
              auVar191._0_16_ = auVar160;
              auVar159 = vinsertps_avx(local_278,ZEXT416((uint)local_1b8._0_4_),0x10);
              auVar159 = vinsertps_avx(auVar159,ZEXT416((uint)local_1f8._0_4_),0x20);
              auVar159 = vinsertps_avx(auVar159,ZEXT416((uint)local_298._0_4_),0x30);
              auVar160 = vinsertps_avx(local_318,ZEXT416((uint)local_328._0_4_),0x10);
              auVar160 = vinsertps_avx(auVar160,ZEXT416((uint)local_338._0_4_),0x20);
              auVar160 = vinsertps_avx(auVar160,ZEXT416((uint)local_258._0_4_),0x30);
              auVar192._16_16_ = auVar159;
              auVar192._0_16_ = auVar160;
              auVar159 = vfmadd231ps_fma(local_2b8,auVar191,auVar192);
              auVar298 = ZEXT1664(auVar159);
              auVar191 = ZEXT1632(auVar159);
              lVar145 = lVar145 + 1;
            } while (uVar132 - uVar147 != (int)lVar145);
          }
          auVar192 = vhaddps_avx(local_98,local_178);
          auVar186 = vhaddps_avx(local_158,local_138);
          auVar186 = vhaddps_avx(auVar192,auVar186);
          auVar192 = vhaddps_avx(local_118,local_f8);
          auVar187 = vhaddps_avx(local_d8,local_b8);
          auVar187 = vhaddps_avx(auVar192,auVar187);
          auVar192 = vblendps_avx(auVar186,auVar187,0xf0);
          auVar187 = vperm2f128_avx(auVar186,auVar187,0x21);
          auVar186._0_4_ = auVar187._0_4_ + auVar191._0_4_ + auVar192._0_4_;
          auVar186._4_4_ = auVar187._4_4_ + auVar191._4_4_ + auVar192._4_4_;
          auVar186._8_4_ = auVar187._8_4_ + auVar191._8_4_ + auVar192._8_4_;
          auVar186._12_4_ = auVar187._12_4_ + auVar191._12_4_ + auVar192._12_4_;
          auVar186._16_4_ = auVar187._16_4_ + auVar191._16_4_ + auVar192._16_4_;
          auVar186._20_4_ = auVar187._20_4_ + auVar191._20_4_ + auVar192._20_4_;
          auVar186._24_4_ = auVar187._24_4_ + auVar191._24_4_ + auVar192._24_4_;
          auVar186._28_4_ = auVar187._28_4_ + auVar191._28_4_ + auVar192._28_4_;
          switch(iVar5) {
          case 1:
            auVar186 = vmaxps_avx(auVar186,_DAT_005a6f60);
            break;
          case 2:
            auVar191 = vmaxps_avx(auVar186,ZEXT832(0) << 0x20);
            auVar192 = vminps_avx(auVar186,ZEXT832(0) << 0x20);
            uVar1 = *(this->super_InnerProduct).activation_params.data;
            auVar89._4_4_ = uVar1;
            auVar89._0_4_ = uVar1;
            auVar89._8_4_ = uVar1;
            auVar89._12_4_ = uVar1;
            auVar89._16_4_ = uVar1;
            auVar89._20_4_ = uVar1;
            auVar89._24_4_ = uVar1;
            auVar89._28_4_ = uVar1;
            auVar186 = vfmadd132ps_avx512vl(auVar192,auVar191,auVar89);
            break;
          case 3:
            puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar8;
            auVar87._4_4_ = uVar1;
            auVar87._0_4_ = uVar1;
            auVar87._8_4_ = uVar1;
            auVar87._12_4_ = uVar1;
            auVar87._16_4_ = uVar1;
            auVar87._20_4_ = uVar1;
            auVar87._24_4_ = uVar1;
            auVar87._28_4_ = uVar1;
            auVar191 = vmaxps_avx512vl(auVar186,auVar87);
            uVar1 = puVar8[1];
            auVar88._4_4_ = uVar1;
            auVar88._0_4_ = uVar1;
            auVar88._8_4_ = uVar1;
            auVar88._12_4_ = uVar1;
            auVar88._16_4_ = uVar1;
            auVar88._20_4_ = uVar1;
            auVar88._24_4_ = uVar1;
            auVar88._28_4_ = uVar1;
            auVar186 = vminps_avx512vl(auVar191,auVar88);
            break;
          case 4:
            auVar76._8_4_ = 0x80000000;
            auVar76._0_8_ = 0x8000000080000000;
            auVar76._12_4_ = 0x80000000;
            auVar76._16_4_ = 0x80000000;
            auVar76._20_4_ = 0x80000000;
            auVar76._24_4_ = 0x80000000;
            auVar76._28_4_ = 0x80000000;
            auVar191 = vxorps_avx512vl(auVar186,auVar76);
            auVar77._8_4_ = 0x42b0c0a5;
            auVar77._0_8_ = 0x42b0c0a542b0c0a5;
            auVar77._12_4_ = 0x42b0c0a5;
            auVar77._16_4_ = 0x42b0c0a5;
            auVar77._20_4_ = 0x42b0c0a5;
            auVar77._24_4_ = 0x42b0c0a5;
            auVar77._28_4_ = 0x42b0c0a5;
            auVar191 = vminps_avx512vl(auVar191,auVar77);
            auVar78._8_4_ = 0xc2b0c0a5;
            auVar78._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar78._12_4_ = 0xc2b0c0a5;
            auVar78._16_4_ = 0xc2b0c0a5;
            auVar78._20_4_ = 0xc2b0c0a5;
            auVar78._24_4_ = 0xc2b0c0a5;
            auVar78._28_4_ = 0xc2b0c0a5;
            auVar192 = vmaxps_avx512vl(auVar191,auVar78);
            auVar274._8_4_ = 0x3f000000;
            auVar274._0_8_ = 0x3f0000003f000000;
            auVar274._12_4_ = 0x3f000000;
            auVar274._16_4_ = 0x3f000000;
            auVar274._20_4_ = 0x3f000000;
            auVar274._24_4_ = 0x3f000000;
            auVar274._28_4_ = 0x3f000000;
            auVar79._8_4_ = 0x3fb8aa3b;
            auVar79._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar79._12_4_ = 0x3fb8aa3b;
            auVar79._16_4_ = 0x3fb8aa3b;
            auVar79._20_4_ = 0x3fb8aa3b;
            auVar79._24_4_ = 0x3fb8aa3b;
            auVar79._28_4_ = 0x3fb8aa3b;
            auVar186 = vfmadd231ps_avx512vl(auVar274,auVar192,auVar79);
            auVar191 = vroundps_avx(auVar186,1);
            uVar134 = vcmpps_avx512vl(auVar186,auVar191,1);
            auVar281._8_4_ = 0x3f800000;
            auVar281._0_8_ = 0x3f8000003f800000;
            auVar281._12_4_ = 0x3f800000;
            auVar281._16_4_ = 0x3f800000;
            auVar281._20_4_ = 0x3f800000;
            auVar281._24_4_ = 0x3f800000;
            auVar281._28_4_ = 0x3f800000;
            auVar187 = vsubps_avx512vl(auVar191,auVar281);
            bVar13 = (bool)((byte)uVar134 & 1);
            auVar198._0_4_ = (float)((uint)bVar13 * auVar187._0_4_ | (uint)!bVar13 * auVar191._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar134 >> 1) & 1);
            auVar198._4_4_ = (float)((uint)bVar13 * auVar187._4_4_ | (uint)!bVar13 * auVar191._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar134 >> 2) & 1);
            auVar198._8_4_ = (float)((uint)bVar13 * auVar187._8_4_ | (uint)!bVar13 * auVar191._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar134 >> 3) & 1);
            auVar198._12_4_ =
                 (float)((uint)bVar13 * auVar187._12_4_ | (uint)!bVar13 * auVar191._12_4_);
            bVar13 = (bool)((byte)(uVar134 >> 4) & 1);
            auVar198._16_4_ =
                 (float)((uint)bVar13 * auVar187._16_4_ | (uint)!bVar13 * auVar191._16_4_);
            bVar13 = (bool)((byte)(uVar134 >> 5) & 1);
            auVar198._20_4_ =
                 (float)((uint)bVar13 * auVar187._20_4_ | (uint)!bVar13 * auVar191._20_4_);
            bVar13 = (bool)((byte)(uVar134 >> 6) & 1);
            auVar198._24_4_ =
                 (float)((uint)bVar13 * auVar187._24_4_ | (uint)!bVar13 * auVar191._24_4_);
            bVar13 = SUB81(uVar134 >> 7,0);
            auVar198._28_4_ =
                 (float)((uint)bVar13 * auVar187._28_4_ | (uint)!bVar13 * auVar191._28_4_);
            auVar80._8_4_ = 0x3f318000;
            auVar80._0_8_ = 0x3f3180003f318000;
            auVar80._12_4_ = 0x3f318000;
            auVar80._16_4_ = 0x3f318000;
            auVar80._20_4_ = 0x3f318000;
            auVar80._24_4_ = 0x3f318000;
            auVar80._28_4_ = 0x3f318000;
            auVar191 = vfmsub231ps_avx512vl(auVar192,auVar198,auVar80);
            auVar81._8_4_ = 0x395e8083;
            auVar81._0_8_ = 0x395e8083395e8083;
            auVar81._12_4_ = 0x395e8083;
            auVar81._16_4_ = 0x395e8083;
            auVar81._20_4_ = 0x395e8083;
            auVar81._24_4_ = 0x395e8083;
            auVar81._28_4_ = 0x395e8083;
            auVar191 = vfmsub231ps_avx512vl(auVar191,auVar198,auVar81);
            auVar116._4_4_ = auVar191._4_4_ * auVar191._4_4_;
            auVar116._0_4_ = auVar191._0_4_ * auVar191._0_4_;
            auVar116._8_4_ = auVar191._8_4_ * auVar191._8_4_;
            auVar116._12_4_ = auVar191._12_4_ * auVar191._12_4_;
            auVar116._16_4_ = auVar191._16_4_ * auVar191._16_4_;
            auVar116._20_4_ = auVar191._20_4_ * auVar191._20_4_;
            auVar116._24_4_ = auVar191._24_4_ * auVar191._24_4_;
            auVar116._28_4_ = auVar186._28_4_;
            auVar266._8_4_ = 0x39506967;
            auVar266._0_8_ = 0x3950696739506967;
            auVar266._12_4_ = 0x39506967;
            auVar266._16_4_ = 0x39506967;
            auVar266._20_4_ = 0x39506967;
            auVar266._24_4_ = 0x39506967;
            auVar266._28_4_ = 0x39506967;
            auVar82._8_4_ = 0x3ab743ce;
            auVar82._0_8_ = 0x3ab743ce3ab743ce;
            auVar82._12_4_ = 0x3ab743ce;
            auVar82._16_4_ = 0x3ab743ce;
            auVar82._20_4_ = 0x3ab743ce;
            auVar82._24_4_ = 0x3ab743ce;
            auVar82._28_4_ = 0x3ab743ce;
            auVar192 = vfmadd213ps_avx512vl(auVar266,auVar191,auVar82);
            auVar83._8_4_ = 0x3c088908;
            auVar83._0_8_ = 0x3c0889083c088908;
            auVar83._12_4_ = 0x3c088908;
            auVar83._16_4_ = 0x3c088908;
            auVar83._20_4_ = 0x3c088908;
            auVar83._24_4_ = 0x3c088908;
            auVar83._28_4_ = 0x3c088908;
            auVar192 = vfmadd213ps_avx512vl(auVar192,auVar191,auVar83);
            auVar84._8_4_ = 0x3d2aa9c1;
            auVar84._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar84._12_4_ = 0x3d2aa9c1;
            auVar84._16_4_ = 0x3d2aa9c1;
            auVar84._20_4_ = 0x3d2aa9c1;
            auVar84._24_4_ = 0x3d2aa9c1;
            auVar84._28_4_ = 0x3d2aa9c1;
            auVar192 = vfmadd213ps_avx512vl(auVar192,auVar191,auVar84);
            auVar85._8_4_ = 0x3e2aaaaa;
            auVar85._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar85._12_4_ = 0x3e2aaaaa;
            auVar85._16_4_ = 0x3e2aaaaa;
            auVar85._20_4_ = 0x3e2aaaaa;
            auVar85._24_4_ = 0x3e2aaaaa;
            auVar85._28_4_ = 0x3e2aaaaa;
            auVar192 = vfmadd213ps_avx512vl(auVar192,auVar191,auVar85);
            auVar159 = vfmadd213ps_fma(auVar192,auVar191,auVar274);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar116,auVar191);
            auVar224._0_4_ = auVar159._0_4_ + 1.0;
            auVar224._4_4_ = auVar159._4_4_ + 1.0;
            auVar224._8_4_ = auVar159._8_4_ + 1.0;
            auVar224._12_4_ = auVar159._12_4_ + 1.0;
            auVar224._16_4_ = 0x3f800000;
            auVar224._20_4_ = 0x3f800000;
            auVar224._24_4_ = 0x3f800000;
            auVar224._28_4_ = 0x3f800000;
            auVar232._0_4_ = (int)auVar198._0_4_;
            auVar232._4_4_ = (int)auVar198._4_4_;
            auVar232._8_4_ = (int)auVar198._8_4_;
            auVar232._12_4_ = (int)auVar198._12_4_;
            auVar232._16_4_ = (int)auVar198._16_4_;
            auVar232._20_4_ = (int)auVar198._20_4_;
            auVar232._24_4_ = (int)auVar198._24_4_;
            auVar232._28_4_ = (int)auVar198._28_4_;
            auVar191 = vpslld_avx2(auVar232,0x17);
            auVar86._8_4_ = 0x3f800000;
            auVar86._0_8_ = 0x3f8000003f800000;
            auVar86._12_4_ = 0x3f800000;
            auVar86._16_4_ = 0x3f800000;
            auVar86._20_4_ = 0x3f800000;
            auVar86._24_4_ = 0x3f800000;
            auVar86._28_4_ = 0x3f800000;
            auVar191 = vpaddd_avx512vl(auVar191,auVar86);
            auVar159 = vfmadd213ps_fma(auVar191,auVar224,auVar281);
            auVar186 = vdivps_avx(auVar281,ZEXT1632(auVar159));
            break;
          case 5:
            auVar285._8_4_ = 0x42b0c0a5;
            auVar285._0_8_ = 0x42b0c0a542b0c0a5;
            auVar285._12_4_ = 0x42b0c0a5;
            auVar285._16_4_ = 0x42b0c0a5;
            auVar285._20_4_ = 0x42b0c0a5;
            auVar285._24_4_ = 0x42b0c0a5;
            auVar285._28_4_ = 0x42b0c0a5;
            auVar191 = vminps_avx(auVar186,auVar285);
            auVar291._8_4_ = 0xc2b0c0a5;
            auVar291._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar291._12_4_ = 0xc2b0c0a5;
            auVar291._16_4_ = 0xc2b0c0a5;
            auVar291._20_4_ = 0xc2b0c0a5;
            auVar291._24_4_ = 0xc2b0c0a5;
            auVar291._28_4_ = 0xc2b0c0a5;
            auVar191 = vmaxps_avx(auVar191,auVar291);
            auVar302._8_4_ = 0x3fb8aa3b;
            auVar302._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar302._12_4_ = 0x3fb8aa3b;
            auVar302._16_4_ = 0x3fb8aa3b;
            auVar302._20_4_ = 0x3fb8aa3b;
            auVar302._24_4_ = 0x3fb8aa3b;
            auVar302._28_4_ = 0x3fb8aa3b;
            auVar296._8_4_ = 0x3f000000;
            auVar296._0_8_ = 0x3f0000003f000000;
            auVar296._12_4_ = 0x3f000000;
            auVar296._16_4_ = 0x3f000000;
            auVar296._20_4_ = 0x3f000000;
            auVar296._24_4_ = 0x3f000000;
            auVar296._28_4_ = 0x3f000000;
            auVar159 = vfmadd213ps_fma(auVar302,auVar191,auVar296);
            auVar192 = vroundps_avx(ZEXT1632(auVar159),1);
            uVar134 = vcmpps_avx512vl(ZEXT1632(auVar159),auVar192,1);
            auVar307._8_4_ = 0x3f800000;
            auVar307._0_8_ = 0x3f8000003f800000;
            auVar307._12_4_ = 0x3f800000;
            auVar307._16_4_ = 0x3f800000;
            auVar307._20_4_ = 0x3f800000;
            auVar307._24_4_ = 0x3f800000;
            auVar307._28_4_ = 0x3f800000;
            auVar187 = vsubps_avx512vl(auVar192,auVar307);
            bVar13 = (bool)((byte)uVar134 & 1);
            auVar193._0_4_ = (float)((uint)bVar13 * auVar187._0_4_ | (uint)!bVar13 * auVar192._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar134 >> 1) & 1);
            auVar193._4_4_ = (float)((uint)bVar13 * auVar187._4_4_ | (uint)!bVar13 * auVar192._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar134 >> 2) & 1);
            auVar193._8_4_ = (float)((uint)bVar13 * auVar187._8_4_ | (uint)!bVar13 * auVar192._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar134 >> 3) & 1);
            auVar193._12_4_ =
                 (float)((uint)bVar13 * auVar187._12_4_ | (uint)!bVar13 * auVar192._12_4_);
            bVar13 = (bool)((byte)(uVar134 >> 4) & 1);
            auVar193._16_4_ =
                 (float)((uint)bVar13 * auVar187._16_4_ | (uint)!bVar13 * auVar192._16_4_);
            bVar13 = (bool)((byte)(uVar134 >> 5) & 1);
            auVar193._20_4_ =
                 (float)((uint)bVar13 * auVar187._20_4_ | (uint)!bVar13 * auVar192._20_4_);
            bVar13 = (bool)((byte)(uVar134 >> 6) & 1);
            auVar193._24_4_ =
                 (float)((uint)bVar13 * auVar187._24_4_ | (uint)!bVar13 * auVar192._24_4_);
            bVar13 = SUB81(uVar134 >> 7,0);
            auVar193._28_4_ =
                 (float)((uint)bVar13 * auVar187._28_4_ | (uint)!bVar13 * auVar192._28_4_);
            auVar312._8_4_ = 0x3f318000;
            auVar312._0_8_ = 0x3f3180003f318000;
            auVar312._12_4_ = 0x3f318000;
            auVar312._16_4_ = 0x3f318000;
            auVar312._20_4_ = 0x3f318000;
            auVar312._24_4_ = 0x3f318000;
            auVar312._28_4_ = 0x3f318000;
            auVar159 = vfmsub231ps_fma(auVar191,auVar193,auVar312);
            auVar187 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar191 = vfnmsub231ps_avx512vl(ZEXT1632(auVar159),auVar193,auVar187);
            auVar245._0_4_ = auVar191._0_4_ * auVar191._0_4_;
            auVar245._4_4_ = auVar191._4_4_ * auVar191._4_4_;
            auVar245._8_4_ = auVar191._8_4_ * auVar191._8_4_;
            auVar245._12_4_ = auVar191._12_4_ * auVar191._12_4_;
            auVar245._16_4_ = auVar191._16_4_ * auVar191._16_4_;
            auVar245._20_4_ = auVar191._20_4_ * auVar191._20_4_;
            auVar245._24_4_ = auVar191._24_4_ * auVar191._24_4_;
            auVar245._28_4_ = 0;
            auVar317._8_4_ = 0x39506967;
            auVar317._0_8_ = 0x3950696739506967;
            auVar317._12_4_ = 0x39506967;
            auVar317._16_4_ = 0x39506967;
            auVar317._20_4_ = 0x39506967;
            auVar317._24_4_ = 0x39506967;
            auVar317._28_4_ = 0x39506967;
            auVar323._8_4_ = 0x3ab743ce;
            auVar323._0_8_ = 0x3ab743ce3ab743ce;
            auVar323._12_4_ = 0x3ab743ce;
            auVar323._16_4_ = 0x3ab743ce;
            auVar323._20_4_ = 0x3ab743ce;
            auVar323._24_4_ = 0x3ab743ce;
            auVar323._28_4_ = 0x3ab743ce;
            auVar159 = vfmadd213ps_fma(auVar317,auVar191,auVar323);
            auVar327._8_4_ = 0x3c088908;
            auVar327._0_8_ = 0x3c0889083c088908;
            auVar327._12_4_ = 0x3c088908;
            auVar327._16_4_ = 0x3c088908;
            auVar327._20_4_ = 0x3c088908;
            auVar327._24_4_ = 0x3c088908;
            auVar327._28_4_ = 0x3c088908;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar191,auVar327);
            auVar331._8_4_ = 0x3d2aa9c1;
            auVar331._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar331._12_4_ = 0x3d2aa9c1;
            auVar331._16_4_ = 0x3d2aa9c1;
            auVar331._20_4_ = 0x3d2aa9c1;
            auVar331._24_4_ = 0x3d2aa9c1;
            auVar331._28_4_ = 0x3d2aa9c1;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar191,auVar331);
            auVar188 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar192 = vfmadd213ps_avx512vl(ZEXT1632(auVar159),auVar191,auVar188);
            auVar159 = vfmadd213ps_fma(auVar192,auVar191,auVar296);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar245,auVar191);
            auVar230._0_4_ = auVar159._0_4_ + 1.0;
            auVar230._4_4_ = auVar159._4_4_ + 1.0;
            auVar230._8_4_ = auVar159._8_4_ + 1.0;
            auVar230._12_4_ = auVar159._12_4_ + 1.0;
            auVar230._16_4_ = 0x3f800000;
            auVar230._20_4_ = 0x3f800000;
            auVar230._24_4_ = 0x3f800000;
            auVar230._28_4_ = 0x3f800000;
            auVar246._0_4_ = (int)auVar193._0_4_;
            auVar246._4_4_ = (int)auVar193._4_4_;
            auVar246._8_4_ = (int)auVar193._8_4_;
            auVar246._12_4_ = (int)auVar193._12_4_;
            auVar246._16_4_ = (int)auVar193._16_4_;
            auVar246._20_4_ = (int)auVar193._20_4_;
            auVar246._24_4_ = (int)auVar193._24_4_;
            auVar246._28_4_ = (int)auVar193._28_4_;
            auVar191 = vpslld_avx2(auVar246,0x17);
            auVar189 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar191 = vpaddd_avx512vl(auVar191,auVar189);
            auVar159 = vfmadd213ps_fma(auVar191,auVar230,auVar307);
            uVar134 = vcmpps_avx512vl(ZEXT1632(auVar159),_DAT_005a6f60,2);
            auVar190._8_4_ = 0x800000;
            auVar190._0_8_ = 0x80000000800000;
            auVar190._12_4_ = 0x800000;
            auVar190._16_4_ = 0x800000;
            auVar190._20_4_ = 0x800000;
            auVar190._24_4_ = 0x800000;
            auVar190._28_4_ = 0x800000;
            auVar191 = vmaxps_avx512vl(ZEXT1632(auVar159),auVar190);
            auVar247 = vpsrld_avx2(auVar191,0x17);
            auVar265._8_4_ = 0x807fffff;
            auVar265._0_8_ = 0x807fffff807fffff;
            auVar265._12_4_ = 0x807fffff;
            auVar265._16_4_ = 0x807fffff;
            auVar265._20_4_ = 0x807fffff;
            auVar265._24_4_ = 0x807fffff;
            auVar265._28_4_ = 0x807fffff;
            auVar199._8_4_ = 0x3f000000;
            auVar199._0_8_ = 0x3f0000003f000000;
            auVar199._12_4_ = 0x3f000000;
            auVar199._16_4_ = 0x3f000000;
            auVar199._20_4_ = 0x3f000000;
            auVar199._24_4_ = 0x3f000000;
            auVar199._28_4_ = 0x3f000000;
            auVar191 = vpternlogd_avx512vl(auVar191,auVar265,auVar199,0xea);
            auVar66._8_4_ = 0x3f3504f3;
            auVar66._0_8_ = 0x3f3504f33f3504f3;
            auVar66._12_4_ = 0x3f3504f3;
            auVar66._16_4_ = 0x3f3504f3;
            auVar66._20_4_ = 0x3f3504f3;
            auVar66._24_4_ = 0x3f3504f3;
            auVar66._28_4_ = 0x3f3504f3;
            uVar15 = vcmpps_avx512vl(auVar191,auVar66,1);
            auVar190 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar192 = vaddps_avx512vl(auVar191,auVar190);
            auVar199 = vaddps_avx512vl(auVar192,auVar191);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar194._0_4_ = (float)((uint)bVar13 * auVar199._0_4_ | (uint)!bVar13 * auVar192._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar194._4_4_ = (float)((uint)bVar13 * auVar199._4_4_ | (uint)!bVar13 * auVar192._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar194._8_4_ = (float)((uint)bVar13 * auVar199._8_4_ | (uint)!bVar13 * auVar192._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar194._12_4_ =
                 (float)((uint)bVar13 * auVar199._12_4_ | (uint)!bVar13 * auVar192._12_4_);
            bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar194._16_4_ =
                 (float)((uint)bVar13 * auVar199._16_4_ | (uint)!bVar13 * auVar192._16_4_);
            bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar194._20_4_ =
                 (float)((uint)bVar13 * auVar199._20_4_ | (uint)!bVar13 * auVar192._20_4_);
            bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar194._24_4_ =
                 (float)((uint)bVar13 * auVar199._24_4_ | (uint)!bVar13 * auVar192._24_4_);
            bVar13 = SUB81(uVar15 >> 7,0);
            auVar194._28_4_ = (uint)bVar13 * auVar199._28_4_ | (uint)!bVar13 * auVar192._28_4_;
            auVar114._4_4_ = auVar194._4_4_ * auVar194._4_4_;
            auVar114._0_4_ = auVar194._0_4_ * auVar194._0_4_;
            auVar114._8_4_ = auVar194._8_4_ * auVar194._8_4_;
            auVar114._12_4_ = auVar194._12_4_ * auVar194._12_4_;
            auVar114._16_4_ = auVar194._16_4_ * auVar194._16_4_;
            auVar114._20_4_ = auVar194._20_4_ * auVar194._20_4_;
            auVar114._24_4_ = auVar194._24_4_ * auVar194._24_4_;
            auVar114._28_4_ = auVar191._28_4_;
            auVar273._8_4_ = 0x3d9021bb;
            auVar273._0_8_ = 0x3d9021bb3d9021bb;
            auVar273._12_4_ = 0x3d9021bb;
            auVar273._16_4_ = 0x3d9021bb;
            auVar273._20_4_ = 0x3d9021bb;
            auVar273._24_4_ = 0x3d9021bb;
            auVar273._28_4_ = 0x3d9021bb;
            auVar67._8_4_ = 0xbdebd1b8;
            auVar67._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar67._12_4_ = 0xbdebd1b8;
            auVar67._16_4_ = 0xbdebd1b8;
            auVar67._20_4_ = 0xbdebd1b8;
            auVar67._24_4_ = 0xbdebd1b8;
            auVar67._28_4_ = 0xbdebd1b8;
            auVar191 = vfmadd213ps_avx512vl(auVar273,auVar194,auVar67);
            auVar68._8_4_ = 0x3def251a;
            auVar68._0_8_ = 0x3def251a3def251a;
            auVar68._12_4_ = 0x3def251a;
            auVar68._16_4_ = 0x3def251a;
            auVar68._20_4_ = 0x3def251a;
            auVar68._24_4_ = 0x3def251a;
            auVar68._28_4_ = 0x3def251a;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar194,auVar68);
            auVar69._8_4_ = 0xbdfe5d4f;
            auVar69._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar69._12_4_ = 0xbdfe5d4f;
            auVar69._16_4_ = 0xbdfe5d4f;
            auVar69._20_4_ = 0xbdfe5d4f;
            auVar69._24_4_ = 0xbdfe5d4f;
            auVar69._28_4_ = 0xbdfe5d4f;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar194,auVar69);
            auVar70._8_4_ = 0x3e11e9bf;
            auVar70._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar70._12_4_ = 0x3e11e9bf;
            auVar70._16_4_ = 0x3e11e9bf;
            auVar70._20_4_ = 0x3e11e9bf;
            auVar70._24_4_ = 0x3e11e9bf;
            auVar70._28_4_ = 0x3e11e9bf;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar194,auVar70);
            auVar71._8_4_ = 0xbe2aae50;
            auVar71._0_8_ = 0xbe2aae50be2aae50;
            auVar71._12_4_ = 0xbe2aae50;
            auVar71._16_4_ = 0xbe2aae50;
            auVar71._20_4_ = 0xbe2aae50;
            auVar71._24_4_ = 0xbe2aae50;
            auVar71._28_4_ = 0xbe2aae50;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar194,auVar71);
            auVar72._8_4_ = 0x3e4cceac;
            auVar72._0_8_ = 0x3e4cceac3e4cceac;
            auVar72._12_4_ = 0x3e4cceac;
            auVar72._16_4_ = 0x3e4cceac;
            auVar72._20_4_ = 0x3e4cceac;
            auVar72._24_4_ = 0x3e4cceac;
            auVar72._28_4_ = 0x3e4cceac;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar194,auVar72);
            auVar73._8_4_ = 0xbe7ffffc;
            auVar73._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar73._12_4_ = 0xbe7ffffc;
            auVar73._16_4_ = 0xbe7ffffc;
            auVar73._20_4_ = 0xbe7ffffc;
            auVar73._24_4_ = 0xbe7ffffc;
            auVar73._28_4_ = 0xbe7ffffc;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar194,auVar73);
            auVar74._8_4_ = 0x3eaaaaaa;
            auVar74._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar74._12_4_ = 0x3eaaaaaa;
            auVar74._16_4_ = 0x3eaaaaaa;
            auVar74._20_4_ = 0x3eaaaaaa;
            auVar74._24_4_ = 0x3eaaaaaa;
            auVar74._28_4_ = 0x3eaaaaaa;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar194,auVar74);
            auVar115._4_4_ = auVar194._4_4_ * auVar194._4_4_ * auVar194._4_4_ * auVar191._4_4_;
            auVar115._0_4_ = auVar194._0_4_ * auVar194._0_4_ * auVar194._0_4_ * auVar191._0_4_;
            auVar115._8_4_ = auVar194._8_4_ * auVar194._8_4_ * auVar194._8_4_ * auVar191._8_4_;
            auVar115._12_4_ = auVar194._12_4_ * auVar194._12_4_ * auVar194._12_4_ * auVar191._12_4_;
            auVar115._16_4_ = auVar194._16_4_ * auVar194._16_4_ * auVar194._16_4_ * auVar191._16_4_;
            auVar115._20_4_ = auVar194._20_4_ * auVar194._20_4_ * auVar194._20_4_ * auVar191._20_4_;
            auVar115._24_4_ = auVar194._24_4_ * auVar194._24_4_ * auVar194._24_4_ * auVar191._24_4_;
            auVar115._28_4_ = auVar191._28_4_;
            auVar75._8_4_ = 0xffffff82;
            auVar75._0_8_ = 0xffffff82ffffff82;
            auVar75._12_4_ = 0xffffff82;
            auVar75._16_4_ = 0xffffff82;
            auVar75._20_4_ = 0xffffff82;
            auVar75._24_4_ = 0xffffff82;
            auVar75._28_4_ = 0xffffff82;
            auVar191 = vpaddd_avx512vl(auVar247,auVar75);
            auVar191 = vcvtdq2ps_avx(auVar191);
            auVar192 = vsubps_avx512vl(auVar191,auVar307);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar195._0_4_ = (uint)bVar13 * auVar192._0_4_ | (uint)!bVar13 * auVar191._0_4_;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar195._4_4_ = (uint)bVar13 * auVar192._4_4_ | (uint)!bVar13 * auVar191._4_4_;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar195._8_4_ = (uint)bVar13 * auVar192._8_4_ | (uint)!bVar13 * auVar191._8_4_;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar195._12_4_ = (uint)bVar13 * auVar192._12_4_ | (uint)!bVar13 * auVar191._12_4_;
            bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar195._16_4_ = (uint)bVar13 * auVar192._16_4_ | (uint)!bVar13 * auVar191._16_4_;
            bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar195._20_4_ = (uint)bVar13 * auVar192._20_4_ | (uint)!bVar13 * auVar191._20_4_;
            bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar195._24_4_ = (uint)bVar13 * auVar192._24_4_ | (uint)!bVar13 * auVar191._24_4_;
            bVar13 = SUB81(uVar15 >> 7,0);
            auVar195._28_4_ = (uint)bVar13 * auVar192._28_4_ | (uint)!bVar13 * auVar191._28_4_;
            auVar191 = vfmadd231ps_avx512vl(auVar115,auVar195,auVar187);
            auVar159 = vfmsub231ps_fma(auVar191,auVar296,auVar114);
            auVar191 = vsubps_avx(ZEXT1632(auVar159),auVar194);
            auVar159 = vfmsub231ps_fma(auVar191,auVar312,auVar195);
            auVar280._8_4_ = 0xc0000000;
            auVar280._0_8_ = 0xc0000000c0000000;
            auVar280._12_4_ = 0xc0000000;
            auVar280._16_4_ = 0xc0000000;
            auVar280._20_4_ = 0xc0000000;
            auVar280._24_4_ = 0xc0000000;
            auVar280._28_4_ = 0xc0000000;
            auVar191 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar13 = (bool)((byte)uVar134 & 1);
            auVar196._0_4_ =
                 (uint)bVar13 * auVar191._0_4_ | (uint)!bVar13 * (int)(auVar159._0_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar134 >> 1) & 1);
            auVar196._4_4_ =
                 (uint)bVar13 * auVar191._4_4_ | (uint)!bVar13 * (int)(auVar159._4_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar134 >> 2) & 1);
            auVar196._8_4_ =
                 (uint)bVar13 * auVar191._8_4_ | (uint)!bVar13 * (int)(auVar159._8_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar134 >> 3) & 1);
            auVar196._12_4_ =
                 (uint)bVar13 * auVar191._12_4_ | (uint)!bVar13 * (int)(auVar159._12_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar134 >> 4) & 1);
            auVar196._16_4_ = (uint)bVar13 * auVar191._16_4_ | (uint)!bVar13 * -0x80000000;
            bVar13 = (bool)((byte)(uVar134 >> 5) & 1);
            auVar196._20_4_ = (uint)bVar13 * auVar191._20_4_ | (uint)!bVar13 * -0x80000000;
            bVar13 = (bool)((byte)(uVar134 >> 6) & 1);
            auVar196._24_4_ = (uint)bVar13 * auVar191._24_4_ | (uint)!bVar13 * -0x80000000;
            auVar196._28_4_ = (uint)(byte)(uVar134 >> 7) * auVar191._28_4_;
            auVar191 = vminps_avx(auVar196,auVar285);
            auVar191 = vmaxps_avx(auVar191,auVar291);
            auVar159 = vfmadd213ps_fma(auVar302,auVar191,auVar296);
            auVar192 = vroundps_avx(ZEXT1632(auVar159),1);
            uVar134 = vcmpps_avx512vl(ZEXT1632(auVar159),auVar192,1);
            auVar199 = vsubps_avx512vl(auVar192,auVar307);
            bVar13 = (bool)((byte)uVar134 & 1);
            auVar197._0_4_ = (float)((uint)bVar13 * auVar199._0_4_ | (uint)!bVar13 * auVar192._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar134 >> 1) & 1);
            auVar197._4_4_ = (float)((uint)bVar13 * auVar199._4_4_ | (uint)!bVar13 * auVar192._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar134 >> 2) & 1);
            auVar197._8_4_ = (float)((uint)bVar13 * auVar199._8_4_ | (uint)!bVar13 * auVar192._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar134 >> 3) & 1);
            auVar197._12_4_ =
                 (float)((uint)bVar13 * auVar199._12_4_ | (uint)!bVar13 * auVar192._12_4_);
            bVar13 = (bool)((byte)(uVar134 >> 4) & 1);
            auVar197._16_4_ =
                 (float)((uint)bVar13 * auVar199._16_4_ | (uint)!bVar13 * auVar192._16_4_);
            bVar13 = (bool)((byte)(uVar134 >> 5) & 1);
            auVar197._20_4_ =
                 (float)((uint)bVar13 * auVar199._20_4_ | (uint)!bVar13 * auVar192._20_4_);
            bVar13 = (bool)((byte)(uVar134 >> 6) & 1);
            auVar197._24_4_ =
                 (float)((uint)bVar13 * auVar199._24_4_ | (uint)!bVar13 * auVar192._24_4_);
            bVar13 = SUB81(uVar134 >> 7,0);
            auVar197._28_4_ =
                 (float)((uint)bVar13 * auVar199._28_4_ | (uint)!bVar13 * auVar192._28_4_);
            auVar159 = vfmsub231ps_fma(auVar191,auVar197,auVar312);
            auVar191 = vfnmsub231ps_avx512vl(ZEXT1632(auVar159),auVar197,auVar187);
            auVar248._0_4_ = auVar191._0_4_ * auVar191._0_4_;
            auVar248._4_4_ = auVar191._4_4_ * auVar191._4_4_;
            auVar248._8_4_ = auVar191._8_4_ * auVar191._8_4_;
            auVar248._12_4_ = auVar191._12_4_ * auVar191._12_4_;
            auVar248._16_4_ = auVar191._16_4_ * auVar191._16_4_;
            auVar248._20_4_ = auVar191._20_4_ * auVar191._20_4_;
            auVar248._24_4_ = auVar191._24_4_ * auVar191._24_4_;
            auVar248._28_4_ = 0;
            auVar159 = vfmadd213ps_fma(auVar317,auVar191,auVar323);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar191,auVar327);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar191,auVar331);
            auVar192 = vfmadd213ps_avx512vl(ZEXT1632(auVar159),auVar191,auVar188);
            auVar159 = vfmadd213ps_fma(auVar192,auVar191,auVar296);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar248,auVar191);
            auVar231._0_4_ = auVar159._0_4_ + 1.0;
            auVar231._4_4_ = auVar159._4_4_ + 1.0;
            auVar231._8_4_ = auVar159._8_4_ + 1.0;
            auVar231._12_4_ = auVar159._12_4_ + 1.0;
            auVar231._16_4_ = 0x3f800000;
            auVar231._20_4_ = 0x3f800000;
            auVar231._24_4_ = 0x3f800000;
            auVar231._28_4_ = 0x3f800000;
            auVar249._0_4_ = (int)auVar197._0_4_;
            auVar249._4_4_ = (int)auVar197._4_4_;
            auVar249._8_4_ = (int)auVar197._8_4_;
            auVar249._12_4_ = (int)auVar197._12_4_;
            auVar249._16_4_ = (int)auVar197._16_4_;
            auVar249._20_4_ = (int)auVar197._20_4_;
            auVar249._24_4_ = (int)auVar197._24_4_;
            auVar249._28_4_ = (int)auVar197._28_4_;
            auVar191 = vpslld_avx2(auVar249,0x17);
            auVar191 = vpaddd_avx512vl(auVar191,auVar189);
            auVar159 = vfmadd213ps_fma(auVar191,auVar231,auVar307);
            auVar191 = vdivps_avx(auVar307,ZEXT1632(auVar159));
            auVar191 = vfnmadd213ps_avx512vl(auVar191,auVar280,auVar190);
            auVar185 = auVar191._0_28_;
            goto LAB_002bd201;
          case 6:
            puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar8;
            auVar189._4_4_ = uVar1;
            auVar189._0_4_ = uVar1;
            auVar189._8_4_ = uVar1;
            auVar189._12_4_ = uVar1;
            auVar189._16_4_ = uVar1;
            auVar189._20_4_ = uVar1;
            auVar189._24_4_ = uVar1;
            auVar189._28_4_ = uVar1;
            uVar1 = puVar8[1];
            auVar187._4_4_ = uVar1;
            auVar187._0_4_ = uVar1;
            auVar187._8_4_ = uVar1;
            auVar187._12_4_ = uVar1;
            auVar187._16_4_ = uVar1;
            auVar187._20_4_ = uVar1;
            auVar187._24_4_ = uVar1;
            auVar187._28_4_ = uVar1;
            auVar191 = vfmadd213ps_avx512vl(auVar189,auVar186,auVar187);
            auVar191 = vmaxps_avx(auVar191,_DAT_005a6f60);
            auVar188._8_4_ = 0x3f800000;
            auVar188._0_8_ = 0x3f8000003f800000;
            auVar188._12_4_ = 0x3f800000;
            auVar188._16_4_ = 0x3f800000;
            auVar188._20_4_ = 0x3f800000;
            auVar188._24_4_ = 0x3f800000;
            auVar188._28_4_ = 0x3f800000;
            auVar191 = vminps_avx512vl(auVar191,auVar188);
            auVar185 = auVar191._0_28_;
LAB_002bd201:
            auVar186._4_4_ = auVar185._4_4_ * auVar186._4_4_;
            auVar186._0_4_ = auVar185._0_4_ * auVar186._0_4_;
            auVar186._8_4_ = auVar185._8_4_ * auVar186._8_4_;
            auVar186._12_4_ = auVar185._12_4_ * auVar186._12_4_;
            auVar186._16_4_ = auVar185._16_4_ * auVar186._16_4_;
            auVar186._20_4_ = auVar185._20_4_ * auVar186._20_4_;
            auVar186._24_4_ = auVar185._24_4_ * auVar186._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + local_220 * 4) = auVar186;
          uVar134 = local_2f0 + 1;
          lVar145 = local_2c0 + 8;
          lVar140 = local_2c8 + 8;
          lVar142 = local_2d0 + 8;
          lVar146 = local_2d8 + 8;
          lVar148 = local_2e0 + 8;
          lVar136 = local_2e8 + 8;
          local_2f8 = local_2f8 + 8;
          local_300 = local_300 + 8;
        } while (uVar134 != uVar141);
      }
      auVar159 = local_278;
      local_238 = (ulong)(int)uVar131;
      uVar141 = local_238 & 0xfffffffffffffff8;
      if ((uVar131 >> 2 & 1) != 0) {
        if (pvVar7 == (void *)0x0) {
          auVar160 = ZEXT816(0) << 0x40;
        }
        else {
          auVar160 = *(undefined1 (*) [16])((long)pvVar7 + uVar141 * 4);
        }
        lVar145 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pvVar9 = (this->weight_data_tm).data;
        pauVar138 = (undefined1 (*) [16])(lVar145 * uVar141 + (long)pvVar9);
        pauVar158 = (undefined1 (*) [16])((uVar141 | 1) * lVar145 + (long)pvVar9);
        pauVar156 = (undefined1 (*) [16])((uVar141 | 2) * lVar145 + (long)pvVar9);
        pauVar157 = (undefined1 (*) [16])(lVar145 * (uVar141 | 3) + (long)pvVar9);
        pauVar139 = local_3a8;
        if ((int)uVar132 < 8) {
          uVar147 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar147 = uVar132 & 0xfffffff8;
          auVar298 = ZEXT864(0);
          iVar144 = 7;
          auVar293 = ZEXT864(0);
          auVar299 = ZEXT864(0);
          auVar287 = ZEXT864(0);
          do {
            auVar191 = *pauVar139;
            auVar161 = vlddqu_avx(*pauVar138);
            auVar192 = vcvtph2ps_f16c(auVar161);
            auVar161 = vlddqu_avx(*pauVar158);
            auVar186 = vcvtph2ps_f16c(auVar161);
            auVar161 = vlddqu_avx(*pauVar156);
            auVar187 = vcvtph2ps_f16c(auVar161);
            auVar161 = vlddqu_avx(*pauVar157);
            auVar188 = vcvtph2ps_f16c(auVar161);
            auVar161 = vfmadd231ps_fma(auVar287._0_32_,auVar191,auVar192);
            auVar287 = ZEXT1664(auVar161);
            local_1b8 = ZEXT1632(auVar161);
            auVar161 = vfmadd231ps_fma(auVar299._0_32_,auVar191,auVar186);
            auVar299 = ZEXT1664(auVar161);
            local_1f8 = ZEXT1632(auVar161);
            auVar161 = vfmadd231ps_fma(auVar293._0_32_,auVar191,auVar187);
            auVar293 = ZEXT1664(auVar161);
            local_1d8 = ZEXT1632(auVar161);
            auVar161 = vfmadd231ps_fma(auVar298._0_32_,auVar191,auVar188);
            auVar298 = ZEXT1664(auVar161);
            local_198 = ZEXT1632(auVar161);
            pauVar139 = pauVar139 + 1;
            pauVar138 = pauVar138 + 1;
            pauVar158 = pauVar158 + 1;
            pauVar156 = pauVar156 + 1;
            pauVar157 = pauVar157 + 1;
            iVar144 = iVar144 + 8;
          } while (iVar144 < (int)uVar132);
        }
        local_298 = ZEXT816(0) << 0x40;
        if ((int)(uVar147 | 3) < (int)uVar132) {
          auVar298 = ZEXT864(0);
          lVar145 = 0;
          auVar287 = ZEXT864(0);
          local_358 = ZEXT816(0);
          pauVar143 = pauVar139;
          uVar130 = uVar147;
          do {
            auVar161._8_8_ = 0;
            auVar161._0_8_ = *(ulong *)(*pauVar138 + lVar145);
            auVar165 = vcvtph2ps_f16c(auVar161);
            auVar162._8_8_ = 0;
            auVar162._0_8_ = *(ulong *)(*pauVar158 + lVar145);
            auVar162 = vcvtph2ps_f16c(auVar162);
            auVar163._8_8_ = 0;
            auVar163._0_8_ = *(ulong *)(*pauVar156 + lVar145);
            auVar163 = vcvtph2ps_f16c(auVar163);
            auVar161 = *(undefined1 (*) [16])(*pauVar139 + lVar145 * 2);
            auVar164._8_8_ = 0;
            auVar164._0_8_ = *(ulong *)(*pauVar157 + lVar145);
            auVar164 = vcvtph2ps_f16c(auVar164);
            local_298 = vfmadd231ps_fma(local_298,auVar161,auVar165);
            local_358 = vfmadd231ps_fma(local_358,auVar161,auVar162);
            local_348 = vfmadd231ps_fma(auVar287._0_16_,auVar161,auVar163);
            auVar287 = ZEXT1664(local_348);
            local_288 = vfmadd231ps_fma(auVar298._0_16_,auVar161,auVar164);
            auVar298 = ZEXT1664(local_288);
            pauVar143 = (undefined1 (*) [32])(*pauVar143 + 0x10);
            uVar147 = uVar130 + 4;
            iVar144 = uVar130 + 7;
            lVar145 = lVar145 + 8;
            uVar130 = uVar147;
          } while (iVar144 < (int)uVar132);
          pauVar157 = (undefined1 (*) [16])(*pauVar157 + lVar145);
          pauVar156 = (undefined1 (*) [16])(*pauVar156 + lVar145);
          pauVar158 = (undefined1 (*) [16])(*pauVar158 + lVar145);
          pauVar138 = (undefined1 (*) [16])(*pauVar138 + lVar145);
          pauVar139 = pauVar143;
        }
        else {
          local_358 = ZEXT816(0);
          local_348 = SUB6416(ZEXT864(0),0);
          local_288 = SUB6416(ZEXT864(0),0);
        }
        local_278._4_4_ = 0;
        local_278._0_4_ = uVar132 - uVar147;
        local_278._8_8_ = auVar159._8_8_;
        if (uVar132 - uVar147 != 0 && (int)uVar147 <= (int)uVar132) {
          lVar145 = 0;
          do {
            local_2b8._0_16_ = auVar160;
            local_318 = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
            fVar253 = float16_to_float32(*(unsigned_short *)(*pauVar138 + lVar145 * 2));
            auVar191 = _local_218;
            local_218._4_4_ = extraout_XMM0_Db_06;
            local_218._0_4_ = fVar253;
            fStack_210 = (float)extraout_XMM0_Dc_05;
            _fStack_208 = auVar191._16_16_;
            fStack_20c = (float)extraout_XMM0_Dd_05;
            _local_328 = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
            local_338._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar158 + lVar145 * 2));
            local_338._4_4_ = extraout_XMM0_Db_07;
            local_338._8_4_ = extraout_XMM0_Dc_06;
            local_338._12_4_ = extraout_XMM0_Dd_06;
            local_248 = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
            local_258._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar156 + lVar145 * 2));
            local_258._4_4_ = extraout_XMM0_Db_08;
            local_258._8_4_ = extraout_XMM0_Dc_07;
            local_258._12_4_ = extraout_XMM0_Dd_07;
            local_268 = ZEXT416(*(uint *)(*pauVar139 + lVar145 * 4));
            auVar287._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar157 + lVar145 * 2));
            auVar287._4_60_ = extraout_var_00;
            auVar159 = vinsertps_avx(_local_218,ZEXT416((uint)local_338._0_4_),0x10);
            auVar159 = vinsertps_avx(auVar159,ZEXT416((uint)local_258._0_4_),0x20);
            auVar159 = vinsertps_avx(auVar159,auVar287._0_16_,0x30);
            auVar160 = vinsertps_avx(local_318,ZEXT416((uint)local_328._0_4_),0x10);
            auVar160 = vinsertps_avx(auVar160,ZEXT416((uint)local_248._0_4_),0x20);
            auVar160 = vinsertps_avx(auVar160,ZEXT416((uint)local_268._0_4_),0x30);
            auVar160 = vfmadd231ps_fma(local_2b8._0_16_,auVar159,auVar160);
            lVar145 = lVar145 + 1;
          } while (local_278._0_4_ != (int)lVar145);
        }
        auVar191 = vhaddps_avx(local_1b8,local_1f8);
        auVar192 = vhaddps_avx(local_1d8,local_198);
        auVar191 = vhaddps_avx(auVar191,auVar192);
        auVar162 = vunpcklps_avx(local_298,local_358);
        auVar163 = vunpcklps_avx(local_348,local_288);
        auVar159 = vunpckhps_avx(local_298,local_358);
        auVar164 = vunpckhps_avx(local_348,local_288);
        auVar161 = vmovlhps_avx(auVar162,auVar163);
        auVar163 = vunpckhpd_avx(auVar162,auVar163);
        auVar162 = vmovlhps_avx(auVar159,auVar164);
        auVar164 = vunpckhpd_avx(auVar159,auVar164);
        auVar159._0_4_ =
             auVar163._0_4_ + auVar161._0_4_ + auVar162._0_4_ + auVar164._0_4_ +
             auVar160._0_4_ + auVar191._0_4_ + auVar191._16_4_;
        auVar159._4_4_ =
             auVar163._4_4_ + auVar161._4_4_ + auVar162._4_4_ + auVar164._4_4_ +
             auVar160._4_4_ + auVar191._4_4_ + auVar191._20_4_;
        auVar159._8_4_ =
             auVar163._8_4_ + auVar161._8_4_ + auVar162._8_4_ + auVar164._8_4_ +
             auVar160._8_4_ + auVar191._8_4_ + auVar191._24_4_;
        auVar159._12_4_ =
             auVar163._12_4_ + auVar161._12_4_ + auVar162._12_4_ + auVar164._12_4_ +
             auVar160._12_4_ + auVar191._12_4_ + auVar191._28_4_;
        switch(iVar5) {
        case 1:
          auVar159 = vmaxps_avx(auVar159,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar160 = vmaxps_avx(auVar159,ZEXT816(0) << 0x20);
          auVar159 = vminps_avx(auVar159,ZEXT816(0) << 0x20);
          uVar1 = *(this->super_InnerProduct).activation_params.data;
          auVar54._4_4_ = uVar1;
          auVar54._0_4_ = uVar1;
          auVar54._8_4_ = uVar1;
          auVar54._12_4_ = uVar1;
          auVar159 = vfmadd132ps_avx512vl(auVar159,auVar160,auVar54);
          break;
        case 3:
          puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar8;
          auVar52._4_4_ = uVar1;
          auVar52._0_4_ = uVar1;
          auVar52._8_4_ = uVar1;
          auVar52._12_4_ = uVar1;
          auVar159 = vmaxps_avx512vl(auVar159,auVar52);
          uVar1 = puVar8[1];
          auVar53._4_4_ = uVar1;
          auVar53._0_4_ = uVar1;
          auVar53._8_4_ = uVar1;
          auVar53._12_4_ = uVar1;
          auVar159 = vminps_avx512vl(auVar159,auVar53);
          break;
        case 4:
          auVar42._8_4_ = 0x80000000;
          auVar42._0_8_ = 0x8000000080000000;
          auVar42._12_4_ = 0x80000000;
          auVar159 = vxorps_avx512vl(auVar159,auVar42);
          auVar43._8_4_ = 0x42b0c0a5;
          auVar43._0_8_ = 0x42b0c0a542b0c0a5;
          auVar43._12_4_ = 0x42b0c0a5;
          auVar159 = vminps_avx512vl(auVar159,auVar43);
          auVar44._8_4_ = 0xc2b0c0a5;
          auVar44._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar44._12_4_ = 0xc2b0c0a5;
          auVar161 = vmaxps_avx512vl(auVar159,auVar44);
          auVar228._8_4_ = 0x3f000000;
          auVar228._0_8_ = 0x3f0000003f000000;
          auVar228._12_4_ = 0x3f000000;
          auVar242._8_4_ = 0x3fb8aa3b;
          auVar242._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar242._12_4_ = 0x3fb8aa3b;
          auVar160 = vfmadd213ps_fma(auVar242,auVar161,auVar228);
          auVar264._0_4_ = (int)auVar160._0_4_;
          auVar264._4_4_ = (int)auVar160._4_4_;
          auVar264._8_4_ = (int)auVar160._8_4_;
          auVar264._12_4_ = (int)auVar160._12_4_;
          auVar159 = vcvtdq2ps_avx(auVar264);
          uVar134 = vcmpps_avx512vl(auVar160,auVar159,1);
          auVar243._8_4_ = 0x3f800000;
          auVar243._0_8_ = 0x3f8000003f800000;
          auVar243._12_4_ = 0x3f800000;
          auVar160 = vsubps_avx512vl(auVar159,auVar243);
          bVar13 = (bool)((byte)uVar134 & 1);
          auVar184._0_4_ = (float)((uint)bVar13 * auVar160._0_4_ | (uint)!bVar13 * auVar159._0_4_);
          bVar13 = (bool)((byte)(uVar134 >> 1) & 1);
          auVar184._4_4_ = (float)((uint)bVar13 * auVar160._4_4_ | (uint)!bVar13 * auVar159._4_4_);
          bVar13 = (bool)((byte)(uVar134 >> 2) & 1);
          auVar184._8_4_ = (float)((uint)bVar13 * auVar160._8_4_ | (uint)!bVar13 * auVar159._8_4_);
          bVar13 = (bool)((byte)(uVar134 >> 3) & 1);
          auVar184._12_4_ =
               (float)((uint)bVar13 * auVar160._12_4_ | (uint)!bVar13 * auVar159._12_4_);
          auVar45._8_4_ = 0x3f318000;
          auVar45._0_8_ = 0x3f3180003f318000;
          auVar45._12_4_ = 0x3f318000;
          auVar159 = vfmsub231ps_avx512vl(auVar161,auVar184,auVar45);
          auVar46._8_4_ = 0x395e8083;
          auVar46._0_8_ = 0x395e8083395e8083;
          auVar46._12_4_ = 0x395e8083;
          auVar160 = vfmsub231ps_avx512vl(auVar159,auVar184,auVar46);
          auVar272._8_4_ = 0x39506967;
          auVar272._0_8_ = 0x3950696739506967;
          auVar272._12_4_ = 0x39506967;
          auVar47._8_4_ = 0x3ab743ce;
          auVar47._0_8_ = 0x3ab743ce3ab743ce;
          auVar47._12_4_ = 0x3ab743ce;
          auVar159 = vfmadd213ps_avx512vl(auVar272,auVar160,auVar47);
          auVar48._8_4_ = 0x3c088908;
          auVar48._0_8_ = 0x3c0889083c088908;
          auVar48._12_4_ = 0x3c088908;
          auVar159 = vfmadd213ps_avx512vl(auVar159,auVar160,auVar48);
          auVar49._8_4_ = 0x3d2aa9c1;
          auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar49._12_4_ = 0x3d2aa9c1;
          auVar159 = vfmadd213ps_avx512vl(auVar159,auVar160,auVar49);
          auVar279._0_4_ = auVar160._0_4_ * auVar160._0_4_;
          auVar279._4_4_ = auVar160._4_4_ * auVar160._4_4_;
          auVar279._8_4_ = auVar160._8_4_ * auVar160._8_4_;
          auVar279._12_4_ = auVar160._12_4_ * auVar160._12_4_;
          auVar50._8_4_ = 0x3e2aaaaa;
          auVar50._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar50._12_4_ = 0x3e2aaaaa;
          auVar159 = vfmadd213ps_avx512vl(auVar159,auVar160,auVar50);
          auVar159 = vfmadd213ps_fma(auVar159,auVar160,auVar228);
          auVar159 = vfmadd213ps_fma(auVar159,auVar279,auVar160);
          auVar222._0_4_ = auVar159._0_4_ + 1.0;
          auVar222._4_4_ = auVar159._4_4_ + 1.0;
          auVar222._8_4_ = auVar159._8_4_ + 1.0;
          auVar222._12_4_ = auVar159._12_4_ + 1.0;
          auVar229._0_4_ = (int)auVar184._0_4_;
          auVar229._4_4_ = (int)auVar184._4_4_;
          auVar229._8_4_ = (int)auVar184._8_4_;
          auVar229._12_4_ = (int)auVar184._12_4_;
          auVar159 = vpslld_avx(auVar229,0x17);
          auVar51._8_4_ = 0x3f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar51._12_4_ = 0x3f800000;
          auVar159 = vpaddd_avx512vl(auVar159,auVar51);
          auVar159 = vfmadd213ps_fma(auVar159,auVar222,auVar243);
          auVar159 = vdivps_avx(auVar243,auVar159);
          break;
        case 5:
          auVar284._8_4_ = 0x42b0c0a5;
          auVar284._0_8_ = 0x42b0c0a542b0c0a5;
          auVar284._12_4_ = 0x42b0c0a5;
          auVar289._8_4_ = 0xc2b0c0a5;
          auVar289._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar289._12_4_ = 0xc2b0c0a5;
          auVar160 = vminps_avx(auVar159,auVar284);
          auVar161 = vmaxps_avx(auVar160,auVar289);
          auVar270._8_4_ = 0x3fb8aa3b;
          auVar270._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar270._12_4_ = 0x3fb8aa3b;
          auVar240._8_4_ = 0x3f000000;
          auVar240._0_8_ = 0x3f0000003f000000;
          auVar240._12_4_ = 0x3f000000;
          auVar162 = vfmadd213ps_fma(auVar270,auVar161,auVar240);
          auVar261._0_4_ = (int)auVar162._0_4_;
          auVar261._4_4_ = (int)auVar162._4_4_;
          auVar261._8_4_ = (int)auVar162._8_4_;
          auVar261._12_4_ = (int)auVar162._12_4_;
          auVar160 = vcvtdq2ps_avx(auVar261);
          uVar134 = vcmpps_avx512vl(auVar162,auVar160,1);
          auVar226._8_4_ = 0x3f800000;
          auVar226._0_8_ = 0x3f8000003f800000;
          auVar226._12_4_ = 0x3f800000;
          auVar262._8_4_ = 0x3f318000;
          auVar262._0_8_ = 0x3f3180003f318000;
          auVar262._12_4_ = 0x3f318000;
          auVar162 = vsubps_avx512vl(auVar160,auVar226);
          bVar13 = (bool)((byte)uVar134 & 1);
          auVar179._0_4_ = (float)((uint)bVar13 * auVar162._0_4_ | (uint)!bVar13 * auVar160._0_4_);
          bVar13 = (bool)((byte)(uVar134 >> 1) & 1);
          auVar179._4_4_ = (float)((uint)bVar13 * auVar162._4_4_ | (uint)!bVar13 * auVar160._4_4_);
          bVar13 = (bool)((byte)(uVar134 >> 2) & 1);
          auVar179._8_4_ = (float)((uint)bVar13 * auVar162._8_4_ | (uint)!bVar13 * auVar160._8_4_);
          bVar13 = (bool)((byte)(uVar134 >> 3) & 1);
          auVar179._12_4_ =
               (float)((uint)bVar13 * auVar162._12_4_ | (uint)!bVar13 * auVar160._12_4_);
          auVar160 = vfmsub231ps_fma(auVar161,auVar179,auVar262);
          auVar295._8_4_ = 0xb95e8083;
          auVar295._0_8_ = 0xb95e8083b95e8083;
          auVar295._12_4_ = 0xb95e8083;
          auVar160 = vfnmsub231ps_fma(auVar160,auVar179,auVar295);
          auVar161 = vmulps_avx512vl(auVar160,auVar160);
          auVar301._8_4_ = 0x3ab743ce;
          auVar301._0_8_ = 0x3ab743ce3ab743ce;
          auVar301._12_4_ = 0x3ab743ce;
          auVar278._8_4_ = 0x39506967;
          auVar278._0_8_ = 0x3950696739506967;
          auVar278._12_4_ = 0x39506967;
          auVar162 = vfmadd213ps_avx512vl(auVar278,auVar160,auVar301);
          auVar306._8_4_ = 0x3c088908;
          auVar306._0_8_ = 0x3c0889083c088908;
          auVar306._12_4_ = 0x3c088908;
          auVar311._8_4_ = 0x3d2aa9c1;
          auVar311._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar311._12_4_ = 0x3d2aa9c1;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar160,auVar306);
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar160,auVar311);
          auVar316._8_4_ = 0x3e2aaaaa;
          auVar316._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar316._12_4_ = 0x3e2aaaaa;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar160,auVar316);
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar160,auVar240);
          auVar160 = vfmadd213ps_avx512vl(auVar162,auVar161,auVar160);
          auVar161 = vaddps_avx512vl(auVar160,auVar226);
          auVar321._0_4_ = (int)auVar179._0_4_;
          auVar321._4_4_ = (int)auVar179._4_4_;
          auVar321._8_4_ = (int)auVar179._8_4_;
          auVar321._12_4_ = (int)auVar179._12_4_;
          auVar160 = vpslld_avx(auVar321,0x17);
          auVar322._8_4_ = 0x3f800000;
          auVar322._0_8_ = 0x3f8000003f800000;
          auVar322._12_4_ = 0x3f800000;
          auVar160 = vpaddd_avx(auVar160,auVar322);
          auVar160 = vfmadd213ps_avx512vl(auVar160,auVar161,auVar226);
          auVar171._8_4_ = 0x800000;
          auVar171._0_8_ = 0x80000000800000;
          auVar171._12_4_ = 0x800000;
          auVar161 = vmaxps_avx512vl(auVar160,auVar171);
          uVar134 = vcmpps_avx512vl(auVar160,ZEXT816(0) << 0x40,2);
          auVar160 = vpsrld_avx512vl(auVar161,0x17);
          auVar330._8_4_ = 0x3f000000;
          auVar330._0_8_ = 0x3f0000003f000000;
          auVar330._12_4_ = 0x3f000000;
          auVar168._8_4_ = 0x807fffff;
          auVar168._0_8_ = 0x807fffff807fffff;
          auVar168._12_4_ = 0x807fffff;
          auVar161 = vpternlogd_avx512vl(auVar330,auVar161,auVar168,0xf8);
          auVar167._8_4_ = 0xffffff82;
          auVar167._0_8_ = 0xffffff82ffffff82;
          auVar167._12_4_ = 0xffffff82;
          auVar160 = vpaddd_avx512vl(auVar160,auVar167);
          auVar169._8_4_ = 0x3f3504f3;
          auVar169._0_8_ = 0x3f3504f33f3504f3;
          auVar169._12_4_ = 0x3f3504f3;
          uVar15 = vcmpps_avx512vl(auVar161,auVar169,1);
          auVar170._8_4_ = 0xbf800000;
          auVar170._0_8_ = 0xbf800000bf800000;
          auVar170._12_4_ = 0xbf800000;
          auVar162 = vaddps_avx512vl(auVar161,auVar170);
          auVar160 = vcvtdq2ps_avx(auVar160);
          auVar163 = vsubps_avx512vl(auVar160,auVar226);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar180._0_4_ = (uint)bVar13 * auVar163._0_4_ | (uint)!bVar13 * auVar160._0_4_;
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar180._4_4_ = (uint)bVar13 * auVar163._4_4_ | (uint)!bVar13 * auVar160._4_4_;
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar180._8_4_ = (uint)bVar13 * auVar163._8_4_ | (uint)!bVar13 * auVar160._8_4_;
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar180._12_4_ = (uint)bVar13 * auVar163._12_4_ | (uint)!bVar13 * auVar160._12_4_;
          auVar160 = vaddps_avx512vl(auVar162,auVar161);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar181._0_4_ = (uint)bVar13 * auVar160._0_4_ | (uint)!bVar13 * auVar162._0_4_;
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar181._4_4_ = (uint)bVar13 * auVar160._4_4_ | (uint)!bVar13 * auVar162._4_4_;
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar181._8_4_ = (uint)bVar13 * auVar160._8_4_ | (uint)!bVar13 * auVar162._8_4_;
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar181._12_4_ = (uint)bVar13 * auVar160._12_4_ | (uint)!bVar13 * auVar162._12_4_;
          auVar160 = vmulps_avx512vl(auVar181,auVar181);
          auVar161 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar34._8_4_ = 0xbdebd1b8;
          auVar34._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar34._12_4_ = 0xbdebd1b8;
          auVar161 = vfmadd213ps_avx512vl(auVar161,auVar181,auVar34);
          auVar35._8_4_ = 0x3def251a;
          auVar35._0_8_ = 0x3def251a3def251a;
          auVar35._12_4_ = 0x3def251a;
          auVar161 = vfmadd213ps_avx512vl(auVar161,auVar181,auVar35);
          auVar36._8_4_ = 0xbdfe5d4f;
          auVar36._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar36._12_4_ = 0xbdfe5d4f;
          auVar161 = vfmadd213ps_avx512vl(auVar161,auVar181,auVar36);
          auVar37._8_4_ = 0x3e11e9bf;
          auVar37._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar37._12_4_ = 0x3e11e9bf;
          auVar161 = vfmadd213ps_avx512vl(auVar161,auVar181,auVar37);
          auVar38._8_4_ = 0xbe2aae50;
          auVar38._0_8_ = 0xbe2aae50be2aae50;
          auVar38._12_4_ = 0xbe2aae50;
          auVar161 = vfmadd213ps_avx512vl(auVar161,auVar181,auVar38);
          auVar39._8_4_ = 0x3e4cceac;
          auVar39._0_8_ = 0x3e4cceac3e4cceac;
          auVar39._12_4_ = 0x3e4cceac;
          auVar161 = vfmadd213ps_avx512vl(auVar161,auVar181,auVar39);
          auVar40._8_4_ = 0xbe7ffffc;
          auVar40._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar40._12_4_ = 0xbe7ffffc;
          auVar161 = vfmadd213ps_avx512vl(auVar161,auVar181,auVar40);
          auVar41._8_4_ = 0x3eaaaaaa;
          auVar41._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar41._12_4_ = 0x3eaaaaaa;
          auVar161 = vfmadd213ps_avx512vl(auVar161,auVar181,auVar41);
          auVar162 = vmulps_avx512vl(auVar160,auVar181);
          auVar161 = vmulps_avx512vl(auVar162,auVar161);
          auVar161 = vfmadd231ps_avx512vl(auVar161,auVar180,auVar295);
          auVar160 = vfmsub231ps_avx512vl(auVar161,auVar240,auVar160);
          auVar160 = vsubps_avx512vl(auVar160,auVar181);
          auVar160 = vfnmadd231ps_fma(auVar160,auVar262,auVar180);
          auVar161 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar13 = (bool)((byte)uVar134 & 1);
          auVar182._0_4_ =
               (uint)bVar13 * auVar161._0_4_ |
               (uint)!bVar13 * (int)(auVar160._0_4_ + auVar160._0_4_);
          bVar13 = (bool)((byte)(uVar134 >> 1) & 1);
          auVar182._4_4_ =
               (uint)bVar13 * auVar161._4_4_ |
               (uint)!bVar13 * (int)(auVar160._4_4_ + auVar160._4_4_);
          bVar13 = (bool)((byte)(uVar134 >> 2) & 1);
          auVar182._8_4_ =
               (uint)bVar13 * auVar161._8_4_ |
               (uint)!bVar13 * (int)(auVar160._8_4_ + auVar160._8_4_);
          bVar13 = (bool)((byte)(uVar134 >> 3) & 1);
          auVar182._12_4_ =
               (uint)bVar13 * auVar161._12_4_ |
               (uint)!bVar13 * (int)(auVar160._12_4_ + auVar160._12_4_);
          auVar160 = vminps_avx(auVar182,auVar284);
          auVar161 = vmaxps_avx(auVar160,auVar289);
          auVar162 = vfmadd213ps_fma(auVar270,auVar161,auVar240);
          auVar290._0_4_ = (int)auVar162._0_4_;
          auVar290._4_4_ = (int)auVar162._4_4_;
          auVar290._8_4_ = (int)auVar162._8_4_;
          auVar290._12_4_ = (int)auVar162._12_4_;
          auVar160 = vcvtdq2ps_avx(auVar290);
          uVar134 = vcmpps_avx512vl(auVar162,auVar160,1);
          auVar162 = vsubps_avx512vl(auVar160,auVar226);
          bVar13 = (bool)((byte)uVar134 & 1);
          auVar183._0_4_ = (float)((uint)bVar13 * auVar162._0_4_ | (uint)!bVar13 * auVar160._0_4_);
          bVar13 = (bool)((byte)(uVar134 >> 1) & 1);
          auVar183._4_4_ = (float)((uint)bVar13 * auVar162._4_4_ | (uint)!bVar13 * auVar160._4_4_);
          bVar13 = (bool)((byte)(uVar134 >> 2) & 1);
          auVar183._8_4_ = (float)((uint)bVar13 * auVar162._8_4_ | (uint)!bVar13 * auVar160._8_4_);
          bVar13 = (bool)((byte)(uVar134 >> 3) & 1);
          auVar183._12_4_ =
               (float)((uint)bVar13 * auVar162._12_4_ | (uint)!bVar13 * auVar160._12_4_);
          auVar160 = vfmsub213ps_fma(auVar262,auVar183,auVar161);
          auVar161 = vfnmsub231ps_fma(auVar160,auVar183,auVar295);
          auVar271._0_4_ = auVar161._0_4_ * auVar161._0_4_;
          auVar271._4_4_ = auVar161._4_4_ * auVar161._4_4_;
          auVar271._8_4_ = auVar161._8_4_ * auVar161._8_4_;
          auVar271._12_4_ = auVar161._12_4_ * auVar161._12_4_;
          auVar160 = vfmadd213ps_fma(auVar278,auVar161,auVar301);
          auVar160 = vfmadd213ps_fma(auVar160,auVar161,auVar306);
          auVar160 = vfmadd213ps_fma(auVar160,auVar161,auVar311);
          auVar160 = vfmadd213ps_fma(auVar160,auVar161,auVar316);
          auVar160 = vfmadd213ps_fma(auVar160,auVar161,auVar240);
          auVar160 = vfmadd213ps_fma(auVar160,auVar271,auVar161);
          auVar241._0_4_ = auVar160._0_4_ + 1.0;
          auVar241._4_4_ = auVar160._4_4_ + 1.0;
          auVar241._8_4_ = auVar160._8_4_ + 1.0;
          auVar241._12_4_ = auVar160._12_4_ + 1.0;
          auVar263._0_4_ = (int)auVar183._0_4_;
          auVar263._4_4_ = (int)auVar183._4_4_;
          auVar263._8_4_ = (int)auVar183._8_4_;
          auVar263._12_4_ = (int)auVar183._12_4_;
          auVar160 = vpslld_avx(auVar263,0x17);
          auVar160 = vpaddd_avx(auVar322,auVar160);
          auVar160 = vfmadd213ps_fma(auVar160,auVar241,auVar226);
          auVar227._8_4_ = 0x40000000;
          auVar227._0_8_ = 0x4000000040000000;
          auVar227._12_4_ = 0x40000000;
          auVar160 = vdivps_avx(auVar227,auVar160);
          auVar159 = vfmsub231ps_fma(auVar159,auVar159,auVar160);
          break;
        case 6:
          puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar8;
          auVar221._4_4_ = uVar1;
          auVar221._0_4_ = uVar1;
          auVar221._8_4_ = uVar1;
          auVar221._12_4_ = uVar1;
          uVar1 = puVar8[1];
          auVar160._4_4_ = uVar1;
          auVar160._0_4_ = uVar1;
          auVar160._8_4_ = uVar1;
          auVar160._12_4_ = uVar1;
          auVar160 = vfmadd213ps_avx512vl(auVar221,auVar159,auVar160);
          auVar166._12_4_ = 0;
          auVar166._0_12_ = ZEXT412(0);
          auVar160 = vmaxps_avx(auVar160,auVar166 << 0x20);
          auVar165._8_4_ = 0x3f800000;
          auVar165._0_8_ = 0x3f8000003f800000;
          auVar165._12_4_ = 0x3f800000;
          auVar160 = vminps_avx512vl(auVar160,auVar165);
          auVar159._0_4_ = auVar160._0_4_ * auVar159._0_4_;
          auVar159._4_4_ = auVar160._4_4_ * auVar159._4_4_;
          auVar159._8_4_ = auVar160._8_4_ * auVar159._8_4_;
          auVar159._12_4_ = auVar160._12_4_ * auVar159._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar141 * 4) = auVar159;
      }
      iVar133 = (int)uVar141 + (uVar131 >> 2 & 1) * 4;
      iVar144 = 0;
      if (iVar133 < (int)uVar131) {
        local_338._0_4_ = uVar132 & 0xfffffff8;
        uVar141 = (ulong)iVar133;
        do {
          auVar298 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar7 != (void *)0x0) {
            auVar298 = ZEXT464(*(uint *)((long)pvVar7 + uVar141 * 4));
          }
          fVar253 = auVar298._0_4_;
          pauVar138 = (undefined1 (*) [16])
                      ((long)(this->weight_data_tm).w * uVar141 * (this->weight_data_tm).elemsize +
                      (long)(this->weight_data_tm).data);
          pauVar139 = local_3a8;
          if ((int)uVar132 < 8) {
            uVar131 = 0;
            _local_218 = SUB6432(ZEXT864(0),0);
          }
          else {
            auVar287 = ZEXT864(0);
            iVar144 = 7;
            do {
              auVar159 = vlddqu_avx(*pauVar138);
              auVar191 = vcvtph2ps_f16c(auVar159);
              auVar159 = vfmadd231ps_fma(auVar287._0_32_,auVar191,*pauVar139);
              auVar287 = ZEXT1664(auVar159);
              _local_218 = ZEXT1632(auVar159);
              pauVar139 = pauVar139 + 1;
              pauVar138 = pauVar138 + 1;
              iVar144 = iVar144 + 8;
            } while (iVar144 < (int)uVar132);
            uVar131 = local_338._0_4_;
          }
          _local_328 = ZEXT816(0) << 0x40;
          uVar147 = uVar131 | 3;
          while ((int)uVar147 < (int)uVar132) {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)*pauVar138;
            auVar159 = vcvtph2ps_f16c(auVar4);
            _local_328 = vfmadd231ps_fma(_local_328,auVar159,*(undefined1 (*) [16])*pauVar139);
            pauVar139 = (undefined1 (*) [32])(*pauVar139 + 0x10);
            pauVar138 = (undefined1 (*) [16])(*pauVar138 + 8);
            uVar147 = uVar131 + 7;
            uVar131 = uVar131 + 4;
          }
          if ((int)uVar131 < (int)uVar132) {
            lVar145 = 0;
            do {
              local_2b8._0_4_ = auVar298._0_4_;
              local_318._0_4_ = *(undefined4 *)(*pauVar139 + lVar145 * 4);
              auVar293._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar138 + lVar145 * 2));
              auVar293._4_60_ = extraout_var_01;
              auVar159 = vfmadd231ss_fma(ZEXT416((uint)local_2b8._0_4_),auVar293._0_16_,
                                         ZEXT416((uint)local_318._0_4_));
              fVar253 = auVar159._0_4_;
              auVar298 = ZEXT1664(auVar159);
              lVar145 = lVar145 + 1;
            } while (uVar132 - uVar131 != (int)lVar145);
          }
          auVar223._0_4_ = (float)local_218._0_4_ + (float)local_328._0_4_ + fStack_208;
          auVar223._4_4_ = (float)local_218._4_4_ + (float)local_328._4_4_ + fStack_204;
          auVar223._8_4_ = fStack_210 + fStack_320 + fStack_200;
          auVar223._12_4_ = fStack_20c + fStack_31c + fStack_1fc;
          auVar159 = vhaddps_avx(auVar223,auVar223);
          auVar159 = vhaddps_avx(auVar159,auVar159);
          fVar253 = auVar159._0_4_ + fVar253;
          auVar159 = ZEXT416((uint)fVar253);
          fVar220 = fVar253;
          switch(iVar5) {
          case 1:
            auVar159 = vmaxss_avx(auVar159,ZEXT416(0));
            fVar220 = auVar159._0_4_;
            break;
          case 2:
            uVar17 = vcmpss_avx512f(auVar159,ZEXT416(0),0xe);
            bVar13 = (bool)((byte)uVar17 & 1);
            fVar220 = (float)((uint)bVar13 * 0x3f800000 +
                             (uint)!bVar13 * *(this->super_InnerProduct).activation_params.data) *
                      fVar253;
            break;
          case 3:
            puVar11 = (uint *)(this->super_InnerProduct).activation_params.data;
            fVar253 = (float)puVar11[1];
            auVar159 = vmaxss_avx(auVar159,ZEXT416(*puVar11));
            fVar220 = auVar159._0_4_;
            if (fVar253 < auVar159._0_4_) {
              fVar220 = fVar253;
            }
            break;
          case 4:
            auVar159 = vminss_avx(auVar159,SUB6416(ZEXT464(0x42b0c0a5),0));
            auVar56._8_4_ = 0x80000000;
            auVar56._0_8_ = 0x8000000080000000;
            auVar56._12_4_ = 0x80000000;
            auVar160 = vxorps_avx512vl(auVar159,auVar56);
            uVar17 = vcmpss_avx512f(auVar159,ZEXT416(0xc2b0c0a5),1);
            bVar13 = (bool)((byte)uVar17 & 1);
            fVar253 = expf((float)((uint)bVar13 * 0x42b0c0a5 + (uint)!bVar13 * auVar160._0_4_));
            fVar220 = 1.0 / (fVar253 + 1.0);
            break;
          case 5:
            local_2b8._0_4_ = fVar253;
            fVar253 = expf(fVar253);
            fVar253 = logf(fVar253 + 1.0);
            fVar253 = tanhf(fVar253);
            fVar220 = fVar253 * (float)local_2b8._0_4_;
            break;
          case 6:
            pfVar12 = (float *)(this->super_InnerProduct).activation_params.data;
            fVar2 = *pfVar12;
            auVar55._8_4_ = 0x80000000;
            auVar55._0_8_ = 0x8000000080000000;
            auVar55._12_4_ = 0x80000000;
            auVar161 = ZEXT416((uint)pfVar12[1]);
            auVar160 = vxorps_avx512vl(auVar161,auVar55);
            fVar254 = auVar160._0_4_ / fVar2;
            fVar220 = 0.0;
            if ((fVar254 <= fVar253) && (fVar220 = fVar253, fVar253 <= fVar254 + 1.0 / fVar2)) {
              auVar159 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar159,auVar161);
              fVar220 = auVar159._0_4_ * fVar253;
            }
          }
          *(float *)((long)top_blob->data + uVar141 * 4) = fVar220;
          uVar141 = uVar141 + 1;
          iVar144 = 0;
        } while (uVar141 != local_238);
      }
      goto LAB_002be29b;
    }
    iVar144 = 0;
    if ((iVar133 != 4) || (iVar144 = iVar129, (int)uVar131 < 1)) goto LAB_002be29b;
    uVar134 = 0;
    auVar221 = ZEXT816(0);
    auVar159 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar160 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar269._8_4_ = 0x3f000000;
    auVar269._0_8_ = 0x3f0000003f000000;
    auVar269._12_4_ = 0x3f000000;
    auVar161 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar283._8_4_ = 0x3f800000;
    auVar283._0_8_ = 0x3f8000003f800000;
    auVar283._12_4_ = 0x3f800000;
    auVar288._8_4_ = 0x3f318000;
    auVar288._0_8_ = 0x3f3180003f318000;
    auVar288._12_4_ = 0x3f318000;
    auVar300._8_4_ = 0x39506967;
    auVar300._0_8_ = 0x3950696739506967;
    auVar300._12_4_ = 0x39506967;
    auVar305._8_4_ = 0x3ab743ce;
    auVar305._0_8_ = 0x3ab743ce3ab743ce;
    auVar305._12_4_ = 0x3ab743ce;
    auVar310._8_4_ = 0x3c088908;
    auVar310._0_8_ = 0x3c0889083c088908;
    auVar310._12_4_ = 0x3c088908;
    auVar315._8_4_ = 0x3d2aa9c1;
    auVar315._0_8_ = 0x3d2aa9c13d2aa9c1;
    auVar315._12_4_ = 0x3d2aa9c1;
    auVar320._8_4_ = 0x3e2aaaaa;
    auVar320._0_8_ = 0x3e2aaaaa3e2aaaaa;
    auVar320._12_4_ = 0x3e2aaaaa;
    auVar326._8_4_ = 0x3f800000;
    auVar326._0_8_ = 0x3f8000003f800000;
    auVar326._12_4_ = 0x3f800000;
    auVar329._8_4_ = 0xb95e8083;
    auVar329._0_8_ = 0xb95e8083b95e8083;
    auVar329._12_4_ = 0xb95e8083;
    auVar162 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
    auVar163 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
    auVar164 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
    auVar165 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar166 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    do {
      auVar171 = ZEXT816(0) << 0x40;
      if (pvVar7 != (void *)0x0) {
        auVar171 = *(undefined1 (*) [16])((long)pvVar7 + uVar134 * 0x10);
      }
      pauVar139 = (undefined1 (*) [32])
                  ((long)(this->weight_data_tm).w * uVar134 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar167 = in_ZMM17._0_16_;
      auVar169 = in_ZMM18._0_16_;
      auVar168 = in_ZMM16._0_16_;
      pauVar143 = local_3a8;
      if ((int)uVar132 < 8) {
        auVar168 = vxorps_avx512vl(auVar168,auVar168);
        in_ZMM16 = ZEXT1664(auVar168);
        auVar168 = vxorps_avx512vl(auVar169,auVar169);
        in_ZMM18 = ZEXT1664(auVar168);
        auVar168 = vxorps_avx512vl(auVar167,auVar167);
        in_ZMM17 = ZEXT1664(auVar168);
        auVar298 = ZEXT864(0);
        uVar131 = 0;
      }
      else {
        auVar298 = ZEXT864(0);
        iVar144 = 7;
        auVar167 = vxorps_avx512vl(auVar167,auVar167);
        in_ZMM17 = ZEXT1664(auVar167);
        auVar167 = vxorps_avx512vl(auVar169,auVar169);
        in_ZMM18 = ZEXT1664(auVar167);
        auVar168 = vxorps_avx512vl(auVar168,auVar168);
        in_ZMM16 = ZEXT1664(auVar168);
        do {
          auVar168 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar143));
          auVar167 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar143 + 4)));
          auVar169 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar143 + 8)));
          auVar170 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar143 + 0xc)));
          auVar186 = vinsertf32x4_avx512vl(ZEXT1632(auVar168),auVar167,1);
          auVar187 = vinsertf32x4_avx512vl(ZEXT1632(auVar169),auVar170,1);
          auVar168 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar143 + 0x10)));
          auVar167 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar143 + 0x14)));
          auVar169 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar143 + 0x18)));
          auVar188 = vinsertf32x4_avx512vl(ZEXT1632(auVar168),auVar167,1);
          auVar168 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar143 + 0x1c)));
          auVar189 = vinsertf32x4_avx512vl(ZEXT1632(auVar169),auVar168,1);
          auVar191 = vlddqu_avx(*pauVar139);
          auVar192 = vlddqu_avx(pauVar139[1]);
          auVar190 = vcvtph2ps_avx512vl(auVar191._0_16_);
          auVar186 = vfmadd231ps_avx512vl(auVar298._0_32_,auVar186,auVar190);
          auVar298 = ZEXT3264(auVar186);
          auVar191 = vcvtph2ps_f16c(auVar191._16_16_);
          auVar191 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar187,auVar191);
          in_ZMM17 = ZEXT3264(auVar191);
          auVar191 = vcvtph2ps_f16c(auVar192._0_16_);
          auVar191 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar188,auVar191);
          in_ZMM18 = ZEXT3264(auVar191);
          auVar191 = vcvtph2ps_f16c(auVar192._16_16_);
          auVar191 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar189,auVar191);
          in_ZMM16 = ZEXT3264(auVar191);
          pauVar143 = pauVar143 + 1;
          pauVar139 = pauVar139 + 2;
          iVar144 = iVar144 + 8;
          uVar131 = uVar132 & 0xfffffff8;
        } while (iVar144 < (int)uVar132);
      }
      auVar191 = auVar298._0_32_;
      uVar147 = uVar131 | 3;
      while ((int)uVar147 < (int)uVar132) {
        uVar1 = *(undefined4 *)*pauVar143;
        auVar244._4_4_ = uVar1;
        auVar244._0_4_ = uVar1;
        auVar244._8_4_ = uVar1;
        auVar244._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(*pauVar143 + 4);
        auVar244._20_4_ = uVar1;
        auVar244._16_4_ = uVar1;
        auVar244._24_4_ = uVar1;
        auVar244._28_4_ = uVar1;
        auVar168 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar143 + 8)));
        uVar1 = *(undefined4 *)(*pauVar143 + 0xc);
        auVar255._4_4_ = uVar1;
        auVar255._0_4_ = uVar1;
        auVar255._8_4_ = uVar1;
        auVar255._12_4_ = uVar1;
        auVar186 = vinsertf32x4_avx512vl(ZEXT1632(auVar168),auVar255,1);
        auVar192 = vlddqu_avx(*pauVar139);
        auVar191 = vcvtph2ps_avx512vl(auVar192._0_16_);
        auVar191 = vfmadd231ps_avx512vl(auVar298._0_32_,auVar244,auVar191);
        auVar298 = ZEXT3264(auVar191);
        auVar192 = vcvtph2ps_f16c(auVar192._16_16_);
        auVar192 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar186,auVar192);
        in_ZMM17 = ZEXT3264(auVar192);
        pauVar143 = (undefined1 (*) [32])(*pauVar143 + 0x10);
        pauVar139 = pauVar139 + 1;
        uVar147 = uVar131 + 7;
        uVar131 = uVar131 + 4;
      }
      if (uVar132 - uVar131 != 0 && (int)uVar131 <= (int)uVar132) {
        lVar145 = 0;
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(*pauVar139 + lVar145 * 8);
          auVar168 = vcvtph2ps_f16c(auVar3);
          uVar1 = *(undefined4 *)(*pauVar143 + lVar145 * 4);
          auVar18._4_4_ = uVar1;
          auVar18._0_4_ = uVar1;
          auVar18._8_4_ = uVar1;
          auVar18._12_4_ = uVar1;
          auVar171 = vfmadd231ps_avx512vl(auVar171,auVar168,auVar18);
          lVar145 = lVar145 + 1;
        } while (uVar132 - uVar131 != (int)lVar145);
      }
      auVar192 = vaddps_avx512vl(in_ZMM18._0_32_,in_ZMM16._0_32_);
      auVar191 = vaddps_avx512vl(in_ZMM17._0_32_,auVar191);
      fVar253 = auVar192._4_4_ + auVar191._4_4_;
      auVar177._0_4_ =
           auVar192._16_4_ + auVar191._16_4_ + auVar192._0_4_ + auVar191._0_4_ + auVar171._0_4_;
      auVar177._4_4_ = fVar253 + fVar253 + auVar171._4_4_;
      auVar177._8_4_ =
           auVar192._24_4_ + auVar191._24_4_ + auVar192._8_4_ + auVar191._8_4_ + auVar171._8_4_;
      auVar177._12_4_ =
           auVar192._28_4_ + auVar191._28_4_ + auVar192._12_4_ + auVar191._12_4_ + auVar171._12_4_;
      switch(iVar5) {
      case 1:
        auVar177 = vmaxps_avx(auVar177,auVar221);
        break;
      case 2:
        auVar171 = vmaxps_avx(auVar177,auVar221);
        auVar168 = vminps_avx(auVar177,auVar221);
        uVar1 = *(this->super_InnerProduct).activation_params.data;
        auVar33._4_4_ = uVar1;
        auVar33._0_4_ = uVar1;
        auVar33._8_4_ = uVar1;
        auVar33._12_4_ = uVar1;
        auVar177 = vfmadd132ps_avx512vl(auVar168,auVar171,auVar33);
        break;
      case 3:
        puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar1 = *puVar8;
        auVar31._4_4_ = uVar1;
        auVar31._0_4_ = uVar1;
        auVar31._8_4_ = uVar1;
        auVar31._12_4_ = uVar1;
        auVar171 = vmaxps_avx512vl(auVar177,auVar31);
        uVar1 = puVar8[1];
        auVar32._4_4_ = uVar1;
        auVar32._0_4_ = uVar1;
        auVar32._8_4_ = uVar1;
        auVar32._12_4_ = uVar1;
        auVar177 = vminps_avx512vl(auVar171,auVar32);
        break;
      case 4:
        auVar29._8_4_ = 0x80000000;
        auVar29._0_8_ = 0x8000000080000000;
        auVar29._12_4_ = 0x80000000;
        auVar171 = vxorps_avx512vl(auVar177,auVar29);
        auVar171 = vminps_avx512vl(auVar171,auVar159);
        auVar168 = vmaxps_avx512vl(auVar171,auVar160);
        auVar167 = vfmadd231ps_avx512vl(auVar269,auVar168,auVar161);
        auVar260._0_4_ = (int)auVar167._0_4_;
        auVar260._4_4_ = (int)auVar167._4_4_;
        auVar260._8_4_ = (int)auVar167._8_4_;
        auVar260._12_4_ = (int)auVar167._12_4_;
        auVar171 = vcvtdq2ps_avx(auVar260);
        uVar15 = vcmpps_avx512vl(auVar167,auVar171,1);
        auVar167 = vsubps_avx512vl(auVar171,auVar283);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar178._0_4_ = (float)((uint)bVar13 * auVar167._0_4_ | (uint)!bVar13 * auVar171._0_4_);
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar178._4_4_ = (float)((uint)bVar13 * auVar167._4_4_ | (uint)!bVar13 * auVar171._4_4_);
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar178._8_4_ = (float)((uint)bVar13 * auVar167._8_4_ | (uint)!bVar13 * auVar171._8_4_);
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar178._12_4_ = (float)((uint)bVar13 * auVar167._12_4_ | (uint)!bVar13 * auVar171._12_4_);
        auVar171 = vfmsub231ps_fma(auVar168,auVar178,auVar288);
        auVar30._8_4_ = 0x395e8083;
        auVar30._0_8_ = 0x395e8083395e8083;
        auVar30._12_4_ = 0x395e8083;
        auVar168 = vfmsub231ps_avx512vl(auVar171,auVar178,auVar30);
        auVar237._0_4_ = auVar168._0_4_ * auVar168._0_4_;
        auVar237._4_4_ = auVar168._4_4_ * auVar168._4_4_;
        auVar237._8_4_ = auVar168._8_4_ * auVar168._8_4_;
        auVar237._12_4_ = auVar168._12_4_ * auVar168._12_4_;
        auVar171 = vfmadd213ps_fma(auVar300,auVar168,auVar305);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar310);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar315);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar320);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar269);
        auVar171 = vfmadd213ps_fma(auVar171,auVar237,auVar168);
        auVar225._0_4_ = auVar171._0_4_ + 1.0;
        auVar225._4_4_ = auVar171._4_4_ + 1.0;
        auVar225._8_4_ = auVar171._8_4_ + 1.0;
        auVar225._12_4_ = auVar171._12_4_ + 1.0;
        auVar238._0_4_ = (int)auVar178._0_4_;
        auVar238._4_4_ = (int)auVar178._4_4_;
        auVar238._8_4_ = (int)auVar178._8_4_;
        auVar238._12_4_ = (int)auVar178._12_4_;
        auVar171 = vpslld_avx(auVar238,0x17);
        auVar171 = vpaddd_avx(auVar326,auVar171);
        auVar171 = vfmadd213ps_fma(auVar171,auVar225,auVar283);
        auVar177 = vdivps_avx(auVar283,auVar171);
        break;
      case 5:
        auVar171 = vminps_avx512vl(auVar177,auVar159);
        auVar167 = vmaxps_avx512vl(auVar171,auVar160);
        auVar168 = vfmadd213ps_fma(auVar161,auVar167,auVar269);
        auVar275._0_4_ = (int)auVar168._0_4_;
        auVar275._4_4_ = (int)auVar168._4_4_;
        auVar275._8_4_ = (int)auVar168._8_4_;
        auVar275._12_4_ = (int)auVar168._12_4_;
        auVar171 = vcvtdq2ps_avx(auVar275);
        uVar15 = vcmpps_avx512vl(auVar168,auVar171,1);
        auVar168 = vsubps_avx512vl(auVar171,auVar283);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar172._0_4_ = (float)((uint)bVar13 * auVar168._0_4_ | (uint)!bVar13 * auVar171._0_4_);
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar172._4_4_ = (float)((uint)bVar13 * auVar168._4_4_ | (uint)!bVar13 * auVar171._4_4_);
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar172._8_4_ = (float)((uint)bVar13 * auVar168._8_4_ | (uint)!bVar13 * auVar171._8_4_);
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar172._12_4_ = (float)((uint)bVar13 * auVar168._12_4_ | (uint)!bVar13 * auVar171._12_4_);
        auVar171 = vfmsub231ps_fma(auVar167,auVar172,auVar288);
        auVar168 = vfnmsub231ps_fma(auVar171,auVar172,auVar329);
        auVar256._0_4_ = auVar168._0_4_ * auVar168._0_4_;
        auVar256._4_4_ = auVar168._4_4_ * auVar168._4_4_;
        auVar256._8_4_ = auVar168._8_4_ * auVar168._8_4_;
        auVar256._12_4_ = auVar168._12_4_ * auVar168._12_4_;
        auVar171 = vfmadd213ps_fma(auVar300,auVar168,auVar305);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar310);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar315);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar320);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar269);
        auVar171 = vfmadd213ps_fma(auVar171,auVar256,auVar168);
        auVar234._0_4_ = auVar171._0_4_ + 1.0;
        auVar234._4_4_ = auVar171._4_4_ + 1.0;
        auVar234._8_4_ = auVar171._8_4_ + 1.0;
        auVar234._12_4_ = auVar171._12_4_ + 1.0;
        auVar257._0_4_ = (int)auVar172._0_4_;
        auVar257._4_4_ = (int)auVar172._4_4_;
        auVar257._8_4_ = (int)auVar172._8_4_;
        auVar257._12_4_ = (int)auVar172._12_4_;
        auVar171 = vpslld_avx(auVar257,0x17);
        auVar171 = vpaddd_avx(auVar326,auVar171);
        auVar171 = vfmadd213ps_fma(auVar171,auVar234,auVar283);
        uVar15 = vcmpps_avx512vl(auVar171,auVar221,2);
        auVar20._8_4_ = 0x800000;
        auVar20._0_8_ = 0x80000000800000;
        auVar20._12_4_ = 0x800000;
        auVar171 = vmaxps_avx512vl(auVar171,auVar20);
        auVar167 = vpsrld_avx(auVar171,0x17);
        auVar276._8_4_ = 0x807fffff;
        auVar276._0_8_ = 0x807fffff807fffff;
        auVar276._12_4_ = 0x807fffff;
        auVar21._8_4_ = 0x3f000000;
        auVar21._0_8_ = 0x3f0000003f000000;
        auVar21._12_4_ = 0x3f000000;
        auVar171 = vpternlogd_avx512vl(auVar171,auVar276,auVar21,0xea);
        auVar22._8_4_ = 0x3f3504f3;
        auVar22._0_8_ = 0x3f3504f33f3504f3;
        auVar22._12_4_ = 0x3f3504f3;
        uVar16 = vcmpps_avx512vl(auVar171,auVar22,1);
        auVar23._8_4_ = 0xbf800000;
        auVar23._0_8_ = 0xbf800000bf800000;
        auVar23._12_4_ = 0xbf800000;
        auVar168 = vaddps_avx512vl(auVar171,auVar23);
        auVar171 = vaddps_avx512vl(auVar168,auVar171);
        bVar13 = (bool)((byte)uVar16 & 1);
        auVar173._0_4_ = (float)((uint)bVar13 * auVar171._0_4_ | (uint)!bVar13 * auVar168._0_4_);
        bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar173._4_4_ = (float)((uint)bVar13 * auVar171._4_4_ | (uint)!bVar13 * auVar168._4_4_);
        bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar173._8_4_ = (float)((uint)bVar13 * auVar171._8_4_ | (uint)!bVar13 * auVar168._8_4_);
        bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar173._12_4_ = (float)((uint)bVar13 * auVar171._12_4_ | (uint)!bVar13 * auVar168._12_4_);
        auVar235._0_4_ = auVar173._0_4_ * auVar173._0_4_;
        auVar235._4_4_ = auVar173._4_4_ * auVar173._4_4_;
        auVar235._8_4_ = auVar173._8_4_ * auVar173._8_4_;
        auVar235._12_4_ = auVar173._12_4_ * auVar173._12_4_;
        auVar294._8_4_ = 0x3d9021bb;
        auVar294._0_8_ = 0x3d9021bb3d9021bb;
        auVar294._12_4_ = 0x3d9021bb;
        auVar24._8_4_ = 0xbdebd1b8;
        auVar24._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar24._12_4_ = 0xbdebd1b8;
        auVar171 = vfmadd213ps_avx512vl(auVar294,auVar173,auVar24);
        auVar25._8_4_ = 0x3def251a;
        auVar25._0_8_ = 0x3def251a3def251a;
        auVar25._12_4_ = 0x3def251a;
        auVar171 = vfmadd213ps_avx512vl(auVar171,auVar173,auVar25);
        auVar26._8_4_ = 0xbdfe5d4f;
        auVar26._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar26._12_4_ = 0xbdfe5d4f;
        auVar171 = vfmadd213ps_avx512vl(auVar171,auVar173,auVar26);
        auVar27._8_4_ = 0x3e11e9bf;
        auVar27._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar27._12_4_ = 0x3e11e9bf;
        auVar171 = vfmadd213ps_avx512vl(auVar171,auVar173,auVar27);
        auVar171 = vfmadd213ps_avx512vl(auVar171,auVar173,auVar162);
        auVar171 = vfmadd213ps_avx512vl(auVar171,auVar173,auVar163);
        auVar171 = vfmadd213ps_avx512vl(auVar171,auVar173,auVar164);
        auVar171 = vfmadd213ps_avx512vl(auVar171,auVar173,auVar165);
        auVar168 = vmulps_avx512vl(auVar235,auVar173);
        in_ZMM16 = ZEXT1664(auVar168);
        auVar168 = vmulps_avx512vl(auVar168,auVar171);
        auVar28._8_4_ = 0xffffff82;
        auVar28._0_8_ = 0xffffff82ffffff82;
        auVar28._12_4_ = 0xffffff82;
        auVar171 = vpaddd_avx512vl(auVar167,auVar28);
        auVar171 = vcvtdq2ps_avx(auVar171);
        auVar167 = vsubps_avx512vl(auVar171,auVar283);
        bVar13 = (bool)((byte)uVar16 & 1);
        auVar174._0_4_ = (uint)bVar13 * auVar167._0_4_ | (uint)!bVar13 * auVar171._0_4_;
        bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar174._4_4_ = (uint)bVar13 * auVar167._4_4_ | (uint)!bVar13 * auVar171._4_4_;
        bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar174._8_4_ = (uint)bVar13 * auVar167._8_4_ | (uint)!bVar13 * auVar171._8_4_;
        bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar174._12_4_ = (uint)bVar13 * auVar167._12_4_ | (uint)!bVar13 * auVar171._12_4_;
        auVar171 = vfmadd231ps_fma(auVar168,auVar174,auVar329);
        auVar171 = vfmsub231ps_fma(auVar171,auVar269,auVar235);
        auVar171 = vsubps_avx(auVar171,auVar173);
        auVar171 = vfnmadd231ps_fma(auVar171,auVar288,auVar174);
        auVar168 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar175._0_4_ =
             (uint)bVar13 * auVar168._0_4_ | (uint)!bVar13 * (int)(auVar171._0_4_ + auVar171._0_4_);
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar175._4_4_ =
             (uint)bVar13 * auVar168._4_4_ | (uint)!bVar13 * (int)(auVar171._4_4_ + auVar171._4_4_);
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar175._8_4_ =
             (uint)bVar13 * auVar168._8_4_ | (uint)!bVar13 * (int)(auVar171._8_4_ + auVar171._8_4_);
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar175._12_4_ =
             (uint)bVar13 * auVar168._12_4_ |
             (uint)!bVar13 * (int)(auVar171._12_4_ + auVar171._12_4_);
        auVar171 = vminps_avx512vl(auVar175,auVar159);
        auVar167 = vmaxps_avx512vl(auVar171,auVar160);
        auVar168 = vfmadd213ps_fma(auVar161,auVar167,auVar269);
        auVar277._0_4_ = (int)auVar168._0_4_;
        auVar277._4_4_ = (int)auVar168._4_4_;
        auVar277._8_4_ = (int)auVar168._8_4_;
        auVar277._12_4_ = (int)auVar168._12_4_;
        auVar171 = vcvtdq2ps_avx(auVar277);
        uVar15 = vcmpps_avx512vl(auVar168,auVar171,1);
        auVar168 = vsubps_avx512vl(auVar171,auVar283);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar176._0_4_ = (float)((uint)bVar13 * auVar168._0_4_ | (uint)!bVar13 * auVar171._0_4_);
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar176._4_4_ = (float)((uint)bVar13 * auVar168._4_4_ | (uint)!bVar13 * auVar171._4_4_);
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar176._8_4_ = (float)((uint)bVar13 * auVar168._8_4_ | (uint)!bVar13 * auVar171._8_4_);
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar176._12_4_ = (float)((uint)bVar13 * auVar168._12_4_ | (uint)!bVar13 * auVar171._12_4_);
        auVar171 = vfmsub231ps_fma(auVar167,auVar176,auVar288);
        auVar168 = vfnmsub231ps_fma(auVar171,auVar176,auVar329);
        auVar258._0_4_ = auVar168._0_4_ * auVar168._0_4_;
        auVar258._4_4_ = auVar168._4_4_ * auVar168._4_4_;
        auVar258._8_4_ = auVar168._8_4_ * auVar168._8_4_;
        auVar258._12_4_ = auVar168._12_4_ * auVar168._12_4_;
        auVar171 = vfmadd213ps_fma(auVar300,auVar168,auVar305);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar310);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar315);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar320);
        auVar171 = vfmadd213ps_fma(auVar171,auVar168,auVar269);
        auVar171 = vfmadd213ps_fma(auVar171,auVar258,auVar168);
        auVar236._0_4_ = auVar171._0_4_ + 1.0;
        auVar236._4_4_ = auVar171._4_4_ + 1.0;
        auVar236._8_4_ = auVar171._8_4_ + 1.0;
        auVar236._12_4_ = auVar171._12_4_ + 1.0;
        auVar259._0_4_ = (int)auVar176._0_4_;
        auVar259._4_4_ = (int)auVar176._4_4_;
        auVar259._8_4_ = (int)auVar176._8_4_;
        auVar259._12_4_ = (int)auVar176._12_4_;
        auVar171 = vpslld_avx(auVar259,0x17);
        auVar171 = vpaddd_avx(auVar326,auVar171);
        auVar171 = vfmadd213ps_fma(auVar171,auVar236,auVar283);
        auVar171 = vdivps_avx512vl(auVar166,auVar171);
        auVar177 = vfmsub231ps_fma(auVar177,auVar177,auVar171);
        break;
      case 6:
        puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar1 = *puVar8;
        auVar239._4_4_ = uVar1;
        auVar239._0_4_ = uVar1;
        auVar239._8_4_ = uVar1;
        auVar239._12_4_ = uVar1;
        uVar1 = puVar8[1];
        auVar19._4_4_ = uVar1;
        auVar19._0_4_ = uVar1;
        auVar19._8_4_ = uVar1;
        auVar19._12_4_ = uVar1;
        auVar171 = vfmadd213ps_avx512vl(auVar239,auVar177,auVar19);
        auVar171 = vmaxps_avx(auVar171,auVar221);
        auVar171 = vminps_avx(auVar171,auVar283);
        auVar177._0_4_ = auVar171._0_4_ * auVar177._0_4_;
        auVar177._4_4_ = auVar171._4_4_ * auVar177._4_4_;
        auVar177._8_4_ = auVar171._8_4_ * auVar177._8_4_;
        auVar177._12_4_ = auVar171._12_4_ * auVar177._12_4_;
      }
      *(undefined1 (*) [16])((long)top_blob->data + uVar134 * 0x10) = auVar177;
      uVar134 = uVar134 + 1;
    } while (uVar134 != uVar141);
  }
  else if (iVar133 == 8) {
    if ((int)uVar131 < 1) goto LAB_002be29b;
    uVar134 = 0;
    auVar191 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar192 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar247._8_4_ = 0x3f000000;
    auVar247._0_8_ = 0x3f0000003f000000;
    auVar247._12_4_ = 0x3f000000;
    auVar247._16_4_ = 0x3f000000;
    auVar247._20_4_ = 0x3f000000;
    auVar247._24_4_ = 0x3f000000;
    auVar247._28_4_ = 0x3f000000;
    auVar282._8_4_ = 0x3fb8aa3b;
    auVar282._0_8_ = 0x3fb8aa3b3fb8aa3b;
    auVar282._12_4_ = 0x3fb8aa3b;
    auVar282._16_4_ = 0x3fb8aa3b;
    auVar282._20_4_ = 0x3fb8aa3b;
    auVar282._24_4_ = 0x3fb8aa3b;
    auVar282._28_4_ = 0x3fb8aa3b;
    auVar286._8_4_ = 0x3f800000;
    auVar286._0_8_ = 0x3f8000003f800000;
    auVar286._12_4_ = 0x3f800000;
    auVar286._16_4_ = 0x3f800000;
    auVar286._20_4_ = 0x3f800000;
    auVar286._24_4_ = 0x3f800000;
    auVar286._28_4_ = 0x3f800000;
    auVar292._8_4_ = 0x3f318000;
    auVar292._0_8_ = 0x3f3180003f318000;
    auVar292._12_4_ = 0x3f318000;
    auVar292._16_4_ = 0x3f318000;
    auVar292._20_4_ = 0x3f318000;
    auVar292._24_4_ = 0x3f318000;
    auVar292._28_4_ = 0x3f318000;
    auVar303._8_4_ = 0x39506967;
    auVar303._0_8_ = 0x3950696739506967;
    auVar303._12_4_ = 0x39506967;
    auVar303._16_4_ = 0x39506967;
    auVar303._20_4_ = 0x39506967;
    auVar303._24_4_ = 0x39506967;
    auVar303._28_4_ = 0x39506967;
    auVar308._8_4_ = 0x3ab743ce;
    auVar308._0_8_ = 0x3ab743ce3ab743ce;
    auVar308._12_4_ = 0x3ab743ce;
    auVar308._16_4_ = 0x3ab743ce;
    auVar308._20_4_ = 0x3ab743ce;
    auVar308._24_4_ = 0x3ab743ce;
    auVar308._28_4_ = 0x3ab743ce;
    auVar313._8_4_ = 0x3c088908;
    auVar313._0_8_ = 0x3c0889083c088908;
    auVar313._12_4_ = 0x3c088908;
    auVar313._16_4_ = 0x3c088908;
    auVar313._20_4_ = 0x3c088908;
    auVar313._24_4_ = 0x3c088908;
    auVar313._28_4_ = 0x3c088908;
    auVar318._8_4_ = 0x3d2aa9c1;
    auVar318._0_8_ = 0x3d2aa9c13d2aa9c1;
    auVar318._12_4_ = 0x3d2aa9c1;
    auVar318._16_4_ = 0x3d2aa9c1;
    auVar318._20_4_ = 0x3d2aa9c1;
    auVar318._24_4_ = 0x3d2aa9c1;
    auVar318._28_4_ = 0x3d2aa9c1;
    auVar324._8_4_ = 0x3e2aaaaa;
    auVar324._0_8_ = 0x3e2aaaaa3e2aaaaa;
    auVar324._12_4_ = 0x3e2aaaaa;
    auVar324._16_4_ = 0x3e2aaaaa;
    auVar324._20_4_ = 0x3e2aaaaa;
    auVar324._24_4_ = 0x3e2aaaaa;
    auVar324._28_4_ = 0x3e2aaaaa;
    auVar328._8_4_ = 0x3f800000;
    auVar328._0_8_ = 0x3f8000003f800000;
    auVar328._12_4_ = 0x3f800000;
    auVar328._16_4_ = 0x3f800000;
    auVar328._20_4_ = 0x3f800000;
    auVar328._24_4_ = 0x3f800000;
    auVar328._28_4_ = 0x3f800000;
    auVar332._8_4_ = 0xb95e8083;
    auVar332._0_8_ = 0xb95e8083b95e8083;
    auVar332._12_4_ = 0xb95e8083;
    auVar332._16_4_ = 0xb95e8083;
    auVar332._20_4_ = 0xb95e8083;
    auVar332._24_4_ = 0xb95e8083;
    auVar332._28_4_ = 0xb95e8083;
    auVar186 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
    auVar187 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
    auVar188 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
    auVar189 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
    auVar190 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar199 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
    do {
      auVar298 = ZEXT1664(ZEXT816(0) << 0x40);
      if (pvVar7 != (void *)0x0) {
        auVar298 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar7 + uVar134 * 0x20));
      }
      pauVar139 = (undefined1 (*) [32])
                  ((long)(this->weight_data_tm).w * uVar134 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar160 = in_ZMM17._0_16_;
      auVar159 = in_ZMM16._0_16_;
      auVar163 = in_ZMM20._0_16_;
      auVar162 = in_ZMM19._0_16_;
      auVar164 = in_ZMM23._0_16_;
      auVar161 = in_ZMM18._0_16_;
      pauVar143 = local_3a8;
      if ((int)uVar132 < 8) {
        auVar161 = vxorps_avx512vl(auVar161,auVar161);
        in_ZMM18 = ZEXT1664(auVar161);
        auVar161 = vxorps_avx512vl(auVar164,auVar164);
        in_ZMM23 = ZEXT1664(auVar161);
        auVar161 = vxorps_avx512vl(auVar162,auVar162);
        in_ZMM19 = ZEXT1664(auVar161);
        auVar161 = vxorps_avx512vl(auVar163,auVar163);
        in_ZMM20 = ZEXT1664(auVar161);
        auVar159 = vxorps_avx512vl(auVar159,auVar159);
        in_ZMM16 = ZEXT1664(auVar159);
        auVar159 = vxorps_avx512vl(auVar160,auVar160);
        in_ZMM17 = ZEXT1664(auVar159);
        auVar287 = ZEXT864(0);
        uVar131 = 0;
      }
      else {
        auVar287 = ZEXT864(0);
        iVar144 = 7;
        auVar160 = vxorps_avx512vl(auVar160,auVar160);
        in_ZMM17 = ZEXT1664(auVar160);
        auVar159 = vxorps_avx512vl(auVar159,auVar159);
        in_ZMM16 = ZEXT1664(auVar159);
        auVar159 = vxorps_avx512vl(auVar163,auVar163);
        in_ZMM20 = ZEXT1664(auVar159);
        auVar159 = vxorps_avx512vl(auVar162,auVar162);
        in_ZMM19 = ZEXT1664(auVar159);
        auVar159 = vxorps_avx512vl(auVar164,auVar164);
        in_ZMM23 = ZEXT1664(auVar159);
        auVar159 = vxorps_avx512vl(auVar161,auVar161);
        in_ZMM18 = ZEXT1664(auVar159);
        do {
          auVar203 = vlddqu_avx(*pauVar139);
          auVar204 = vlddqu_avx(pauVar139[1]);
          auVar200 = vcvtph2ps_avx512vl(auVar203._0_16_);
          auVar203 = vcvtph2ps_f16c(auVar203._16_16_);
          auVar201 = vcvtph2ps_avx512vl(auVar204._0_16_);
          auVar204 = vcvtph2ps_f16c(auVar204._16_16_);
          uVar1 = *(undefined4 *)*pauVar143;
          auVar202._4_4_ = uVar1;
          auVar202._0_4_ = uVar1;
          auVar202._8_4_ = uVar1;
          auVar202._12_4_ = uVar1;
          auVar202._16_4_ = uVar1;
          auVar202._20_4_ = uVar1;
          auVar202._24_4_ = uVar1;
          auVar202._28_4_ = uVar1;
          auVar202 = vfmadd231ps_avx512vl(auVar298._0_32_,auVar200,auVar202);
          auVar298 = ZEXT3264(auVar202);
          uVar1 = *(undefined4 *)(*pauVar143 + 4);
          auVar200._4_4_ = uVar1;
          auVar200._0_4_ = uVar1;
          auVar200._8_4_ = uVar1;
          auVar200._12_4_ = uVar1;
          auVar200._16_4_ = uVar1;
          auVar200._20_4_ = uVar1;
          auVar200._24_4_ = uVar1;
          auVar200._28_4_ = uVar1;
          auVar203 = vfmadd231ps_avx512vl(auVar287._0_32_,auVar203,auVar200);
          auVar287 = ZEXT3264(auVar203);
          uVar1 = *(undefined4 *)(*pauVar143 + 8);
          auVar203._4_4_ = uVar1;
          auVar203._0_4_ = uVar1;
          auVar203._8_4_ = uVar1;
          auVar203._12_4_ = uVar1;
          auVar203._16_4_ = uVar1;
          auVar203._20_4_ = uVar1;
          auVar203._24_4_ = uVar1;
          auVar203._28_4_ = uVar1;
          auVar203 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar201,auVar203);
          in_ZMM17 = ZEXT3264(auVar203);
          uVar1 = *(undefined4 *)(*pauVar143 + 0xc);
          auVar201._4_4_ = uVar1;
          auVar201._0_4_ = uVar1;
          auVar201._8_4_ = uVar1;
          auVar201._12_4_ = uVar1;
          auVar201._16_4_ = uVar1;
          auVar201._20_4_ = uVar1;
          auVar201._24_4_ = uVar1;
          auVar201._28_4_ = uVar1;
          auVar203 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar204,auVar201);
          in_ZMM16 = ZEXT3264(auVar203);
          auVar203 = vlddqu_avx(pauVar139[2]);
          auVar204 = vlddqu_avx(pauVar139[3]);
          auVar202 = vcvtph2ps_avx512vl(auVar203._0_16_);
          auVar203 = vcvtph2ps_f16c(auVar203._16_16_);
          auVar200 = vcvtph2ps_avx512vl(auVar204._0_16_);
          auVar204 = vcvtph2ps_f16c(auVar204._16_16_);
          uVar1 = *(undefined4 *)(*pauVar143 + 0x10);
          auVar57._4_4_ = uVar1;
          auVar57._0_4_ = uVar1;
          auVar57._8_4_ = uVar1;
          auVar57._12_4_ = uVar1;
          auVar57._16_4_ = uVar1;
          auVar57._20_4_ = uVar1;
          auVar57._24_4_ = uVar1;
          auVar57._28_4_ = uVar1;
          auVar202 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar202,auVar57);
          in_ZMM20 = ZEXT3264(auVar202);
          uVar1 = *(undefined4 *)(*pauVar143 + 0x14);
          auVar58._4_4_ = uVar1;
          auVar58._0_4_ = uVar1;
          auVar58._8_4_ = uVar1;
          auVar58._12_4_ = uVar1;
          auVar58._16_4_ = uVar1;
          auVar58._20_4_ = uVar1;
          auVar58._24_4_ = uVar1;
          auVar58._28_4_ = uVar1;
          auVar203 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar203,auVar58);
          in_ZMM19 = ZEXT3264(auVar203);
          uVar1 = *(undefined4 *)(*pauVar143 + 0x18);
          auVar59._4_4_ = uVar1;
          auVar59._0_4_ = uVar1;
          auVar59._8_4_ = uVar1;
          auVar59._12_4_ = uVar1;
          auVar59._16_4_ = uVar1;
          auVar59._20_4_ = uVar1;
          auVar59._24_4_ = uVar1;
          auVar59._28_4_ = uVar1;
          auVar203 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar200,auVar59);
          in_ZMM23 = ZEXT3264(auVar203);
          uVar1 = *(undefined4 *)(*pauVar143 + 0x1c);
          auVar60._4_4_ = uVar1;
          auVar60._0_4_ = uVar1;
          auVar60._8_4_ = uVar1;
          auVar60._12_4_ = uVar1;
          auVar60._16_4_ = uVar1;
          auVar60._20_4_ = uVar1;
          auVar60._24_4_ = uVar1;
          auVar60._28_4_ = uVar1;
          auVar203 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar204,auVar60);
          in_ZMM18 = ZEXT3264(auVar203);
          pauVar143 = pauVar143 + 1;
          pauVar139 = pauVar139 + 4;
          iVar144 = iVar144 + 8;
          uVar131 = uVar132 & 0xfffffff8;
        } while (iVar144 < (int)uVar132);
      }
      auVar203 = auVar287._0_32_;
      uVar147 = uVar131 | 3;
      while( true ) {
        auVar204 = auVar298._0_32_;
        if ((int)uVar132 <= (int)uVar147) break;
        auVar203 = vlddqu_avx(*pauVar139);
        auVar202 = vlddqu_avx(pauVar139[1]);
        auVar200 = vcvtph2ps_avx512vl(auVar203._0_16_);
        auVar203 = vcvtph2ps_f16c(auVar203._16_16_);
        auVar201 = vcvtph2ps_avx512vl(auVar202._0_16_);
        uVar1 = *(undefined4 *)*pauVar143;
        auVar61._4_4_ = uVar1;
        auVar61._0_4_ = uVar1;
        auVar61._8_4_ = uVar1;
        auVar61._12_4_ = uVar1;
        auVar61._16_4_ = uVar1;
        auVar61._20_4_ = uVar1;
        auVar61._24_4_ = uVar1;
        auVar61._28_4_ = uVar1;
        auVar204 = vfmadd231ps_avx512vl(auVar204,auVar200,auVar61);
        auVar298 = ZEXT3264(auVar204);
        uVar1 = *(undefined4 *)(*pauVar143 + 4);
        auVar62._4_4_ = uVar1;
        auVar62._0_4_ = uVar1;
        auVar62._8_4_ = uVar1;
        auVar62._12_4_ = uVar1;
        auVar62._16_4_ = uVar1;
        auVar62._20_4_ = uVar1;
        auVar62._24_4_ = uVar1;
        auVar62._28_4_ = uVar1;
        auVar203 = vfmadd231ps_avx512vl(auVar287._0_32_,auVar203,auVar62);
        auVar287 = ZEXT3264(auVar203);
        uVar1 = *(undefined4 *)(*pauVar143 + 8);
        auVar63._4_4_ = uVar1;
        auVar63._0_4_ = uVar1;
        auVar63._8_4_ = uVar1;
        auVar63._12_4_ = uVar1;
        auVar63._16_4_ = uVar1;
        auVar63._20_4_ = uVar1;
        auVar63._24_4_ = uVar1;
        auVar63._28_4_ = uVar1;
        auVar204 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar201,auVar63);
        in_ZMM17 = ZEXT3264(auVar204);
        auVar204 = vcvtph2ps_f16c(auVar202._16_16_);
        uVar1 = *(undefined4 *)(*pauVar143 + 0xc);
        auVar64._4_4_ = uVar1;
        auVar64._0_4_ = uVar1;
        auVar64._8_4_ = uVar1;
        auVar64._12_4_ = uVar1;
        auVar64._16_4_ = uVar1;
        auVar64._20_4_ = uVar1;
        auVar64._24_4_ = uVar1;
        auVar64._28_4_ = uVar1;
        auVar204 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar204,auVar64);
        in_ZMM16 = ZEXT3264(auVar204);
        pauVar143 = (undefined1 (*) [32])(*pauVar143 + 0x10);
        pauVar139 = pauVar139 + 2;
        uVar147 = uVar131 + 7;
        uVar131 = uVar131 + 4;
      }
      if (uVar132 - uVar131 != 0 && (int)uVar131 <= (int)uVar132) {
        lVar145 = 0;
        do {
          auVar159 = vlddqu_avx(*(undefined1 (*) [16])*pauVar139);
          auVar204 = vcvtph2ps_f16c(auVar159);
          uVar1 = *(undefined4 *)(*pauVar143 + lVar145 * 4);
          auVar65._4_4_ = uVar1;
          auVar65._0_4_ = uVar1;
          auVar65._8_4_ = uVar1;
          auVar65._12_4_ = uVar1;
          auVar65._16_4_ = uVar1;
          auVar65._20_4_ = uVar1;
          auVar65._24_4_ = uVar1;
          auVar65._28_4_ = uVar1;
          auVar204 = vfmadd231ps_avx512vl(auVar298._0_32_,auVar204,auVar65);
          auVar298 = ZEXT3264(auVar204);
          pauVar139 = (undefined1 (*) [32])(*pauVar139 + 0x10);
          lVar145 = lVar145 + 1;
        } while (uVar132 - uVar131 != (int)lVar145);
      }
      auVar202 = vaddps_avx512vl(in_ZMM23._0_32_,in_ZMM18._0_32_);
      auVar200 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
      auVar201 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM17._0_32_);
      auVar210._0_4_ =
           auVar202._0_4_ + auVar200._0_4_ + auVar203._0_4_ + auVar201._0_4_ + auVar204._0_4_;
      auVar210._4_4_ =
           auVar202._4_4_ + auVar200._4_4_ + auVar203._4_4_ + auVar201._4_4_ + auVar204._4_4_;
      auVar210._8_4_ =
           auVar202._8_4_ + auVar200._8_4_ + auVar203._8_4_ + auVar201._8_4_ + auVar204._8_4_;
      auVar210._12_4_ =
           auVar202._12_4_ + auVar200._12_4_ + auVar203._12_4_ + auVar201._12_4_ + auVar204._12_4_;
      auVar210._16_4_ =
           auVar202._16_4_ + auVar200._16_4_ + auVar203._16_4_ + auVar201._16_4_ + auVar204._16_4_;
      auVar210._20_4_ =
           auVar202._20_4_ + auVar200._20_4_ + auVar203._20_4_ + auVar201._20_4_ + auVar204._20_4_;
      auVar210._24_4_ =
           auVar202._24_4_ + auVar200._24_4_ + auVar203._24_4_ + auVar201._24_4_ + auVar204._24_4_;
      auVar210._28_4_ =
           auVar202._28_4_ + auVar200._28_4_ + auVar203._28_4_ + auVar201._28_4_ + auVar204._28_4_;
      if (5 < iVar5 - 1U) goto LAB_002bd83a;
      auVar203 = ZEXT1632(ZEXT816(0));
      switch(iVar5) {
      case 1:
        auVar210 = vmaxps_avx(auVar210,ZEXT1632(ZEXT816(0)));
        break;
      case 2:
        auVar204 = vmaxps_avx(auVar210,auVar203);
        auVar203 = vminps_avx(auVar210,auVar203);
        uVar1 = *(this->super_InnerProduct).activation_params.data;
        auVar103._4_4_ = uVar1;
        auVar103._0_4_ = uVar1;
        auVar103._8_4_ = uVar1;
        auVar103._12_4_ = uVar1;
        auVar103._16_4_ = uVar1;
        auVar103._20_4_ = uVar1;
        auVar103._24_4_ = uVar1;
        auVar103._28_4_ = uVar1;
        auVar210 = vfmadd132ps_avx512vl(auVar203,auVar204,auVar103);
        break;
      case 3:
        puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar1 = *puVar8;
        auVar101._4_4_ = uVar1;
        auVar101._0_4_ = uVar1;
        auVar101._8_4_ = uVar1;
        auVar101._12_4_ = uVar1;
        auVar101._16_4_ = uVar1;
        auVar101._20_4_ = uVar1;
        auVar101._24_4_ = uVar1;
        auVar101._28_4_ = uVar1;
        auVar203 = vmaxps_avx512vl(auVar210,auVar101);
        uVar1 = puVar8[1];
        auVar102._4_4_ = uVar1;
        auVar102._0_4_ = uVar1;
        auVar102._8_4_ = uVar1;
        auVar102._12_4_ = uVar1;
        auVar102._16_4_ = uVar1;
        auVar102._20_4_ = uVar1;
        auVar102._24_4_ = uVar1;
        auVar102._28_4_ = uVar1;
        auVar210 = vminps_avx512vl(auVar203,auVar102);
        break;
      case 4:
        auVar99._8_4_ = 0x80000000;
        auVar99._0_8_ = 0x8000000080000000;
        auVar99._12_4_ = 0x80000000;
        auVar99._16_4_ = 0x80000000;
        auVar99._20_4_ = 0x80000000;
        auVar99._24_4_ = 0x80000000;
        auVar99._28_4_ = 0x80000000;
        auVar203 = vxorps_avx512vl(auVar210,auVar99);
        auVar203 = vminps_avx512vl(auVar203,auVar191);
        auVar204 = vmaxps_avx512vl(auVar203,auVar192);
        auVar159 = vfmadd231ps_fma(auVar247,auVar204,auVar282);
        auVar203 = vroundps_avx(ZEXT1632(auVar159),1);
        uVar15 = vcmpps_avx512vl(ZEXT1632(auVar159),auVar203,1);
        auVar202 = vsubps_avx512vl(auVar203,auVar286);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar211._0_4_ = (float)((uint)bVar13 * auVar202._0_4_ | (uint)!bVar13 * auVar203._0_4_);
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar211._4_4_ = (float)((uint)bVar13 * auVar202._4_4_ | (uint)!bVar13 * auVar203._4_4_);
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar211._8_4_ = (float)((uint)bVar13 * auVar202._8_4_ | (uint)!bVar13 * auVar203._8_4_);
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar211._12_4_ = (float)((uint)bVar13 * auVar202._12_4_ | (uint)!bVar13 * auVar203._12_4_);
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar211._16_4_ = (float)((uint)bVar13 * auVar202._16_4_ | (uint)!bVar13 * auVar203._16_4_);
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar211._20_4_ = (float)((uint)bVar13 * auVar202._20_4_ | (uint)!bVar13 * auVar203._20_4_);
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar211._24_4_ = (float)((uint)bVar13 * auVar202._24_4_ | (uint)!bVar13 * auVar203._24_4_);
        bVar13 = SUB81(uVar15 >> 7,0);
        auVar211._28_4_ = (float)((uint)bVar13 * auVar202._28_4_ | (uint)!bVar13 * auVar203._28_4_);
        auVar159 = vfmsub231ps_fma(auVar204,auVar211,auVar292);
        auVar100._8_4_ = 0x395e8083;
        auVar100._0_8_ = 0x395e8083395e8083;
        auVar100._12_4_ = 0x395e8083;
        auVar100._16_4_ = 0x395e8083;
        auVar100._20_4_ = 0x395e8083;
        auVar100._24_4_ = 0x395e8083;
        auVar100._28_4_ = 0x395e8083;
        auVar203 = vfmsub231ps_avx512vl(ZEXT1632(auVar159),auVar211,auVar100);
        auVar250._0_4_ = auVar203._0_4_ * auVar203._0_4_;
        auVar250._4_4_ = auVar203._4_4_ * auVar203._4_4_;
        auVar250._8_4_ = auVar203._8_4_ * auVar203._8_4_;
        auVar250._12_4_ = auVar203._12_4_ * auVar203._12_4_;
        auVar250._16_4_ = auVar203._16_4_ * auVar203._16_4_;
        auVar250._20_4_ = auVar203._20_4_ * auVar203._20_4_;
        auVar250._24_4_ = auVar203._24_4_ * auVar203._24_4_;
        auVar250._28_4_ = 0;
        auVar159 = vfmadd213ps_fma(auVar303,auVar203,auVar308);
        auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar203,auVar313);
        auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar203,auVar318);
        auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar203,auVar324);
        auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar203,auVar247);
        auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar250,auVar203);
        auVar233._0_4_ = auVar159._0_4_ + 1.0;
        auVar233._4_4_ = auVar159._4_4_ + 1.0;
        auVar233._8_4_ = auVar159._8_4_ + 1.0;
        auVar233._12_4_ = auVar159._12_4_ + 1.0;
        auVar233._16_4_ = 0x3f800000;
        auVar233._20_4_ = 0x3f800000;
        auVar233._24_4_ = 0x3f800000;
        auVar233._28_4_ = 0x3f800000;
        auVar251._0_4_ = (int)auVar211._0_4_;
        auVar251._4_4_ = (int)auVar211._4_4_;
        auVar251._8_4_ = (int)auVar211._8_4_;
        auVar251._12_4_ = (int)auVar211._12_4_;
        auVar251._16_4_ = (int)auVar211._16_4_;
        auVar251._20_4_ = (int)auVar211._20_4_;
        auVar251._24_4_ = (int)auVar211._24_4_;
        auVar251._28_4_ = (int)auVar211._28_4_;
        auVar203 = vpslld_avx2(auVar251,0x17);
        auVar203 = vpaddd_avx2(auVar328,auVar203);
        auVar159 = vfmadd213ps_fma(auVar203,auVar233,auVar286);
        auVar210 = vdivps_avx(auVar286,ZEXT1632(auVar159));
        break;
      case 5:
        auVar204 = vminps_avx512vl(auVar210,auVar191);
        auVar202 = vmaxps_avx512vl(auVar204,auVar192);
        auVar159 = vfmadd213ps_fma(auVar282,auVar202,auVar247);
        auVar204 = vroundps_avx(ZEXT1632(auVar159),1);
        uVar15 = vcmpps_avx512vl(ZEXT1632(auVar159),auVar204,1);
        auVar200 = vsubps_avx512vl(auVar204,auVar286);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar205._0_4_ = (float)((uint)bVar13 * auVar200._0_4_ | (uint)!bVar13 * auVar204._0_4_);
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar205._4_4_ = (float)((uint)bVar13 * auVar200._4_4_ | (uint)!bVar13 * auVar204._4_4_);
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar205._8_4_ = (float)((uint)bVar13 * auVar200._8_4_ | (uint)!bVar13 * auVar204._8_4_);
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar205._12_4_ = (float)((uint)bVar13 * auVar200._12_4_ | (uint)!bVar13 * auVar204._12_4_);
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar205._16_4_ = (float)((uint)bVar13 * auVar200._16_4_ | (uint)!bVar13 * auVar204._16_4_);
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar205._20_4_ = (float)((uint)bVar13 * auVar200._20_4_ | (uint)!bVar13 * auVar204._20_4_);
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar205._24_4_ = (float)((uint)bVar13 * auVar200._24_4_ | (uint)!bVar13 * auVar204._24_4_);
        bVar13 = SUB81(uVar15 >> 7,0);
        auVar205._28_4_ = (float)((uint)bVar13 * auVar200._28_4_ | (uint)!bVar13 * auVar204._28_4_);
        auVar159 = vfmsub231ps_fma(auVar202,auVar205,auVar292);
        auVar159 = vfnmsub231ps_fma(ZEXT1632(auVar159),auVar205,auVar332);
        auVar202 = ZEXT1632(auVar159);
        auVar204 = vfmadd213ps_avx512vl(auVar303,auVar202,auVar308);
        auVar204 = vfmadd213ps_avx512vl(auVar204,auVar202,auVar313);
        auVar204 = vfmadd213ps_avx512vl(auVar204,auVar202,auVar318);
        auVar202 = ZEXT1632(auVar159);
        auVar204 = vfmadd213ps_avx512vl(auVar204,auVar202,auVar324);
        auVar204 = vfmadd213ps_avx512vl(auVar204,auVar202,auVar247);
        auVar204 = vfmadd213ps_avx512vl
                             (auVar204,ZEXT1632(CONCAT412(auVar159._12_4_ * auVar159._12_4_,
                                                          CONCAT48(auVar159._8_4_ * auVar159._8_4_,
                                                                   CONCAT44(auVar159._4_4_ *
                                                                            auVar159._4_4_,
                                                                            auVar159._0_4_ *
                                                                            auVar159._0_4_)))),
                              auVar202);
        auVar202 = vaddps_avx512vl(auVar204,auVar286);
        auVar267._0_4_ = (int)auVar205._0_4_;
        auVar267._4_4_ = (int)auVar205._4_4_;
        auVar267._8_4_ = (int)auVar205._8_4_;
        auVar267._12_4_ = (int)auVar205._12_4_;
        auVar267._16_4_ = (int)auVar205._16_4_;
        auVar267._20_4_ = (int)auVar205._20_4_;
        auVar267._24_4_ = (int)auVar205._24_4_;
        auVar267._28_4_ = (int)auVar205._28_4_;
        auVar204 = vpslld_avx2(auVar267,0x17);
        auVar204 = vpaddd_avx2(auVar328,auVar204);
        auVar159 = vfmadd213ps_fma(auVar204,auVar202,auVar286);
        uVar15 = vcmpps_avx512vl(ZEXT1632(auVar159),auVar203,2);
        auVar90._8_4_ = 0x800000;
        auVar90._0_8_ = 0x80000000800000;
        auVar90._12_4_ = 0x800000;
        auVar90._16_4_ = 0x800000;
        auVar90._20_4_ = 0x800000;
        auVar90._24_4_ = 0x800000;
        auVar90._28_4_ = 0x800000;
        auVar203 = vmaxps_avx512vl(ZEXT1632(auVar159),auVar90);
        auVar200 = vpsrld_avx2(auVar203,0x17);
        auVar297._8_4_ = 0x807fffff;
        auVar297._0_8_ = 0x807fffff807fffff;
        auVar297._12_4_ = 0x807fffff;
        auVar297._16_4_ = 0x807fffff;
        auVar297._20_4_ = 0x807fffff;
        auVar297._24_4_ = 0x807fffff;
        auVar297._28_4_ = 0x807fffff;
        auVar91._8_4_ = 0x3f000000;
        auVar91._0_8_ = 0x3f0000003f000000;
        auVar91._12_4_ = 0x3f000000;
        auVar91._16_4_ = 0x3f000000;
        auVar91._20_4_ = 0x3f000000;
        auVar91._24_4_ = 0x3f000000;
        auVar91._28_4_ = 0x3f000000;
        auVar203 = vpternlogd_avx512vl(auVar203,auVar297,auVar91,0xea);
        auVar92._8_4_ = 0x3f3504f3;
        auVar92._0_8_ = 0x3f3504f33f3504f3;
        auVar92._12_4_ = 0x3f3504f3;
        auVar92._16_4_ = 0x3f3504f3;
        auVar92._20_4_ = 0x3f3504f3;
        auVar92._24_4_ = 0x3f3504f3;
        auVar92._28_4_ = 0x3f3504f3;
        uVar16 = vcmpps_avx512vl(auVar203,auVar92,1);
        auVar204 = vaddps_avx512vl(auVar203,auVar186);
        auVar202 = vaddps_avx512vl(auVar204,auVar203);
        bVar13 = (bool)((byte)uVar16 & 1);
        auVar206._0_4_ = (float)((uint)bVar13 * auVar202._0_4_ | (uint)!bVar13 * auVar204._0_4_);
        bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar206._4_4_ = (float)((uint)bVar13 * auVar202._4_4_ | (uint)!bVar13 * auVar204._4_4_);
        bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar206._8_4_ = (float)((uint)bVar13 * auVar202._8_4_ | (uint)!bVar13 * auVar204._8_4_);
        bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar206._12_4_ = (float)((uint)bVar13 * auVar202._12_4_ | (uint)!bVar13 * auVar204._12_4_);
        bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar206._16_4_ = (float)((uint)bVar13 * auVar202._16_4_ | (uint)!bVar13 * auVar204._16_4_);
        bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar206._20_4_ = (float)((uint)bVar13 * auVar202._20_4_ | (uint)!bVar13 * auVar204._20_4_);
        bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar206._24_4_ = (float)((uint)bVar13 * auVar202._24_4_ | (uint)!bVar13 * auVar204._24_4_);
        bVar13 = SUB81(uVar16 >> 7,0);
        auVar206._28_4_ = (uint)bVar13 * auVar202._28_4_ | (uint)!bVar13 * auVar204._28_4_;
        auVar117._4_4_ = auVar206._4_4_ * auVar206._4_4_;
        auVar117._0_4_ = auVar206._0_4_ * auVar206._0_4_;
        auVar117._8_4_ = auVar206._8_4_ * auVar206._8_4_;
        auVar117._12_4_ = auVar206._12_4_ * auVar206._12_4_;
        auVar117._16_4_ = auVar206._16_4_ * auVar206._16_4_;
        auVar117._20_4_ = auVar206._20_4_ * auVar206._20_4_;
        auVar117._24_4_ = auVar206._24_4_ * auVar206._24_4_;
        auVar117._28_4_ = auVar203._28_4_;
        auVar93._8_4_ = 0xbdebd1b8;
        auVar93._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar93._12_4_ = 0xbdebd1b8;
        auVar93._16_4_ = 0xbdebd1b8;
        auVar93._20_4_ = 0xbdebd1b8;
        auVar93._24_4_ = 0xbdebd1b8;
        auVar93._28_4_ = 0xbdebd1b8;
        auVar203 = vfmadd213ps_avx512vl(auVar187,auVar206,auVar93);
        auVar94._8_4_ = 0x3def251a;
        auVar94._0_8_ = 0x3def251a3def251a;
        auVar94._12_4_ = 0x3def251a;
        auVar94._16_4_ = 0x3def251a;
        auVar94._20_4_ = 0x3def251a;
        auVar94._24_4_ = 0x3def251a;
        auVar94._28_4_ = 0x3def251a;
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar206,auVar94);
        auVar95._8_4_ = 0xbdfe5d4f;
        auVar95._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar95._12_4_ = 0xbdfe5d4f;
        auVar95._16_4_ = 0xbdfe5d4f;
        auVar95._20_4_ = 0xbdfe5d4f;
        auVar95._24_4_ = 0xbdfe5d4f;
        auVar95._28_4_ = 0xbdfe5d4f;
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar206,auVar95);
        auVar96._8_4_ = 0x3e11e9bf;
        auVar96._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar96._12_4_ = 0x3e11e9bf;
        auVar96._16_4_ = 0x3e11e9bf;
        auVar96._20_4_ = 0x3e11e9bf;
        auVar96._24_4_ = 0x3e11e9bf;
        auVar96._28_4_ = 0x3e11e9bf;
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar206,auVar96);
        auVar97._8_4_ = 0xbe2aae50;
        auVar97._0_8_ = 0xbe2aae50be2aae50;
        auVar97._12_4_ = 0xbe2aae50;
        auVar97._16_4_ = 0xbe2aae50;
        auVar97._20_4_ = 0xbe2aae50;
        auVar97._24_4_ = 0xbe2aae50;
        auVar97._28_4_ = 0xbe2aae50;
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar206,auVar97);
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar206,auVar188);
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar206,auVar189);
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar206,auVar190);
        auVar204 = vmulps_avx512vl(auVar117,auVar206);
        in_ZMM17 = ZEXT3264(auVar204);
        auVar204 = vmulps_avx512vl(auVar204,auVar203);
        auVar98._8_4_ = 0xffffff82;
        auVar98._0_8_ = 0xffffff82ffffff82;
        auVar98._12_4_ = 0xffffff82;
        auVar98._16_4_ = 0xffffff82;
        auVar98._20_4_ = 0xffffff82;
        auVar98._24_4_ = 0xffffff82;
        auVar98._28_4_ = 0xffffff82;
        auVar203 = vpaddd_avx512vl(auVar200,auVar98);
        auVar203 = vcvtdq2ps_avx(auVar203);
        auVar202 = vsubps_avx512vl(auVar203,auVar286);
        bVar13 = (bool)((byte)uVar16 & 1);
        auVar207._0_4_ = (uint)bVar13 * auVar202._0_4_ | (uint)!bVar13 * auVar203._0_4_;
        bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar207._4_4_ = (uint)bVar13 * auVar202._4_4_ | (uint)!bVar13 * auVar203._4_4_;
        bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar207._8_4_ = (uint)bVar13 * auVar202._8_4_ | (uint)!bVar13 * auVar203._8_4_;
        bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar207._12_4_ = (uint)bVar13 * auVar202._12_4_ | (uint)!bVar13 * auVar203._12_4_;
        bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar207._16_4_ = (uint)bVar13 * auVar202._16_4_ | (uint)!bVar13 * auVar203._16_4_;
        bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar207._20_4_ = (uint)bVar13 * auVar202._20_4_ | (uint)!bVar13 * auVar203._20_4_;
        bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar207._24_4_ = (uint)bVar13 * auVar202._24_4_ | (uint)!bVar13 * auVar203._24_4_;
        bVar13 = SUB81(uVar16 >> 7,0);
        auVar207._28_4_ = (uint)bVar13 * auVar202._28_4_ | (uint)!bVar13 * auVar203._28_4_;
        auVar203 = vfmadd231ps_avx512vl(auVar204,auVar207,auVar332);
        auVar203 = vfmsub231ps_avx512vl(auVar203,auVar247,auVar117);
        auVar203 = vsubps_avx512vl(auVar203,auVar206);
        auVar159 = vfmsub231ps_fma(auVar203,auVar292,auVar207);
        auVar203 = vmulps_avx512vl(ZEXT1632(auVar159),auVar199);
        auVar204 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar208._0_4_ = (uint)bVar13 * auVar204._0_4_ | (uint)!bVar13 * auVar203._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar208._4_4_ = (uint)bVar13 * auVar204._4_4_ | (uint)!bVar13 * auVar203._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar208._8_4_ = (uint)bVar13 * auVar204._8_4_ | (uint)!bVar13 * auVar203._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar208._12_4_ = (uint)bVar13 * auVar204._12_4_ | (uint)!bVar13 * auVar203._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar208._16_4_ = (uint)bVar13 * auVar204._16_4_ | (uint)!bVar13 * auVar203._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar208._20_4_ = (uint)bVar13 * auVar204._20_4_ | (uint)!bVar13 * auVar203._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar208._24_4_ = (uint)bVar13 * auVar204._24_4_ | (uint)!bVar13 * auVar203._24_4_;
        bVar13 = SUB81(uVar15 >> 7,0);
        auVar208._28_4_ = (uint)bVar13 * auVar204._28_4_ | (uint)!bVar13 * auVar203._28_4_;
        auVar203 = vminps_avx512vl(auVar208,auVar191);
        auVar204 = vmaxps_avx512vl(auVar203,auVar192);
        auVar159 = vfmadd213ps_fma(auVar282,auVar204,auVar247);
        auVar203 = vroundps_avx(ZEXT1632(auVar159),1);
        uVar15 = vcmpps_avx512vl(ZEXT1632(auVar159),auVar203,1);
        auVar202 = vsubps_avx512vl(auVar203,auVar286);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar209._0_4_ = (float)((uint)bVar13 * auVar202._0_4_ | (uint)!bVar13 * auVar203._0_4_);
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar209._4_4_ = (float)((uint)bVar13 * auVar202._4_4_ | (uint)!bVar13 * auVar203._4_4_);
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar209._8_4_ = (float)((uint)bVar13 * auVar202._8_4_ | (uint)!bVar13 * auVar203._8_4_);
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar209._12_4_ = (float)((uint)bVar13 * auVar202._12_4_ | (uint)!bVar13 * auVar203._12_4_);
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar209._16_4_ = (float)((uint)bVar13 * auVar202._16_4_ | (uint)!bVar13 * auVar203._16_4_);
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar209._20_4_ = (float)((uint)bVar13 * auVar202._20_4_ | (uint)!bVar13 * auVar203._20_4_);
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar209._24_4_ = (float)((uint)bVar13 * auVar202._24_4_ | (uint)!bVar13 * auVar203._24_4_);
        bVar13 = SUB81(uVar15 >> 7,0);
        auVar209._28_4_ = (float)((uint)bVar13 * auVar202._28_4_ | (uint)!bVar13 * auVar203._28_4_);
        auVar159 = vfmsub231ps_fma(auVar204,auVar209,auVar292);
        auVar159 = vfnmsub231ps_fma(ZEXT1632(auVar159),auVar209,auVar332);
        auVar204 = ZEXT1632(auVar159);
        auVar203 = vfmadd213ps_avx512vl(auVar303,auVar204,auVar308);
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar204,auVar313);
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar204,auVar318);
        auVar204 = ZEXT1632(auVar159);
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar204,auVar324);
        auVar203 = vfmadd213ps_avx512vl(auVar203,auVar204,auVar247);
        auVar203 = vfmadd213ps_avx512vl
                             (auVar203,ZEXT1632(CONCAT412(auVar159._12_4_ * auVar159._12_4_,
                                                          CONCAT48(auVar159._8_4_ * auVar159._8_4_,
                                                                   CONCAT44(auVar159._4_4_ *
                                                                            auVar159._4_4_,
                                                                            auVar159._0_4_ *
                                                                            auVar159._0_4_)))),
                              auVar204);
        in_ZMM16 = ZEXT3264(auVar203);
        auVar204 = vaddps_avx512vl(auVar203,auVar286);
        auVar268._0_4_ = (int)auVar209._0_4_;
        auVar268._4_4_ = (int)auVar209._4_4_;
        auVar268._8_4_ = (int)auVar209._8_4_;
        auVar268._12_4_ = (int)auVar209._12_4_;
        auVar268._16_4_ = (int)auVar209._16_4_;
        auVar268._20_4_ = (int)auVar209._20_4_;
        auVar268._24_4_ = (int)auVar209._24_4_;
        auVar268._28_4_ = (int)auVar209._28_4_;
        auVar203 = vpslld_avx2(auVar268,0x17);
        auVar203 = vpaddd_avx2(auVar328,auVar203);
        auVar159 = vfmadd213ps_fma(auVar203,auVar204,auVar286);
        auVar203 = vdivps_avx(auVar286,ZEXT1632(auVar159));
        auVar203 = vfnmadd213ps_avx512vl(auVar203,auVar199,auVar186);
        auVar185 = auVar203._0_28_;
        goto LAB_002bd836;
      case 6:
        puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar1 = *puVar8;
        auVar252._4_4_ = uVar1;
        auVar252._0_4_ = uVar1;
        auVar252._8_4_ = uVar1;
        auVar252._12_4_ = uVar1;
        auVar252._16_4_ = uVar1;
        auVar252._20_4_ = uVar1;
        auVar252._24_4_ = uVar1;
        auVar252._28_4_ = uVar1;
        uVar1 = puVar8[1];
        auVar204._4_4_ = uVar1;
        auVar204._0_4_ = uVar1;
        auVar204._8_4_ = uVar1;
        auVar204._12_4_ = uVar1;
        auVar204._16_4_ = uVar1;
        auVar204._20_4_ = uVar1;
        auVar204._24_4_ = uVar1;
        auVar204._28_4_ = uVar1;
        auVar204 = vfmadd213ps_avx512vl(auVar252,auVar210,auVar204);
        auVar203 = vmaxps_avx(auVar204,auVar203);
        auVar203 = vminps_avx(auVar203,auVar286);
        auVar185 = auVar203._0_28_;
LAB_002bd836:
        auVar210._4_4_ = auVar185._4_4_ * auVar210._4_4_;
        auVar210._0_4_ = auVar185._0_4_ * auVar210._0_4_;
        auVar210._8_4_ = auVar185._8_4_ * auVar210._8_4_;
        auVar210._12_4_ = auVar185._12_4_ * auVar210._12_4_;
        auVar210._16_4_ = auVar185._16_4_ * auVar210._16_4_;
        auVar210._20_4_ = auVar185._20_4_ * auVar210._20_4_;
        auVar210._24_4_ = auVar185._24_4_ * auVar210._24_4_;
      }
LAB_002bd83a:
      *(undefined1 (*) [32])((long)top_blob->data + uVar134 * 0x20) = auVar210;
      uVar134 = uVar134 + 1;
    } while (uVar134 != uVar141);
  }
  else {
    if ((iVar133 != 0x10) || ((int)uVar131 < 1)) goto LAB_002be29b;
    auVar298 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar287 = vxorps_avx512dq(auVar298,(undefined1  [64])_ps512_cephes_log_q2);
    auVar293 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar298);
    auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    auVar304 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar298);
    uVar134 = 0;
    auVar159 = vxorps_avx512vl(auVar159,auVar159);
    auVar319 = ZEXT1664(auVar159);
    auVar309 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar314 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
    do {
      auVar159 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      auVar325 = ZEXT1664(auVar159);
      if (pvVar7 != (void *)0x0) {
        auVar325 = *(undefined1 (*) [64])((long)pvVar7 + uVar134 * 0x40);
      }
      pauVar139 = (undefined1 (*) [32])
                  ((long)(this->weight_data_tm).w * uVar134 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar160 = in_ZMM18._0_16_;
      auVar165 = in_ZMM23._0_16_;
      auVar163 = in_ZMM21._0_16_;
      auVar164 = in_ZMM22._0_16_;
      auVar161 = in_ZMM19._0_16_;
      auVar162 = in_ZMM20._0_16_;
      auVar159 = in_ZMM17._0_16_;
      pauVar143 = local_3a8;
      if ((int)uVar132 < 8) {
        auVar160 = vxorps_avx512vl(auVar160,auVar160);
        auVar334 = ZEXT1664(auVar160);
        auVar160 = vxorps_avx512vl(auVar165,auVar165);
        in_ZMM23 = ZEXT1664(auVar160);
        auVar160 = vxorps_avx512vl(auVar163,auVar163);
        in_ZMM21 = ZEXT1664(auVar160);
        auVar160 = vxorps_avx512vl(auVar164,auVar164);
        in_ZMM22 = ZEXT1664(auVar160);
        auVar160 = vxorps_avx512vl(auVar161,auVar161);
        in_ZMM19 = ZEXT1664(auVar160);
        auVar160 = vxorps_avx512vl(auVar162,auVar162);
        in_ZMM20 = ZEXT1664(auVar160);
        auVar159 = vxorps_avx512vl(auVar159,auVar159);
        auVar333 = ZEXT1664(auVar159);
        uVar131 = 0;
      }
      else {
        auVar159 = vxorps_avx512vl(auVar159,auVar159);
        auVar333 = ZEXT1664(auVar159);
        iVar144 = 7;
        auVar159 = vxorps_avx512vl(auVar162,auVar162);
        in_ZMM20 = ZEXT1664(auVar159);
        auVar159 = vxorps_avx512vl(auVar161,auVar161);
        in_ZMM19 = ZEXT1664(auVar159);
        auVar159 = vxorps_avx512vl(auVar164,auVar164);
        in_ZMM22 = ZEXT1664(auVar159);
        auVar159 = vxorps_avx512vl(auVar163,auVar163);
        in_ZMM21 = ZEXT1664(auVar159);
        auVar159 = vxorps_avx512vl(auVar165,auVar165);
        in_ZMM23 = ZEXT1664(auVar159);
        auVar159 = vxorps_avx512vl(auVar160,auVar160);
        auVar334 = ZEXT1664(auVar159);
        do {
          auVar212 = vcvtph2ps_avx512f(*pauVar139);
          auVar213 = vcvtph2ps_avx512f(pauVar139[1]);
          auVar214 = vcvtph2ps_avx512f(pauVar139[2]);
          auVar215 = vcvtph2ps_avx512f(pauVar139[3]);
          uVar1 = *(undefined4 *)*pauVar143;
          auVar216._4_4_ = uVar1;
          auVar216._0_4_ = uVar1;
          auVar216._8_4_ = uVar1;
          auVar216._12_4_ = uVar1;
          auVar216._16_4_ = uVar1;
          auVar216._20_4_ = uVar1;
          auVar216._24_4_ = uVar1;
          auVar216._28_4_ = uVar1;
          auVar216._32_4_ = uVar1;
          auVar216._36_4_ = uVar1;
          auVar216._40_4_ = uVar1;
          auVar216._44_4_ = uVar1;
          auVar216._48_4_ = uVar1;
          auVar216._52_4_ = uVar1;
          auVar216._56_4_ = uVar1;
          auVar216._60_4_ = uVar1;
          auVar325 = vfmadd231ps_avx512f(auVar325,auVar212,auVar216);
          uVar1 = *(undefined4 *)(*pauVar143 + 4);
          auVar212._4_4_ = uVar1;
          auVar212._0_4_ = uVar1;
          auVar212._8_4_ = uVar1;
          auVar212._12_4_ = uVar1;
          auVar212._16_4_ = uVar1;
          auVar212._20_4_ = uVar1;
          auVar212._24_4_ = uVar1;
          auVar212._28_4_ = uVar1;
          auVar212._32_4_ = uVar1;
          auVar212._36_4_ = uVar1;
          auVar212._40_4_ = uVar1;
          auVar212._44_4_ = uVar1;
          auVar212._48_4_ = uVar1;
          auVar212._52_4_ = uVar1;
          auVar212._56_4_ = uVar1;
          auVar212._60_4_ = uVar1;
          auVar333 = vfmadd231ps_avx512f(auVar333,auVar213,auVar212);
          uVar1 = *(undefined4 *)(*pauVar143 + 8);
          auVar213._4_4_ = uVar1;
          auVar213._0_4_ = uVar1;
          auVar213._8_4_ = uVar1;
          auVar213._12_4_ = uVar1;
          auVar213._16_4_ = uVar1;
          auVar213._20_4_ = uVar1;
          auVar213._24_4_ = uVar1;
          auVar213._28_4_ = uVar1;
          auVar213._32_4_ = uVar1;
          auVar213._36_4_ = uVar1;
          auVar213._40_4_ = uVar1;
          auVar213._44_4_ = uVar1;
          auVar213._48_4_ = uVar1;
          auVar213._52_4_ = uVar1;
          auVar213._56_4_ = uVar1;
          auVar213._60_4_ = uVar1;
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar214,auVar213);
          uVar1 = *(undefined4 *)(*pauVar143 + 0xc);
          auVar214._4_4_ = uVar1;
          auVar214._0_4_ = uVar1;
          auVar214._8_4_ = uVar1;
          auVar214._12_4_ = uVar1;
          auVar214._16_4_ = uVar1;
          auVar214._20_4_ = uVar1;
          auVar214._24_4_ = uVar1;
          auVar214._28_4_ = uVar1;
          auVar214._32_4_ = uVar1;
          auVar214._36_4_ = uVar1;
          auVar214._40_4_ = uVar1;
          auVar214._44_4_ = uVar1;
          auVar214._48_4_ = uVar1;
          auVar214._52_4_ = uVar1;
          auVar214._56_4_ = uVar1;
          auVar214._60_4_ = uVar1;
          in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar215,auVar214);
          auVar216 = vcvtph2ps_avx512f(pauVar139[4]);
          auVar212 = vcvtph2ps_avx512f(pauVar139[5]);
          auVar213 = vcvtph2ps_avx512f(pauVar139[6]);
          auVar214 = vcvtph2ps_avx512f(pauVar139[7]);
          uVar1 = *(undefined4 *)(*pauVar143 + 0x10);
          auVar215._4_4_ = uVar1;
          auVar215._0_4_ = uVar1;
          auVar215._8_4_ = uVar1;
          auVar215._12_4_ = uVar1;
          auVar215._16_4_ = uVar1;
          auVar215._20_4_ = uVar1;
          auVar215._24_4_ = uVar1;
          auVar215._28_4_ = uVar1;
          auVar215._32_4_ = uVar1;
          auVar215._36_4_ = uVar1;
          auVar215._40_4_ = uVar1;
          auVar215._44_4_ = uVar1;
          auVar215._48_4_ = uVar1;
          auVar215._52_4_ = uVar1;
          auVar215._56_4_ = uVar1;
          auVar215._60_4_ = uVar1;
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar216,auVar215);
          uVar1 = *(undefined4 *)(*pauVar143 + 0x14);
          auVar104._4_4_ = uVar1;
          auVar104._0_4_ = uVar1;
          auVar104._8_4_ = uVar1;
          auVar104._12_4_ = uVar1;
          auVar104._16_4_ = uVar1;
          auVar104._20_4_ = uVar1;
          auVar104._24_4_ = uVar1;
          auVar104._28_4_ = uVar1;
          auVar104._32_4_ = uVar1;
          auVar104._36_4_ = uVar1;
          auVar104._40_4_ = uVar1;
          auVar104._44_4_ = uVar1;
          auVar104._48_4_ = uVar1;
          auVar104._52_4_ = uVar1;
          auVar104._56_4_ = uVar1;
          auVar104._60_4_ = uVar1;
          in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar212,auVar104);
          uVar1 = *(undefined4 *)(*pauVar143 + 0x18);
          auVar105._4_4_ = uVar1;
          auVar105._0_4_ = uVar1;
          auVar105._8_4_ = uVar1;
          auVar105._12_4_ = uVar1;
          auVar105._16_4_ = uVar1;
          auVar105._20_4_ = uVar1;
          auVar105._24_4_ = uVar1;
          auVar105._28_4_ = uVar1;
          auVar105._32_4_ = uVar1;
          auVar105._36_4_ = uVar1;
          auVar105._40_4_ = uVar1;
          auVar105._44_4_ = uVar1;
          auVar105._48_4_ = uVar1;
          auVar105._52_4_ = uVar1;
          auVar105._56_4_ = uVar1;
          auVar105._60_4_ = uVar1;
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar213,auVar105);
          uVar1 = *(undefined4 *)(*pauVar143 + 0x1c);
          auVar106._4_4_ = uVar1;
          auVar106._0_4_ = uVar1;
          auVar106._8_4_ = uVar1;
          auVar106._12_4_ = uVar1;
          auVar106._16_4_ = uVar1;
          auVar106._20_4_ = uVar1;
          auVar106._24_4_ = uVar1;
          auVar106._28_4_ = uVar1;
          auVar106._32_4_ = uVar1;
          auVar106._36_4_ = uVar1;
          auVar106._40_4_ = uVar1;
          auVar106._44_4_ = uVar1;
          auVar106._48_4_ = uVar1;
          auVar106._52_4_ = uVar1;
          auVar106._56_4_ = uVar1;
          auVar106._60_4_ = uVar1;
          auVar334 = vfmadd231ps_avx512f(auVar334,auVar214,auVar106);
          pauVar143 = pauVar143 + 1;
          pauVar139 = pauVar139 + 8;
          iVar144 = iVar144 + 8;
          uVar131 = uVar132 & 0xfffffff8;
        } while (iVar144 < (int)uVar132);
      }
      uVar147 = uVar131 | 3;
      while ((int)uVar147 < (int)uVar132) {
        auVar216 = vcvtph2ps_avx512f(*pauVar139);
        auVar212 = vcvtph2ps_avx512f(pauVar139[1]);
        auVar213 = vcvtph2ps_avx512f(pauVar139[2]);
        auVar214 = vcvtph2ps_avx512f(pauVar139[3]);
        uVar1 = *(undefined4 *)*pauVar143;
        auVar107._4_4_ = uVar1;
        auVar107._0_4_ = uVar1;
        auVar107._8_4_ = uVar1;
        auVar107._12_4_ = uVar1;
        auVar107._16_4_ = uVar1;
        auVar107._20_4_ = uVar1;
        auVar107._24_4_ = uVar1;
        auVar107._28_4_ = uVar1;
        auVar107._32_4_ = uVar1;
        auVar107._36_4_ = uVar1;
        auVar107._40_4_ = uVar1;
        auVar107._44_4_ = uVar1;
        auVar107._48_4_ = uVar1;
        auVar107._52_4_ = uVar1;
        auVar107._56_4_ = uVar1;
        auVar107._60_4_ = uVar1;
        auVar325 = vfmadd231ps_avx512f(auVar325,auVar216,auVar107);
        uVar1 = *(undefined4 *)(*pauVar143 + 4);
        auVar108._4_4_ = uVar1;
        auVar108._0_4_ = uVar1;
        auVar108._8_4_ = uVar1;
        auVar108._12_4_ = uVar1;
        auVar108._16_4_ = uVar1;
        auVar108._20_4_ = uVar1;
        auVar108._24_4_ = uVar1;
        auVar108._28_4_ = uVar1;
        auVar108._32_4_ = uVar1;
        auVar108._36_4_ = uVar1;
        auVar108._40_4_ = uVar1;
        auVar108._44_4_ = uVar1;
        auVar108._48_4_ = uVar1;
        auVar108._52_4_ = uVar1;
        auVar108._56_4_ = uVar1;
        auVar108._60_4_ = uVar1;
        auVar333 = vfmadd231ps_avx512f(auVar333,auVar212,auVar108);
        uVar1 = *(undefined4 *)(*pauVar143 + 8);
        auVar109._4_4_ = uVar1;
        auVar109._0_4_ = uVar1;
        auVar109._8_4_ = uVar1;
        auVar109._12_4_ = uVar1;
        auVar109._16_4_ = uVar1;
        auVar109._20_4_ = uVar1;
        auVar109._24_4_ = uVar1;
        auVar109._28_4_ = uVar1;
        auVar109._32_4_ = uVar1;
        auVar109._36_4_ = uVar1;
        auVar109._40_4_ = uVar1;
        auVar109._44_4_ = uVar1;
        auVar109._48_4_ = uVar1;
        auVar109._52_4_ = uVar1;
        auVar109._56_4_ = uVar1;
        auVar109._60_4_ = uVar1;
        in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar213,auVar109);
        uVar1 = *(undefined4 *)(*pauVar143 + 0xc);
        auVar110._4_4_ = uVar1;
        auVar110._0_4_ = uVar1;
        auVar110._8_4_ = uVar1;
        auVar110._12_4_ = uVar1;
        auVar110._16_4_ = uVar1;
        auVar110._20_4_ = uVar1;
        auVar110._24_4_ = uVar1;
        auVar110._28_4_ = uVar1;
        auVar110._32_4_ = uVar1;
        auVar110._36_4_ = uVar1;
        auVar110._40_4_ = uVar1;
        auVar110._44_4_ = uVar1;
        auVar110._48_4_ = uVar1;
        auVar110._52_4_ = uVar1;
        auVar110._56_4_ = uVar1;
        auVar110._60_4_ = uVar1;
        in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar214,auVar110);
        pauVar143 = (undefined1 (*) [32])(*pauVar143 + 0x10);
        pauVar139 = pauVar139 + 4;
        uVar147 = uVar131 + 7;
        uVar131 = uVar131 + 4;
      }
      if (uVar132 - uVar131 != 0 && (int)uVar131 <= (int)uVar132) {
        lVar145 = 0;
        do {
          auVar191 = vlddqu_avx(*pauVar139);
          auVar216 = vcvtph2ps_avx512f(auVar191);
          uVar1 = *(undefined4 *)(*pauVar143 + lVar145 * 4);
          auVar111._4_4_ = uVar1;
          auVar111._0_4_ = uVar1;
          auVar111._8_4_ = uVar1;
          auVar111._12_4_ = uVar1;
          auVar111._16_4_ = uVar1;
          auVar111._20_4_ = uVar1;
          auVar111._24_4_ = uVar1;
          auVar111._28_4_ = uVar1;
          auVar111._32_4_ = uVar1;
          auVar111._36_4_ = uVar1;
          auVar111._40_4_ = uVar1;
          auVar111._44_4_ = uVar1;
          auVar111._48_4_ = uVar1;
          auVar111._52_4_ = uVar1;
          auVar111._56_4_ = uVar1;
          auVar111._60_4_ = uVar1;
          auVar325 = vfmadd231ps_avx512f(auVar325,auVar216,auVar111);
          pauVar139 = pauVar139 + 1;
          lVar145 = lVar145 + 1;
        } while (uVar132 - uVar131 != (int)lVar145);
      }
      auVar334 = vaddps_avx512f(in_ZMM23,auVar334);
      auVar216 = vaddps_avx512f(in_ZMM21,in_ZMM22);
      auVar334 = vaddps_avx512f(auVar334,auVar216);
      in_ZMM18 = vaddps_avx512f(in_ZMM19,in_ZMM20);
      in_ZMM17 = vaddps_avx512f(in_ZMM18,auVar333);
      auVar333 = vaddps_avx512f(auVar334,in_ZMM17);
      auVar325 = vaddps_avx512f(auVar333,auVar325);
      in_ZMM16 = auVar325;
      switch(iVar5) {
      case 1:
        in_ZMM16 = vmaxps_avx512f(auVar325,auVar319);
        break;
      case 2:
        uVar15 = vcmpps_avx512f(auVar325,auVar319,1);
        uVar1 = *(this->super_InnerProduct).activation_params.data;
        auVar113._4_4_ = uVar1;
        auVar113._0_4_ = uVar1;
        auVar113._8_4_ = uVar1;
        auVar113._12_4_ = uVar1;
        auVar113._16_4_ = uVar1;
        auVar113._20_4_ = uVar1;
        auVar113._24_4_ = uVar1;
        auVar113._28_4_ = uVar1;
        auVar113._32_4_ = uVar1;
        auVar113._36_4_ = uVar1;
        auVar113._40_4_ = uVar1;
        auVar113._44_4_ = uVar1;
        auVar113._48_4_ = uVar1;
        auVar113._52_4_ = uVar1;
        auVar113._56_4_ = uVar1;
        auVar113._60_4_ = uVar1;
        auVar333 = vmulps_avx512f(auVar325,auVar113);
        bVar13 = (bool)((byte)uVar15 & 1);
        in_ZMM16._0_4_ = (uint)bVar13 * auVar333._0_4_ | (uint)!bVar13 * auVar325._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        in_ZMM16._4_4_ = (uint)bVar13 * auVar333._4_4_ | (uint)!bVar13 * auVar325._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        in_ZMM16._8_4_ = (uint)bVar13 * auVar333._8_4_ | (uint)!bVar13 * auVar325._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        in_ZMM16._12_4_ = (uint)bVar13 * auVar333._12_4_ | (uint)!bVar13 * auVar325._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        in_ZMM16._16_4_ = (uint)bVar13 * auVar333._16_4_ | (uint)!bVar13 * auVar325._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        in_ZMM16._20_4_ = (uint)bVar13 * auVar333._20_4_ | (uint)!bVar13 * auVar325._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        in_ZMM16._24_4_ = (uint)bVar13 * auVar333._24_4_ | (uint)!bVar13 * auVar325._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        in_ZMM16._28_4_ = (uint)bVar13 * auVar333._28_4_ | (uint)!bVar13 * auVar325._28_4_;
        bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
        in_ZMM16._32_4_ = (uint)bVar13 * auVar333._32_4_ | (uint)!bVar13 * auVar325._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        in_ZMM16._36_4_ = (uint)bVar13 * auVar333._36_4_ | (uint)!bVar13 * auVar325._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        in_ZMM16._40_4_ = (uint)bVar13 * auVar333._40_4_ | (uint)!bVar13 * auVar325._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        in_ZMM16._44_4_ = (uint)bVar13 * auVar333._44_4_ | (uint)!bVar13 * auVar325._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        in_ZMM16._48_4_ = (uint)bVar13 * auVar333._48_4_ | (uint)!bVar13 * auVar325._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        in_ZMM16._52_4_ = (uint)bVar13 * auVar333._52_4_ | (uint)!bVar13 * auVar325._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        in_ZMM16._56_4_ = (uint)bVar13 * auVar333._56_4_ | (uint)!bVar13 * auVar325._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        in_ZMM16._60_4_ = (uint)bVar13 * auVar333._60_4_ | (uint)!bVar13 * auVar325._60_4_;
        break;
      case 3:
        puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar1 = *puVar8;
        auVar112._4_4_ = uVar1;
        auVar112._0_4_ = uVar1;
        auVar112._8_4_ = uVar1;
        auVar112._12_4_ = uVar1;
        auVar112._16_4_ = uVar1;
        auVar112._20_4_ = uVar1;
        auVar112._24_4_ = uVar1;
        auVar112._28_4_ = uVar1;
        auVar112._32_4_ = uVar1;
        auVar112._36_4_ = uVar1;
        auVar112._40_4_ = uVar1;
        auVar112._44_4_ = uVar1;
        auVar112._48_4_ = uVar1;
        auVar112._52_4_ = uVar1;
        auVar112._56_4_ = uVar1;
        auVar112._60_4_ = uVar1;
        auVar333 = vmaxps_avx512f(auVar325,auVar112);
        uVar1 = puVar8[1];
        auVar325._4_4_ = uVar1;
        auVar325._0_4_ = uVar1;
        auVar325._8_4_ = uVar1;
        auVar325._12_4_ = uVar1;
        auVar325._16_4_ = uVar1;
        auVar325._20_4_ = uVar1;
        auVar325._24_4_ = uVar1;
        auVar325._28_4_ = uVar1;
        auVar325._32_4_ = uVar1;
        auVar325._36_4_ = uVar1;
        auVar325._40_4_ = uVar1;
        auVar325._44_4_ = uVar1;
        auVar325._48_4_ = uVar1;
        auVar325._52_4_ = uVar1;
        auVar325._56_4_ = uVar1;
        auVar325._60_4_ = uVar1;
        in_ZMM16 = vminps_avx512f(auVar333,auVar325);
        break;
      case 4:
        auVar325 = vxorps_avx512dq(auVar325,auVar298);
        auVar325 = vminps_avx512f(auVar325,(undefined1  [64])afVar119);
        auVar325 = vmaxps_avx512f(auVar325,(undefined1  [64])afVar120);
        auVar333 = vfmadd213ps_avx512f((undefined1  [64])afVar121,auVar325,
                                       (undefined1  [64])afVar127);
        auVar334 = vrndscaleps_avx512f(auVar333,1);
        uVar15 = vcmpps_avx512f(auVar333,auVar334,1);
        auVar333 = vsubps_avx512f(auVar334,(undefined1  [64])afVar118);
        bVar13 = (bool)((byte)uVar15 & 1);
        in_ZMM17._0_4_ = (uint)bVar13 * auVar333._0_4_ | (uint)!bVar13 * auVar334._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        in_ZMM17._4_4_ = (uint)bVar13 * auVar333._4_4_ | (uint)!bVar13 * auVar334._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        in_ZMM17._8_4_ = (uint)bVar13 * auVar333._8_4_ | (uint)!bVar13 * auVar334._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        in_ZMM17._12_4_ = (uint)bVar13 * auVar333._12_4_ | (uint)!bVar13 * auVar334._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        in_ZMM17._16_4_ = (uint)bVar13 * auVar333._16_4_ | (uint)!bVar13 * auVar334._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        in_ZMM17._20_4_ = (uint)bVar13 * auVar333._20_4_ | (uint)!bVar13 * auVar334._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        in_ZMM17._24_4_ = (uint)bVar13 * auVar333._24_4_ | (uint)!bVar13 * auVar334._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        in_ZMM17._28_4_ = (uint)bVar13 * auVar333._28_4_ | (uint)!bVar13 * auVar334._28_4_;
        bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
        in_ZMM17._32_4_ = (uint)bVar13 * auVar333._32_4_ | (uint)!bVar13 * auVar334._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        in_ZMM17._36_4_ = (uint)bVar13 * auVar333._36_4_ | (uint)!bVar13 * auVar334._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        in_ZMM17._40_4_ = (uint)bVar13 * auVar333._40_4_ | (uint)!bVar13 * auVar334._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        in_ZMM17._44_4_ = (uint)bVar13 * auVar333._44_4_ | (uint)!bVar13 * auVar334._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        in_ZMM17._48_4_ = (uint)bVar13 * auVar333._48_4_ | (uint)!bVar13 * auVar334._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        in_ZMM17._52_4_ = (uint)bVar13 * auVar333._52_4_ | (uint)!bVar13 * auVar334._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        in_ZMM17._56_4_ = (uint)bVar13 * auVar333._56_4_ | (uint)!bVar13 * auVar334._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        in_ZMM17._60_4_ = (uint)bVar13 * auVar333._60_4_ | (uint)!bVar13 * auVar334._60_4_;
        auVar325 = vfmadd231ps_avx512f(auVar325,in_ZMM17,auVar287);
        auVar325 = vfmadd231ps_avx512f(auVar325,in_ZMM17,auVar293);
        auVar333 = vmulps_avx512f(auVar325,auVar325);
        auVar334 = vfmadd213ps_avx512f(auVar325,(undefined1  [64])afVar122,
                                       (undefined1  [64])afVar123);
        auVar334 = vfmadd213ps_avx512f(auVar334,auVar325,(undefined1  [64])afVar124);
        auVar334 = vfmadd213ps_avx512f(auVar334,auVar325,(undefined1  [64])afVar125);
        auVar334 = vfmadd213ps_avx512f(auVar334,auVar325,(undefined1  [64])afVar126);
        auVar334 = vfmadd213ps_avx512f(auVar334,auVar325,(undefined1  [64])afVar127);
        in_ZMM18 = vfmadd213ps_avx512f(auVar334,auVar333,auVar325);
        auVar325 = vaddps_avx512f(in_ZMM18,(undefined1  [64])afVar118);
        auVar333 = vcvttps2dq_avx512f(in_ZMM17);
        auVar333 = vpaddd_avx512f(auVar333,auVar299);
        auVar333 = vpslld_avx512f(auVar333,0x17);
        auVar325 = vfmadd213ps_avx512f(auVar333,auVar325,auVar309);
        in_ZMM16 = vdivps_avx512f(auVar309,auVar325);
        break;
      case 5:
        auVar333 = vminps_avx512f(auVar325,(undefined1  [64])afVar119);
        auVar333 = vmaxps_avx512f(auVar333,(undefined1  [64])afVar120);
        auVar334 = vfmadd213ps_avx512f((undefined1  [64])afVar121,auVar333,
                                       (undefined1  [64])afVar127);
        auVar216 = vrndscaleps_avx512f(auVar334,1);
        uVar15 = vcmpps_avx512f(auVar334,auVar216,1);
        auVar334 = vsubps_avx512f(auVar216,(undefined1  [64])afVar118);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar217._0_4_ = (uint)bVar13 * auVar334._0_4_ | (uint)!bVar13 * auVar216._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar217._4_4_ = (uint)bVar13 * auVar334._4_4_ | (uint)!bVar13 * auVar216._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar217._8_4_ = (uint)bVar13 * auVar334._8_4_ | (uint)!bVar13 * auVar216._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar217._12_4_ = (uint)bVar13 * auVar334._12_4_ | (uint)!bVar13 * auVar216._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar217._16_4_ = (uint)bVar13 * auVar334._16_4_ | (uint)!bVar13 * auVar216._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar217._20_4_ = (uint)bVar13 * auVar334._20_4_ | (uint)!bVar13 * auVar216._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar217._24_4_ = (uint)bVar13 * auVar334._24_4_ | (uint)!bVar13 * auVar216._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        auVar217._28_4_ = (uint)bVar13 * auVar334._28_4_ | (uint)!bVar13 * auVar216._28_4_;
        bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
        auVar217._32_4_ = (uint)bVar13 * auVar334._32_4_ | (uint)!bVar13 * auVar216._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        auVar217._36_4_ = (uint)bVar13 * auVar334._36_4_ | (uint)!bVar13 * auVar216._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        auVar217._40_4_ = (uint)bVar13 * auVar334._40_4_ | (uint)!bVar13 * auVar216._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        auVar217._44_4_ = (uint)bVar13 * auVar334._44_4_ | (uint)!bVar13 * auVar216._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        auVar217._48_4_ = (uint)bVar13 * auVar334._48_4_ | (uint)!bVar13 * auVar216._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        auVar217._52_4_ = (uint)bVar13 * auVar334._52_4_ | (uint)!bVar13 * auVar216._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        auVar217._56_4_ = (uint)bVar13 * auVar334._56_4_ | (uint)!bVar13 * auVar216._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        auVar217._60_4_ = (uint)bVar13 * auVar334._60_4_ | (uint)!bVar13 * auVar216._60_4_;
        auVar333 = vfmadd231ps_avx512f(auVar333,auVar217,auVar287);
        auVar333 = vfmadd231ps_avx512f(auVar333,auVar217,auVar293);
        auVar334 = vmulps_avx512f(auVar333,auVar333);
        auVar216 = vfmadd213ps_avx512f(auVar333,(undefined1  [64])afVar122,
                                       (undefined1  [64])afVar123);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar333,(undefined1  [64])afVar124);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar333,(undefined1  [64])afVar125);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar333,(undefined1  [64])afVar126);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar333,(undefined1  [64])afVar127);
        auVar333 = vfmadd213ps_avx512f(auVar216,auVar334,auVar333);
        auVar333 = vaddps_avx512f(auVar333,(undefined1  [64])afVar118);
        auVar334 = vcvttps2dq_avx512f(auVar217);
        auVar334 = vpaddd_avx512f(auVar334,auVar299);
        auVar334 = vpslld_avx512f(auVar334,0x17);
        auVar333 = vfmadd213ps_avx512f(auVar334,auVar333,auVar309);
        auVar334 = vmaxps_avx512f(auVar333,(undefined1  [64])_ps512_min_norm_pos);
        auVar216 = vpsrld_avx512f(auVar334,0x17);
        auVar334 = vpternlogd_avx512f(auVar334,(undefined1  [64])afVar127,
                                      (undefined1  [64])_ps512_inv_mant_mask,0xec);
        uVar15 = vcmpps_avx512f(auVar334,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar212 = vsubps_avx512f(auVar334,(undefined1  [64])afVar118);
        auVar213 = vaddps_avx512f(auVar212,auVar334);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar334._0_4_ = (uint)bVar13 * auVar213._0_4_ | (uint)!bVar13 * auVar212._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar334._4_4_ = (uint)bVar13 * auVar213._4_4_ | (uint)!bVar13 * auVar212._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar334._8_4_ = (uint)bVar13 * auVar213._8_4_ | (uint)!bVar13 * auVar212._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar334._12_4_ = (uint)bVar13 * auVar213._12_4_ | (uint)!bVar13 * auVar212._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar334._16_4_ = (uint)bVar13 * auVar213._16_4_ | (uint)!bVar13 * auVar212._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar334._20_4_ = (uint)bVar13 * auVar213._20_4_ | (uint)!bVar13 * auVar212._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar334._24_4_ = (uint)bVar13 * auVar213._24_4_ | (uint)!bVar13 * auVar212._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        auVar334._28_4_ = (uint)bVar13 * auVar213._28_4_ | (uint)!bVar13 * auVar212._28_4_;
        bVar14 = (byte)(uVar15 >> 8);
        bVar13 = (bool)(bVar14 & 1);
        auVar334._32_4_ = (uint)bVar13 * auVar213._32_4_ | (uint)!bVar13 * auVar212._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        auVar334._36_4_ = (uint)bVar13 * auVar213._36_4_ | (uint)!bVar13 * auVar212._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        auVar334._40_4_ = (uint)bVar13 * auVar213._40_4_ | (uint)!bVar13 * auVar212._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        auVar334._44_4_ = (uint)bVar13 * auVar213._44_4_ | (uint)!bVar13 * auVar212._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        auVar334._48_4_ = (uint)bVar13 * auVar213._48_4_ | (uint)!bVar13 * auVar212._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        auVar334._52_4_ = (uint)bVar13 * auVar213._52_4_ | (uint)!bVar13 * auVar212._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        auVar334._56_4_ = (uint)bVar13 * auVar213._56_4_ | (uint)!bVar13 * auVar212._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        auVar334._60_4_ = (uint)bVar13 * auVar213._60_4_ | (uint)!bVar13 * auVar212._60_4_;
        auVar212 = vmulps_avx512f(auVar334,auVar334);
        auVar213 = vfmadd132ps_avx512f(auVar334,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar213 = vfmadd213ps_avx512f(auVar213,auVar334,(undefined1  [64])_ps512_cephes_log_p2);
        auVar213 = vfmadd213ps_avx512f(auVar213,auVar334,(undefined1  [64])_ps512_cephes_log_p3);
        auVar213 = vfmadd213ps_avx512f(auVar213,auVar334,(undefined1  [64])_ps512_cephes_log_p4);
        auVar213 = vfmadd213ps_avx512f(auVar213,auVar334,(undefined1  [64])_ps512_cephes_log_p5);
        auVar213 = vfmadd213ps_avx512f(auVar213,auVar334,(undefined1  [64])_ps512_cephes_log_p6);
        auVar213 = vfmadd213ps_avx512f(auVar213,auVar334,(undefined1  [64])_ps512_cephes_log_p7);
        in_ZMM20 = vfmadd213ps_avx512f(auVar213,auVar334,(undefined1  [64])_ps512_cephes_log_p8);
        auVar213 = vmulps_avx512f(auVar212,auVar334);
        auVar334 = vfmadd213ps_avx512f(auVar213,in_ZMM20,auVar334);
        uVar16 = vcmpps_avx512f(auVar333,auVar319,2);
        auVar333 = vpsubd_avx512f(auVar216,auVar299);
        auVar333 = vcvtdq2ps_avx512f(auVar333);
        auVar216 = vaddps_avx512f(auVar333,(undefined1  [64])afVar118);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar218._0_4_ = (uint)bVar13 * auVar333._0_4_ | (uint)!bVar13 * auVar216._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar218._4_4_ = (uint)bVar13 * auVar333._4_4_ | (uint)!bVar13 * auVar216._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar218._8_4_ = (uint)bVar13 * auVar333._8_4_ | (uint)!bVar13 * auVar216._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar218._12_4_ = (uint)bVar13 * auVar333._12_4_ | (uint)!bVar13 * auVar216._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar218._16_4_ = (uint)bVar13 * auVar333._16_4_ | (uint)!bVar13 * auVar216._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar218._20_4_ = (uint)bVar13 * auVar333._20_4_ | (uint)!bVar13 * auVar216._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar218._24_4_ = (uint)bVar13 * auVar333._24_4_ | (uint)!bVar13 * auVar216._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        auVar218._28_4_ = (uint)bVar13 * auVar333._28_4_ | (uint)!bVar13 * auVar216._28_4_;
        bVar13 = (bool)(bVar14 & 1);
        auVar218._32_4_ = (uint)bVar13 * auVar333._32_4_ | (uint)!bVar13 * auVar216._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        auVar218._36_4_ = (uint)bVar13 * auVar333._36_4_ | (uint)!bVar13 * auVar216._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        auVar218._40_4_ = (uint)bVar13 * auVar333._40_4_ | (uint)!bVar13 * auVar216._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        auVar218._44_4_ = (uint)bVar13 * auVar333._44_4_ | (uint)!bVar13 * auVar216._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        auVar218._48_4_ = (uint)bVar13 * auVar333._48_4_ | (uint)!bVar13 * auVar216._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        auVar218._52_4_ = (uint)bVar13 * auVar333._52_4_ | (uint)!bVar13 * auVar216._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        auVar218._56_4_ = (uint)bVar13 * auVar333._56_4_ | (uint)!bVar13 * auVar216._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        auVar218._60_4_ = (uint)bVar13 * auVar333._60_4_ | (uint)!bVar13 * auVar216._60_4_;
        auVar333 = vfmadd231ps_avx512f(auVar334,auVar218,(undefined1  [64])afVar128);
        auVar333 = vfmadd231ps_avx512f(auVar333,auVar304,auVar212);
        in_ZMM21 = vfmadd231ps_avx512f(auVar333,auVar218,(undefined1  [64])_ps512_cephes_log_q2);
        auVar333 = vmulps_avx512f(in_ZMM21,auVar314);
        auVar334 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        bVar13 = (bool)((byte)uVar16 & 1);
        auVar219._0_4_ = (uint)bVar13 * auVar334._0_4_ | (uint)!bVar13 * auVar333._0_4_;
        bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar219._4_4_ = (uint)bVar13 * auVar334._4_4_ | (uint)!bVar13 * auVar333._4_4_;
        bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar219._8_4_ = (uint)bVar13 * auVar334._8_4_ | (uint)!bVar13 * auVar333._8_4_;
        bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar219._12_4_ = (uint)bVar13 * auVar334._12_4_ | (uint)!bVar13 * auVar333._12_4_;
        bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar219._16_4_ = (uint)bVar13 * auVar334._16_4_ | (uint)!bVar13 * auVar333._16_4_;
        bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar219._20_4_ = (uint)bVar13 * auVar334._20_4_ | (uint)!bVar13 * auVar333._20_4_;
        bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar219._24_4_ = (uint)bVar13 * auVar334._24_4_ | (uint)!bVar13 * auVar333._24_4_;
        bVar13 = (bool)((byte)(uVar16 >> 7) & 1);
        auVar219._28_4_ = (uint)bVar13 * auVar334._28_4_ | (uint)!bVar13 * auVar333._28_4_;
        bVar13 = (bool)((byte)(uVar16 >> 8) & 1);
        auVar219._32_4_ = (uint)bVar13 * auVar334._32_4_ | (uint)!bVar13 * auVar333._32_4_;
        bVar13 = (bool)((byte)(uVar16 >> 9) & 1);
        auVar219._36_4_ = (uint)bVar13 * auVar334._36_4_ | (uint)!bVar13 * auVar333._36_4_;
        bVar13 = (bool)((byte)(uVar16 >> 10) & 1);
        auVar219._40_4_ = (uint)bVar13 * auVar334._40_4_ | (uint)!bVar13 * auVar333._40_4_;
        bVar13 = (bool)((byte)(uVar16 >> 0xb) & 1);
        auVar219._44_4_ = (uint)bVar13 * auVar334._44_4_ | (uint)!bVar13 * auVar333._44_4_;
        bVar13 = (bool)((byte)(uVar16 >> 0xc) & 1);
        auVar219._48_4_ = (uint)bVar13 * auVar334._48_4_ | (uint)!bVar13 * auVar333._48_4_;
        bVar13 = (bool)((byte)(uVar16 >> 0xd) & 1);
        auVar219._52_4_ = (uint)bVar13 * auVar334._52_4_ | (uint)!bVar13 * auVar333._52_4_;
        bVar13 = (bool)((byte)(uVar16 >> 0xe) & 1);
        auVar219._56_4_ = (uint)bVar13 * auVar334._56_4_ | (uint)!bVar13 * auVar333._56_4_;
        bVar13 = SUB81(uVar16 >> 0xf,0);
        auVar219._60_4_ = (uint)bVar13 * auVar334._60_4_ | (uint)!bVar13 * auVar333._60_4_;
        auVar333 = vminps_avx512f(auVar219,(undefined1  [64])afVar119);
        auVar333 = vmaxps_avx512f(auVar333,(undefined1  [64])afVar120);
        auVar334 = vfmadd213ps_avx512f((undefined1  [64])afVar121,auVar333,
                                       (undefined1  [64])afVar127);
        auVar216 = vrndscaleps_avx512f(auVar334,1);
        uVar15 = vcmpps_avx512f(auVar334,auVar216,1);
        auVar334 = vsubps_avx512f(auVar216,(undefined1  [64])afVar118);
        bVar13 = (bool)((byte)uVar15 & 1);
        in_ZMM18._0_4_ = (uint)bVar13 * auVar334._0_4_ | (uint)!bVar13 * auVar216._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        in_ZMM18._4_4_ = (uint)bVar13 * auVar334._4_4_ | (uint)!bVar13 * auVar216._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        in_ZMM18._8_4_ = (uint)bVar13 * auVar334._8_4_ | (uint)!bVar13 * auVar216._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        in_ZMM18._12_4_ = (uint)bVar13 * auVar334._12_4_ | (uint)!bVar13 * auVar216._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        in_ZMM18._16_4_ = (uint)bVar13 * auVar334._16_4_ | (uint)!bVar13 * auVar216._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        in_ZMM18._20_4_ = (uint)bVar13 * auVar334._20_4_ | (uint)!bVar13 * auVar216._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        in_ZMM18._24_4_ = (uint)bVar13 * auVar334._24_4_ | (uint)!bVar13 * auVar216._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        in_ZMM18._28_4_ = (uint)bVar13 * auVar334._28_4_ | (uint)!bVar13 * auVar216._28_4_;
        bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
        in_ZMM18._32_4_ = (uint)bVar13 * auVar334._32_4_ | (uint)!bVar13 * auVar216._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        in_ZMM18._36_4_ = (uint)bVar13 * auVar334._36_4_ | (uint)!bVar13 * auVar216._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        in_ZMM18._40_4_ = (uint)bVar13 * auVar334._40_4_ | (uint)!bVar13 * auVar216._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        in_ZMM18._44_4_ = (uint)bVar13 * auVar334._44_4_ | (uint)!bVar13 * auVar216._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        in_ZMM18._48_4_ = (uint)bVar13 * auVar334._48_4_ | (uint)!bVar13 * auVar216._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        in_ZMM18._52_4_ = (uint)bVar13 * auVar334._52_4_ | (uint)!bVar13 * auVar216._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        in_ZMM18._56_4_ = (uint)bVar13 * auVar334._56_4_ | (uint)!bVar13 * auVar216._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        in_ZMM18._60_4_ = (uint)bVar13 * auVar334._60_4_ | (uint)!bVar13 * auVar216._60_4_;
        auVar333 = vfmadd231ps_avx512f(auVar333,in_ZMM18,auVar287);
        auVar333 = vfmadd231ps_avx512f(auVar333,in_ZMM18,auVar293);
        auVar334 = vmulps_avx512f(auVar333,auVar333);
        auVar216 = vfmadd213ps_avx512f(auVar333,(undefined1  [64])afVar122,
                                       (undefined1  [64])afVar123);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar333,(undefined1  [64])afVar124);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar333,(undefined1  [64])afVar125);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar333,(undefined1  [64])afVar126);
        auVar216 = vfmadd213ps_avx512f(auVar216,auVar333,(undefined1  [64])afVar127);
        in_ZMM19 = vfmadd213ps_avx512f(auVar216,auVar334,auVar333);
        auVar333 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar118);
        auVar334 = vcvttps2dq_avx512f(in_ZMM18);
        auVar334 = vpaddd_avx512f(auVar334,auVar299);
        auVar334 = vpslld_avx512f(auVar334,0x17);
        in_ZMM17 = vfmadd213ps_avx512f(auVar334,auVar333,auVar309);
        auVar333 = vdivps_avx512f(auVar309,in_ZMM17);
        auVar333 = vfnmsub213ps_avx512f(auVar333,auVar314,auVar309);
        goto LAB_002bc7b2;
      case 6:
        puVar11 = (uint *)(this->super_InnerProduct).activation_params.data;
        auVar334 = vbroadcastss_avx512f(ZEXT416(*puVar11));
        uVar131 = puVar11[1];
        auVar333._4_4_ = uVar131;
        auVar333._0_4_ = uVar131;
        auVar333._8_4_ = uVar131;
        auVar333._12_4_ = uVar131;
        auVar333._16_4_ = uVar131;
        auVar333._20_4_ = uVar131;
        auVar333._24_4_ = uVar131;
        auVar333._28_4_ = uVar131;
        auVar333._32_4_ = uVar131;
        auVar333._36_4_ = uVar131;
        auVar333._40_4_ = uVar131;
        auVar333._44_4_ = uVar131;
        auVar333._48_4_ = uVar131;
        auVar333._52_4_ = uVar131;
        auVar333._56_4_ = uVar131;
        auVar333._60_4_ = uVar131;
        auVar333 = vfmadd213ps_avx512f(auVar334,auVar325,auVar333);
        auVar333 = vmaxps_avx512f(auVar333,auVar319);
        auVar333 = vminps_avx512f(auVar333,auVar309);
LAB_002bc7b2:
        in_ZMM16 = vmulps_avx512f(auVar333,auVar325);
      }
      *(undefined1 (*) [64])((long)top_blob->data + uVar134 * 0x40) = in_ZMM16;
      uVar134 = uVar134 + 1;
    } while (uVar134 != uVar141);
  }
  iVar144 = 0;
LAB_002be29b:
  if (piStack_3a0 != (int *)0x0) {
    LOCK();
    *piStack_3a0 = *piStack_3a0 + -1;
    UNLOCK();
    if (*piStack_3a0 == 0) {
      if (local_388 == (Allocator *)0x0) {
        if (local_3a8 != (undefined1 (*) [32])0x0) {
          free(local_3a8);
        }
      }
      else {
        (*local_388->_vptr_Allocator[3])();
      }
    }
  }
  return iVar144;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}